

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void mbedtls_strerror(int ret,char *buf,size_t buflen)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  if (buflen == 0) {
    return;
  }
  memset(buf,0,buflen);
  uVar4 = -ret;
  if (0 < ret) {
    uVar4 = ret;
  }
  uVar3 = uVar4 & 0xff80;
  if (uVar3 < 0x3b80) {
    if (0x2eff < uVar3) {
      if (uVar3 < 0x3380) {
        if (0x317f < uVar3) {
          if (uVar3 < 0x3280) {
            if (uVar3 == 0x3180) {
              snprintf(buf,buflen,"DHM - Making of the DHM parameters failed");
LAB_00135dda:
              if (uVar3 == 0x3200) goto LAB_00134860;
              if (uVar3 == 0x3280) goto LAB_00135e2f;
            }
            else {
              if (uVar3 != 0x3200) goto LAB_0013a94b;
LAB_00134860:
              snprintf(buf,buflen,"DHM - Reading of the public values failed");
              if (0x4d7f < uVar3) goto LAB_00135e4c;
              if (0x337f < uVar3) {
                if (uVar3 == 0x3380) goto LAB_00135ec7;
                goto LAB_00135f72;
              }
              if (uVar3 == 0x3280) goto LAB_00135e2f;
              if (uVar3 == 0x3300) goto LAB_00134bcb;
            }
          }
          else {
            if (uVar3 != 0x3280) {
              if (uVar3 != 0x3300) goto LAB_0013a94b;
LAB_00134bcb:
              snprintf(buf,buflen,"DHM - Calculation of the DHM secret failed");
              if (uVar3 < 0x4d80) {
                if (uVar3 < 0x3480) {
                  if (uVar3 == 0x3380) goto LAB_00135ec7;
                  if (uVar3 == 0x3400) goto LAB_00135f89;
                }
                else {
                  if (uVar3 == 0x3480) goto LAB_00135fca;
                  if (uVar3 == 0x4d00) goto switchD_00136000_caseD_1;
                }
              }
              else {
                if (0x4e7f < uVar3) {
                  if (uVar3 == 0x4e80) goto switchD_00136000_caseD_4;
                  goto LAB_00135f34;
                }
                if (uVar3 == 0x4d80) goto switchD_00136000_caseD_2;
                if (uVar3 == 0x4e00) goto switchD_00136000_caseD_3;
              }
              goto LAB_001361b6;
            }
LAB_00135e2f:
            snprintf(buf,buflen,"DHM - Making of the public value failed");
            if (uVar3 < 0x4d80) {
              if (uVar3 < 0x3400) {
                if (uVar3 == 0x3300) goto LAB_00134bcb;
                if (uVar3 == 0x3380) goto LAB_00135ec7;
              }
              else {
LAB_00135f72:
                if (uVar3 == 0x3400) goto LAB_00135f89;
                if (uVar3 == 0x3480) goto LAB_00135fca;
              }
            }
            else {
LAB_00135e4c:
              if (uVar3 < 0x4e80) {
                if (uVar3 == 0x4d80) goto switchD_00136000_caseD_2;
                if (uVar3 == 0x4e00) goto switchD_00136000_caseD_3;
              }
              else {
                if (uVar3 == 0x4e80) goto switchD_00136000_caseD_4;
                if (uVar3 == 0x4f00) goto switchD_00136000_caseD_5;
                if (uVar3 == 0x4f80) goto switchD_00136000_caseD_6;
              }
            }
          }
LAB_00136153:
          if (uVar3 < 0x3e00) {
            if (uVar3 < 0x1300) {
              if (uVar3 < 0x1180) {
                if (uVar3 == 0x1080) goto switchD_00136e93_caseD_0;
                if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
              }
              else {
                if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
                if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
                if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
              }
            }
            else if (uVar3 < 0x1400) {
              if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
              if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
            }
            else {
              if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
              if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
              if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
            }
          }
          else if (uVar3 < 0x4c80) {
            if (uVar3 < 0x3f00) {
              if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
              if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
            }
            else {
              if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
              if (uVar3 == 0x3f80) goto LAB_001378e5;
              if (uVar3 == 0x4c00) goto switchD_0013613d_caseD_0;
            }
          }
          else if (uVar3 < 0x5100) {
            if (uVar3 == 0x4c80) goto switchD_00136000_caseD_0;
            if (uVar3 == 0x4d00) goto switchD_00136000_caseD_1;
            if (uVar3 == 0x5080) goto switchD_0013613d_caseD_9;
          }
          else {
            if (uVar3 == 0x5100) goto switchD_0013613d_caseD_a;
            if (uVar3 == 0x5180) goto LAB_00136dd7;
            if (uVar3 == 0x5200) goto LAB_00136e5d;
          }
          goto LAB_00137fa4;
        }
        if (uVar3 < 0x3080) {
          if (uVar3 != 0x2f00) {
            if (uVar3 != 0x2f80) goto LAB_0013a94b;
            goto LAB_00139e66;
          }
LAB_00139eae:
          snprintf(buf,buflen,"PKCS5 - Unexpected ASN.1 data");
          goto LAB_00139ec2;
        }
        if (uVar3 == 0x3080) {
          snprintf(buf,buflen,"DHM - Bad input parameters to function");
          goto LAB_001361b6;
        }
        if (uVar3 == 0x3100) {
          snprintf(buf,buflen,"DHM - Reading of the DHM parameters failed");
          goto LAB_00135dda;
        }
LAB_0013a94b:
        if (uVar3 < 0x7580) {
          if (uVar3 < 0x6f80) {
            if (uVar3 < 0x6d00) {
              if (uVar3 < 0x4380) {
                if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
                if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
              }
              else {
                if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
                if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
                if (uVar3 == 0x4480) goto LAB_0013b56e;
              }
              goto LAB_0013e2d3;
            }
            if (0x6dff < uVar3) {
              if (uVar3 != 0x6e00) {
                if (uVar3 != 0x6e80) {
                  if (uVar3 != 0x6f00) goto LAB_0013e2d3;
                  goto switchD_0013b8fc_caseD_10;
                }
                goto switchD_0013b8fc_caseD_f;
              }
              goto switchD_0013b8fc_caseD_e;
            }
            if (uVar3 != 0x6d00) {
              if (uVar3 != 0x6d80) goto LAB_0013e2d3;
              goto switchD_0013b8fc_caseD_d;
            }
            goto switchD_0013b8fc_caseD_c;
          }
          if (uVar3 < 0x7280) {
            if (uVar3 < 0x7100) {
              if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
              if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            }
            else {
              if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
              if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
              if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
            }
          }
          else if (uVar3 < 0x7400) {
            if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
            if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
            if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
          }
          else {
            if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
            if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
            if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
          }
        }
        else if (uVar3 < 0x7a80) {
          if (uVar3 < 0x7800) {
            if (uVar3 < 0x7680) {
              if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
            }
            else {
              if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
              if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
            }
          }
          else if (uVar3 < 0x7900) {
            if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
            if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
          }
          else {
            if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
            if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
            if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          }
        }
        else {
          if (31999 < uVar3) {
            if (uVar3 < 0x7e80) {
              if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
              if (uVar3 != 0x7d80) {
                if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
                goto LAB_0013e2d3;
              }
              goto switchD_0013b8fc_caseD_2d;
            }
            if (uVar3 != 0x7e80) {
              if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
              if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
              goto LAB_0013e2d3;
            }
            goto switchD_0013b8fc_caseD_2f;
          }
          if (uVar3 < 0x7b80) {
            if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
            if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
          }
          else {
            if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
            if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
            if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
          }
        }
LAB_0013e2d3:
        if (uVar3 < 0x2880) {
LAB_0013e347:
          if (uVar3 < 0x2480) {
            if (0x227f < uVar3) {
              if (uVar3 < 0x2380) goto LAB_0013e84c;
LAB_0013e988:
              if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
              if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
              goto switchD_0013ee65_default;
            }
LAB_0013e35d:
            if (0x217f < uVar3) {
              if (uVar3 != 0x2180) {
                if (uVar3 != 0x2200) goto switchD_0013ee65_default;
                goto switchD_0013ec95_caseD_3;
              }
              goto switchD_0013ec95_caseD_2;
            }
LAB_0013eb5b:
            if (uVar3 != 0x2080) {
              if (uVar3 != 0x2100) goto switchD_0013ee65_default;
              goto switchD_0013ec95_caseD_1;
            }
            goto switchD_0013ec95_caseD_0;
          }
          if (uVar3 < 0x2680) {
            if (uVar3 < 0x2580) {
LAB_0013eb94:
              if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
              if (uVar3 != 0x2500) goto switchD_0013ee65_default;
              goto switchD_0013ee65_caseD_5;
            }
LAB_0013ebf1:
            if (uVar3 == 0x2580) goto switchD_0013ee65_caseD_6;
            if (uVar3 == 0x2600) goto switchD_0013ee65_caseD_7;
            goto switchD_0013ee65_default;
          }
          if (0x277f < uVar3) goto LAB_0013ea1e;
LAB_0013e8e3:
          if (uVar3 == 0x2680) goto switchD_0013ee65_caseD_8;
          if (uVar3 != 0x2700) goto switchD_0013ee65_default;
          goto switchD_0013ee65_caseD_9;
        }
        if (uVar3 < 0x6880) {
LAB_0013e392:
          if (0x667f < uVar3) {
            if (0x677f < uVar3) {
LAB_0013e885:
              if (uVar3 != 0x6780) {
                if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
                goto switchD_0013ee65_default;
              }
switchD_0013b8fc_caseD_1:
              snprintf(buf,buflen,"SSL - The client initiated a reconnect from the same port");
              goto switchD_0013b8c4_caseD_11;
            }
LAB_0013ea69:
            if (uVar3 == 0x6680) {
switchD_0013b96c_caseD_1:
              snprintf(buf,buflen,"SSL - The alert message received indicates a non-fatal error");
switchD_0013b934_caseD_13:
              if (uVar3 < 0x2580) {
LAB_0013eb1d:
                if (uVar3 < 0x2300) goto LAB_0013eb26;
                if (uVar3 < 0x2400) goto LAB_0013ec10;
                if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
                goto LAB_0013eb94;
              }
              if (0x27ff < uVar3) {
                if (uVar3 < 0x2900) goto LAB_0013eca4;
                goto LAB_0013ec38;
              }
            }
            else {
              if (uVar3 != 0x6700) goto switchD_0013ee65_default;
switchD_0013b8fc_caseD_0:
              snprintf(buf,buflen,"SSL - Record header looks valid but is not expected");
switchD_0013b8fc_caseD_12:
              if (uVar3 < 0x2580) goto LAB_0013eb1d;
              if (0x27ff < uVar3) {
                if (0x297f < uVar3) goto LAB_0013ead5;
                goto LAB_0013eab6;
              }
            }
            if (0x267f < uVar3) goto LAB_0013ebc5;
            goto LAB_0013ebf1;
          }
LAB_0013e688:
          if (0x297f < uVar3) {
LAB_0013ec45:
            if (uVar3 != 0x2980) {
              if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
              goto switchD_0013ee65_default;
            }
            goto switchD_0013ee65_caseD_e;
          }
        }
        else {
          if (uVar3 < 0x6a80) goto LAB_0013e3d5;
LAB_0013e2f6:
          if (uVar3 < 0x6b80) {
LAB_0013e5cf:
            if (uVar3 == 0x6a80) {
switchD_0013e61b_caseD_3:
              snprintf(buf,buflen,"SSL - DTLS client must retry for hello verification");
              switch(uVar3 - 0x6880 >> 7) {
              case 0:
                goto switchD_0013e653_caseD_0;
              case 1:
                goto switchD_0013e653_caseD_1;
              case 2:
                goto switchD_0013e653_caseD_2;
              case 3:
switchD_0013e653_caseD_3:
                snprintf(buf,buflen,"SSL - A buffer is too small to receive or write a message");
                goto switchD_0013b5dc_caseD_c;
              }
              goto switchD_0013e653_default;
            }
            if (uVar3 != 0x6b00) goto switchD_0013ee65_default;
switchD_0013b8fc_caseD_8:
            snprintf(buf,buflen,"SSL - Unexpected message at ServerHello in renegotiation");
            switch(uVar3 - 0x6900 >> 7) {
            case 0:
              goto switchD_0013e653_caseD_1;
            case 1:
              goto switchD_0013e653_caseD_2;
            case 2:
              goto switchD_0013e653_caseD_3;
            case 3:
              goto switchD_0013e61b_caseD_3;
            }
switchD_0013e61b_default:
            if (0x267f < uVar3) {
              if (0x297f < uVar3) {
                if (0x66ff < uVar3) {
                  if (uVar3 < 0x6800) goto LAB_0013e92e;
                  goto LAB_0013e772;
                }
                goto LAB_0013ead5;
              }
              goto LAB_0013e7f4;
            }
LAB_0013e7a9:
            if (uVar3 < 0x2380) goto LAB_0013e7b2;
            if (uVar3 < 0x2500) goto LAB_0013e813;
            if (uVar3 == 0x2500) goto switchD_0013ee65_caseD_5;
            goto LAB_0013ebf1;
          }
          if (uVar3 != 0x6b80) {
LAB_0013e310:
            if (uVar3 != 0x6c00) {
              if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
              goto switchD_0013ee65_default;
            }
switchD_0013b8fc_caseD_a:
            snprintf(buf,buflen,
                     "SSL - Internal error (eg, unexpected failure in lower-level module)");
            goto switchD_0013e285_default;
          }
switchD_0013b8fc_caseD_9:
          snprintf(buf,buflen,"SSL - A counter would wrap (eg, too many messages exchanged)");
switchD_0013e2bd_default:
          if (uVar3 < 0x2800) goto LAB_0013e4f5;
          if (0x677f < uVar3) {
            if (uVar3 < 0x6980) {
              if (0x687f < uVar3) goto LAB_0013e538;
              goto LAB_0013e885;
            }
            if (uVar3 < 0x6a80) goto LAB_0013e5b0;
            goto LAB_0013e5cf;
          }
          if (0x297f < uVar3) {
LAB_0013e595:
            if (0x667f < uVar3) goto LAB_0013ea69;
            goto LAB_0013ec45;
          }
LAB_0013eab6:
          if (uVar3 == 0x2800) goto switchD_0013ee65_caseD_b;
        }
        if (uVar3 == 0x2880) goto switchD_0013ee65_caseD_c;
LAB_0013f11b:
        if (uVar3 != 0x2900) goto switchD_0013ee65_default;
        goto switchD_0013ee65_caseD_d;
      }
      if (0x397f < uVar3) {
        if (0x3a7f < uVar3) {
          if (uVar3 != 0x3a80) {
            if (uVar3 != 0x3b00) goto LAB_0013a94b;
            goto switchD_0013806b_caseD_3;
          }
switchD_0013806b_caseD_2:
          snprintf(buf,buflen,"PK - The algorithm tag or value is invalid");
LAB_001393c2:
          if (uVar3 < 0x7100) {
            if (uVar3 < 0x3a00) {
              if (uVar3 < 0x2e80) {
                if (uVar3 < 0x1f00) {
                  if (uVar3 == 0x1e00) goto LAB_00139dde;
                  if (uVar3 == 0x1e80) goto LAB_00139d95;
                }
                else {
                  if (uVar3 == 0x1f00) goto LAB_00138927;
                  if (uVar3 == 0x1f80) goto LAB_00138a11;
                  if (uVar3 == 0x2e00) goto LAB_0013a409;
                }
              }
              else if (uVar3 < 0x2f80) {
                if (uVar3 == 0x2e80) goto LAB_00139f71;
                if (uVar3 == 0x2f00) goto LAB_00139eae;
              }
              else {
                if (uVar3 == 0x2f80) goto LAB_00139e66;
                if (uVar3 == 0x3900) goto LAB_001388df;
                if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
              }
            }
            else if (uVar3 < 0x4280) {
              if (uVar3 < 0x4100) {
                if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
                if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
              }
              else {
                if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
                if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
                if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
              }
            }
            else if (uVar3 < 0x4400) {
              if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
              if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
            }
            else {
              if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
              if (uVar3 == 0x4480) goto LAB_0013b56e;
              if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            }
          }
          else if (uVar3 < 0x7600) {
            if (uVar3 < 0x7380) {
              if (uVar3 < 0x7200) {
                if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
                if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
              }
              else {
                if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
                if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
                if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
              }
            }
            else if (uVar3 < 0x7480) {
              if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
              if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
            }
            else {
              if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
              if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
              if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
            }
          }
          else {
            if (0x787f < uVar3) {
              if (uVar3 < 0x7a00) {
                if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
                if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
                if (uVar3 != 0x7980) goto LAB_0013c857;
                goto switchD_0013b8fc_caseD_25;
              }
              if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
              if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
              if (uVar3 != 0x7b00) goto LAB_0013c857;
              goto switchD_0013b8fc_caseD_28;
            }
            if (uVar3 < 0x7700) {
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
              if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
            }
            else {
              if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
              if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
            }
          }
          goto LAB_0013c857;
        }
        if (uVar3 != 0x3980) {
          if (uVar3 != 0x3a00) goto LAB_0013a94b;
switchD_0013806b_caseD_1:
          snprintf(buf,buflen,"PK - Elliptic curve is unsupported (only NIST curves are supported)")
          ;
LAB_001396fb:
          if (uVar3 < 0x7180) {
            if (uVar3 < 0x4080) {
              if (uVar3 < 0x2e80) {
                if (uVar3 < 0x1f00) {
                  if (uVar3 == 0x1e00) goto LAB_00139dde;
                  if (uVar3 == 0x1e80) goto LAB_00139d95;
                }
                else {
                  if (uVar3 == 0x1f00) goto LAB_00138927;
                  if (uVar3 == 0x1f80) goto LAB_00138a11;
                  if (uVar3 == 0x2e00) goto LAB_0013a409;
                }
              }
              else if (uVar3 < 0x2f80) {
                if (uVar3 == 0x2e80) goto LAB_00139f71;
                if (uVar3 == 0x2f00) goto LAB_00139eae;
              }
              else {
                if (uVar3 == 0x2f80) goto LAB_00139e66;
                if (uVar3 == 0x3900) goto LAB_001388df;
                if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
              }
            }
            else if (uVar3 < 0x4300) {
              if (uVar3 < 0x4180) {
                if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
                if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
              }
              else {
                if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
                if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
                if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              }
            }
            else if (uVar3 < 0x4480) {
              if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
              if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
              if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
            }
            else {
              if (uVar3 == 0x4480) goto LAB_0013b56e;
              if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
              if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
            }
          }
          else if (uVar3 < 0x7680) {
            if (uVar3 < 0x7400) {
              if (uVar3 < 0x7280) {
                if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
                if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
              }
              else {
                if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
                if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
                if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
              }
            }
            else if (uVar3 < 0x7500) {
              if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
              if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
            }
            else {
              if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
              if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
            }
          }
          else if (uVar3 < 0x7900) {
            if (uVar3 < 0x7780) {
              if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
              if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
            }
            else {
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
              if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
              if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
            }
          }
          else if (uVar3 < 0x7a80) {
            if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
            if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
            if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          }
          else {
            if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
            if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
            if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
          }
          goto LAB_0013ca7e;
        }
switchD_0013806b_caseD_0:
        snprintf(buf,buflen,"PK - Unavailable feature, e.g. RSA disabled for RSA key");
switchD_0013806b_default:
        if (uVar3 < 0x7200) {
          if (uVar3 < 0x4100) {
            if (uVar3 < 0x2e80) {
              if (uVar3 < 0x1f00) {
                if (uVar3 == 0x1e00) goto LAB_00139dde;
                if (uVar3 == 0x1e80) goto LAB_00139d95;
              }
              else {
                if (uVar3 == 0x1f00) goto LAB_00138927;
                if (uVar3 == 0x1f80) goto LAB_00138a11;
                if (uVar3 == 0x2e00) goto LAB_0013a409;
              }
            }
            else if (uVar3 < 0x2f80) {
              if (uVar3 == 0x2e80) goto LAB_00139f71;
              if (uVar3 == 0x2f00) goto LAB_00139eae;
            }
            else {
              if (uVar3 == 0x2f80) goto LAB_00139e66;
              if (uVar3 == 0x3900) goto LAB_001388df;
              if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
            }
          }
          else if (uVar3 < 0x4380) {
            if (uVar3 < 0x4200) {
              if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
              if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            }
            else {
              if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
              if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
            }
          }
          else if (uVar3 < 0x7080) {
            if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
            if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
            if (uVar3 == 0x4480) goto LAB_0013b56e;
          }
          else {
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
            if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
          }
        }
        else if (uVar3 < 0x7700) {
          if (uVar3 < 0x7480) {
            if (uVar3 < 0x7300) {
              if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
              if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
            }
            else {
              if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
              if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
              if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
            }
          }
          else if (uVar3 < 0x7580) {
            if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
            if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
          }
          else {
            if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
            if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
            if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
          }
        }
        else if (uVar3 < 0x7980) {
          if (uVar3 < 0x7800) {
            if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
            if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
          }
          else {
            if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
            if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
            if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
          }
        }
        else if (uVar3 < 0x7b00) {
          if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
          if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
        }
        else {
          if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
          if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
          if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
        }
LAB_0013cb8d:
        if (uVar3 < 0x6b80) {
          if (uVar3 < 0x6780) {
            if (uVar3 < 0x2280) {
              if (0x217f < uVar3) {
                if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
                if (uVar3 != 0x2200) goto LAB_0013ee7b;
                goto switchD_0013ec95_caseD_3;
              }
              if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
              if (uVar3 != 0x2100) goto LAB_0013ee7b;
              goto switchD_0013ec95_caseD_1;
            }
            if (uVar3 < 0x6680) {
              if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
              if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            }
            else {
              if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
              if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
            }
          }
          else if (uVar3 < 0x6980) {
            if (uVar3 < 0x6880) {
              if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
              if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            }
            else {
              if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
              if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
            }
          }
          else if (uVar3 < 0x6a80) {
            if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
            if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
          }
          else {
            if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
            if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
          }
        }
        else if (uVar3 < 0x6f80) {
          if (uVar3 < 0x6d80) {
            if (uVar3 < 0x6c80) {
              if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
              if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
            }
            else {
              if (uVar3 == 0x6c80) {
switchD_0013b8fc_caseD_b:
                snprintf(buf,buflen,"SSL - Unknown identity received (eg, PSK identity)");
                goto LAB_0013e33e;
              }
              if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
            }
          }
          else if (uVar3 < 0x6e80) {
            if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
            if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
          }
          else {
            if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
            if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
          }
        }
        else if (uVar3 < 0x7e00) {
          if (uVar3 < 32000) {
            if (uVar3 == 0x6f80) {
switchD_0013b8fc_caseD_11:
              snprintf(buf,buflen,"SSL - Hardware acceleration function skipped / left alone data");
              goto LAB_0013dde7;
            }
            if (uVar3 == 0x7c80) {
switchD_0013b8fc_caseD_2b:
              snprintf(buf,buflen,
                       "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Read Public"
                      );
              goto LAB_0013cc9b;
            }
          }
          else {
            if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
            if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
          }
        }
        else if (uVar3 < 0x7f00) {
          if (uVar3 == 0x7e00) {
switchD_0013b8fc_caseD_2e:
            snprintf(buf,buflen,"SSL - Processing of the ChangeCipherSpec handshake message failed")
            ;
switchD_0013b81c_default:
            if (0x66ff < uVar3) {
              if (0x6bff < uVar3) {
                if (uVar3 < 0x6e80) {
                  if (uVar3 < 0x6d00) goto LAB_0013e310;
                  if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
                  if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
                  if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
                }
                else if (uVar3 < 0x7e80) {
                  if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
                  if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
                  if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
                }
                else {
                  if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
                  if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
                  if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
                }
                goto switchD_0013ee65_default;
              }
              if (0x697f < uVar3) {
                if (uVar3 < 0x6a80) goto LAB_0013e5b0;
                if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
                goto LAB_0013e4be;
              }
              if (0x67ff < uVar3) {
                if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
                goto LAB_0013e538;
              }
              goto LAB_0013e92e;
            }
            goto switchD_0013b8fc_caseD_12;
          }
          if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
        }
        else {
          if (uVar3 == 0x7f00) {
switchD_0013b8fc_caseD_30:
            snprintf(buf,buflen,"SSL - Memory allocation failed");
            if (uVar3 < 0x6f80) {
LAB_0013d929:
              if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
              if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
            }
            else {
              if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
LAB_0013d9d2:
              if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
            }
            goto LAB_0013de9a;
          }
          if (uVar3 == 0x7f80) {
switchD_0013b8fc_caseD_31:
            snprintf(buf,buflen,"SSL - Hardware acceleration function returned with error");
            goto LAB_0013d9f3;
          }
        }
LAB_0013ee7b:
        switch(uVar3 - 0x2300 >> 7) {
        case 0:
switchD_0013ee65_caseD_1:
          snprintf(buf,buflen,"X509 - The algorithm tag or value is invalid");
LAB_0013eeb3:
          switch(uVar3 - 0x2380 >> 7) {
          case 0:
            goto switchD_0013ee65_caseD_2;
          case 1:
            goto switchD_0013ee65_caseD_3;
          case 2:
            goto switchD_0013ee65_caseD_4;
          case 3:
            goto switchD_0013ee65_caseD_5;
          case 4:
            goto switchD_0013ee65_caseD_6;
          case 5:
            goto switchD_0013ee65_caseD_7;
          case 6:
            goto switchD_0013ee65_caseD_8;
          case 7:
            goto switchD_0013ee65_caseD_9;
          case 8:
            goto switchD_0013ee65_caseD_a;
          case 9:
            goto switchD_0013ee65_caseD_b;
          case 10:
            goto switchD_0013ee65_caseD_c;
          case 0xb:
            goto switchD_0013ee65_caseD_d;
          case 0xc:
            goto switchD_0013ee65_caseD_e;
          default:
            goto switchD_0013ee65_default;
          }
        case 1:
switchD_0013ee65_caseD_2:
          snprintf(buf,buflen,"X509 - The name tag or value is invalid");
          goto LAB_0013eeeb;
        case 2:
switchD_0013ee65_caseD_3:
          snprintf(buf,buflen,"X509 - The date tag or value is invalid");
LAB_0013ef23:
          switch(uVar3 - 0x2480 >> 7) {
          case 0:
            goto switchD_0013ee65_caseD_4;
          case 1:
            goto switchD_0013ee65_caseD_5;
          case 2:
            goto switchD_0013ee65_caseD_6;
          case 3:
            goto switchD_0013ee65_caseD_7;
          case 4:
            goto switchD_0013ee65_caseD_8;
          case 5:
            goto switchD_0013ee65_caseD_9;
          case 6:
            goto switchD_0013ee65_caseD_a;
          case 7:
            goto switchD_0013ee65_caseD_b;
          case 8:
            goto switchD_0013ee65_caseD_c;
          case 9:
            goto switchD_0013ee65_caseD_d;
          case 10:
            goto switchD_0013ee65_caseD_e;
          default:
            goto switchD_0013ee65_default;
          }
        case 3:
switchD_0013ee65_caseD_4:
          snprintf(buf,buflen,"X509 - The signature tag or value invalid");
LAB_0013ef5b:
          switch(uVar3 - 0x2500 >> 7) {
          case 0:
            goto switchD_0013ee65_caseD_5;
          case 1:
            goto switchD_0013ee65_caseD_6;
          case 2:
            goto switchD_0013ee65_caseD_7;
          case 3:
            goto switchD_0013ee65_caseD_8;
          case 4:
            goto switchD_0013ee65_caseD_9;
          case 5:
            goto switchD_0013ee65_caseD_a;
          case 6:
            goto switchD_0013ee65_caseD_b;
          case 7:
            goto switchD_0013ee65_caseD_c;
          case 8:
            goto switchD_0013ee65_caseD_d;
          case 9:
            goto switchD_0013ee65_caseD_e;
          default:
            goto switchD_0013ee65_default;
          }
        case 4:
switchD_0013ee65_caseD_5:
          snprintf(buf,buflen,"X509 - The extension tag or value is invalid");
          switch(uVar3 - 0x2580 >> 7) {
          case 0:
            goto switchD_0013ee65_caseD_6;
          case 1:
            goto switchD_0013ee65_caseD_7;
          case 2:
            goto switchD_0013ee65_caseD_8;
          case 3:
            goto switchD_0013ee65_caseD_9;
          }
          goto switchD_0013efb5_default;
        case 5:
switchD_0013ee65_caseD_6:
          snprintf(buf,buflen,"X509 - CRT/CRL/CSR has an unsupported version number");
          uVar1 = uVar3 - 0x2600 >> 7;
          if (uVar1 < 4) {
            (*(code *)(&DAT_00160880 + *(int *)(&DAT_00160880 + (ulong)uVar1 * 4)))();
            return;
          }
          goto LAB_0013f0ab;
        case 6:
switchD_0013ee65_caseD_7:
          snprintf(buf,buflen,"X509 - Signature algorithm (oid) is unsupported");
          goto LAB_0013f003;
        case 7:
          goto switchD_0013ee65_caseD_8;
        case 8:
          goto switchD_0013ee65_caseD_9;
        case 9:
          goto switchD_0013ee65_caseD_a;
        case 10:
          goto switchD_0013ee65_caseD_b;
        case 0xb:
          goto switchD_0013ee65_caseD_c;
        case 0xc:
          goto switchD_0013ee65_caseD_d;
        case 0xd:
          goto switchD_0013ee65_caseD_e;
        default:
          goto switchD_0013ee65_default;
        }
      }
      if (uVar3 < 0x3480) {
        if (uVar3 == 0x3380) {
LAB_00135ec7:
          snprintf(buf,buflen,"DHM - The ASN.1 data is not formatted correctly");
          if (uVar3 < 0x4e00) {
            if (uVar3 < 0x4d00) {
              if (uVar3 == 0x3400) goto LAB_00135f89;
              if (uVar3 == 0x3480) goto LAB_00135fca;
            }
            else {
              if (uVar3 == 0x4d00) goto switchD_00136000_caseD_1;
              if (uVar3 == 0x4d80) goto switchD_00136000_caseD_2;
            }
          }
          else if (uVar3 < 0x4f00) {
            if (uVar3 == 0x4e00) goto switchD_00136000_caseD_3;
            if (uVar3 == 0x4e80) goto switchD_00136000_caseD_4;
          }
          else {
LAB_00135f34:
            if (uVar3 == 0x4f00) goto switchD_00136000_caseD_5;
            if (uVar3 == 0x4f80) goto switchD_00136000_caseD_6;
          }
          goto LAB_001361b6;
        }
        if (uVar3 != 0x3400) goto LAB_0013a94b;
LAB_00135f89:
        snprintf(buf,buflen,"DHM - Allocation of memory failed");
LAB_00135f9d:
        if (uVar3 < 0x4e00) {
          if (uVar3 < 0x4d00) {
            if (uVar3 == 0x3480) goto LAB_00135fca;
            if (uVar3 == 0x4c80) goto switchD_00136000_caseD_0;
          }
          else {
            if (uVar3 == 0x4d00) goto switchD_00136000_caseD_1;
            if (uVar3 == 0x4d80) goto switchD_00136000_caseD_2;
          }
        }
        else if (uVar3 < 0x4f00) {
          if (uVar3 == 0x4e00) goto switchD_00136000_caseD_3;
          if (uVar3 == 0x4e80) goto switchD_00136000_caseD_4;
        }
        else {
          if (uVar3 == 0x4f00) goto switchD_00136000_caseD_5;
          if (uVar3 == 0x4f80) goto switchD_00136000_caseD_6;
        }
switchD_00136000_default:
        if (uVar3 < 0x3c00) {
          if (uVar3 < 0x1380) {
            if (uVar3 < 0x1200) {
              if (uVar3 == 0x1080) goto switchD_00136e93_caseD_0;
              if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
              if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
            }
            else {
              if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
              if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
              if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
            }
          }
          else if (uVar3 < 0x3a80) {
            if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
            if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
            if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
          }
          else {
            if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
          }
        }
        else if (uVar3 < 0x3f00) {
          if (uVar3 < 0x3d80) {
            if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
            if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
          }
          else {
            if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
            if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
            if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
          }
        }
        else if (uVar3 < 0x5080) {
          if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
          if (uVar3 == 0x3f80) goto LAB_001378e5;
          if (uVar3 == 0x4c00) goto switchD_0013613d_caseD_0;
        }
        else if (uVar3 < 0x5180) {
          if (uVar3 == 0x5080) goto switchD_0013613d_caseD_9;
          if (uVar3 == 0x5100) goto switchD_0013613d_caseD_a;
        }
        else {
          if (uVar3 == 0x5180) goto LAB_00136dd7;
          if (uVar3 == 0x5200) goto LAB_00136e5d;
        }
        goto LAB_001393c2;
      }
      if (uVar3 == 0x3480) {
LAB_00135fca:
        snprintf(buf,buflen,"DHM - Read/write of file failed");
        switch(uVar3 - 0x4c80 >> 7) {
        case 0:
          goto switchD_00136000_caseD_0;
        case 1:
          goto switchD_00136000_caseD_1;
        case 2:
          goto switchD_00136000_caseD_2;
        case 3:
          goto switchD_00136000_caseD_3;
        case 4:
          goto switchD_00136000_caseD_4;
        case 5:
          goto switchD_00136000_caseD_5;
        case 6:
          goto switchD_00136000_caseD_6;
        }
        goto switchD_00136000_default;
      }
      if (uVar3 != 0x3900) goto LAB_0013a94b;
LAB_001388df:
      snprintf(buf,buflen,"PK - The signature is valid but its length is less than expected");
      if (uVar3 < 0x1f80) {
        if (uVar3 == 0x1e00) goto LAB_00139dde;
        if (uVar3 == 0x1e80) goto LAB_00139d95;
        if (uVar3 == 0x1f00) goto LAB_00138927;
      }
      else {
        if (uVar3 == 0x2f80) {
LAB_00139e66:
          snprintf(buf,buflen,"PKCS5 - Bad input parameters to function");
          if (0x2eff < uVar3) {
            if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
            if (uVar3 != 0x4080) goto LAB_00139ea1;
            goto switchD_0013a43f_caseD_0;
          }
          if (uVar3 != 0x2e00) {
            if (uVar3 != 0x2e80) goto LAB_0013a8b4;
            goto LAB_00139f71;
          }
          goto LAB_0013a409;
        }
        if (uVar3 == 0x2f00) goto LAB_00139eae;
        if (uVar3 == 0x1f80) goto LAB_00138a11;
      }
LAB_00139ec2:
      if (uVar3 < 0x7580) {
        if (0x447f < uVar3) {
          if (0x727f < uVar3) {
            if (0x73ff < uVar3) {
              if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
              if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
              if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
              goto LAB_0013d9f3;
            }
            if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
LAB_0013b759:
            if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
            if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
            goto LAB_0013d9f3;
          }
          if (0x70ff < uVar3) {
            if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
            if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
            if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
            goto LAB_0013d9f3;
          }
LAB_0013b557:
          if (uVar3 != 0x4480) {
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            goto LAB_0013d9f3;
          }
LAB_0013b56e:
          snprintf(buf,buflen,"RSA - The random generator failed to generate non-zeros");
          switch(uVar3 - 0x7080 >> 7) {
          case 0:
switchD_0013b5a4_caseD_0:
            snprintf(buf,buflen,"SSL - The requested feature is not available");
            goto LAB_0013b5ba;
          case 1:
            goto switchD_0013b5dc_caseD_e;
          case 2:
            goto switchD_0013b5dc_caseD_f;
          case 3:
            goto switchD_0013b81c_caseD_0;
          case 4:
            goto switchD_0013b854_caseD_14;
          }
          goto switchD_0013b5a4_default;
        }
        if (uVar3 < 0x4200) {
          if (uVar3 < 0x4080) {
            if (uVar3 == 0x2e00) goto LAB_0013a409;
            if (uVar3 == 0x2e80) goto LAB_00139f71;
          }
          else {
            if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
            if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
            if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
          }
        }
        else if (uVar3 < 0x4300) {
          if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
          if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
        }
        else {
          if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
          if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
          if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
        }
      }
      else {
        if (0x7a7f < uVar3) {
          if (uVar3 < 32000) {
            if (uVar3 < 0x7b80) {
              if (uVar3 != 0x7a80) {
                if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
                goto LAB_0013d9f3;
              }
              goto switchD_0013b8fc_caseD_27;
            }
            if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
LAB_0013b673:
            if (uVar3 != 0x7c00) {
              if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
              goto LAB_0013d9f3;
            }
            goto switchD_0013b8fc_caseD_2a;
          }
          if (uVar3 < 0x7e80) {
            if (uVar3 != 32000) {
              if (uVar3 != 0x7d80) {
                if (uVar3 != 0x7e00) goto LAB_0013d9f3;
                goto switchD_0013b8fc_caseD_2e;
              }
              goto switchD_0013b8fc_caseD_2d;
            }
            goto switchD_0013b8fc_caseD_2c;
          }
          if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
LAB_0013b778:
          if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
          if (uVar3 != 0x7f80) goto LAB_0013d9f3;
          goto switchD_0013b8fc_caseD_31;
        }
        if (uVar3 < 0x7800) {
          if (uVar3 < 0x7680) {
            if (uVar3 != 0x7580) {
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
              goto LAB_0013d9f3;
            }
            goto switchD_0013b8fc_caseD_1d;
          }
          if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
LAB_0013b73a:
          if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
          if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
        }
        else {
          if (0x78ff < uVar3) {
            if (uVar3 != 0x7900) {
              if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
              if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
              goto LAB_0013d9f3;
            }
            goto switchD_0013b8fc_caseD_24;
          }
LAB_0013b601:
          if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
          if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
        }
      }
LAB_0013d9f3:
      if (uVar3 < 0x6800) {
        if (uVar3 < 0x2480) {
          if (uVar3 < 0x2280) {
            if (uVar3 < 0x2180) {
LAB_0013da1f:
              if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
              if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
            }
            else {
              if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
              if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
            }
          }
          else if (uVar3 < 0x2380) {
            if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
            if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
          }
          else {
            if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
            if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
          }
        }
        else if (uVar3 < 0x6600) {
          if (uVar3 < 0x2580) {
LAB_0013da9a:
            if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
            if (uVar3 == 0x2500) goto switchD_0013ee65_caseD_5;
          }
          else {
LAB_0013dc26:
            if (uVar3 == 0x2580) goto switchD_0013ee65_caseD_6;
            if (uVar3 == 0x2600) goto switchD_0013ee65_caseD_7;
          }
        }
        else if (uVar3 < 0x6700) {
          if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
          if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
        }
        else {
          if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
          if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
        }
      }
      else if (uVar3 < 0x6c00) {
        if (uVar3 < 0x6a00) {
          if (uVar3 < 0x6900) {
LAB_0013da61:
            if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
          }
          else {
            if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
            if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
          }
        }
        else if (uVar3 < 0x6b00) {
          if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
          if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
        }
        else {
          if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
          if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
        }
      }
      else if (uVar3 < 0x6e00) {
        if (uVar3 < 0x6d00) {
LAB_0013dad3:
          if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
          if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
        }
        else {
LAB_0013dc07:
          if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
          if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
        }
      }
      else if (uVar3 < 0x6f00) {
        if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
        if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
      }
      else {
        if (uVar3 == 0x6f00) {
switchD_0013b8fc_caseD_10:
          snprintf(buf,buflen,"SSL - Processing of the compression / decompression failed");
LAB_0013d957:
          if (uVar3 < 0x2980) {
            if (uVar3 < 0x2500) goto LAB_0013de18;
            if (0x26ff < uVar3) {
              if (0x27ff < uVar3) goto LAB_0013eab6;
              goto LAB_0013ebd2;
            }
            goto LAB_0013e6b4;
          }
          if (0x69ff < uVar3) {
            if (0x6c7f < uVar3) {
              if (uVar3 < 0x6d80) {
                if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
                if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
              }
              else {
                if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
                if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
                if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
              }
              goto switchD_0013ee65_default;
            }
            if (0x6aff < uVar3) {
              if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
              goto LAB_0013e418;
            }
            goto LAB_0013e48d;
          }
          if (uVar3 < 0x6780) goto LAB_0013e595;
          if (uVar3 < 0x6880) goto LAB_0013e885;
          if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
          goto LAB_0013e6e0;
        }
        if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
      }
LAB_0013f003:
      switch(uVar3 - 0x2680 >> 7) {
      case 0:
switchD_0013ee65_caseD_8:
        snprintf(buf,buflen,
                 "X509 - Signature algorithms do not match. (see \\c ::mbedtls_x509_crt sig_oid)");
LAB_0013f03b:
        switch(uVar3 - 0x2700 >> 7) {
        case 0:
          goto switchD_0013ee65_caseD_9;
        case 1:
          goto switchD_0013ee65_caseD_a;
        case 2:
          goto switchD_0013ee65_caseD_b;
        case 3:
          goto switchD_0013ee65_caseD_c;
        case 4:
          goto switchD_0013ee65_caseD_d;
        case 5:
          break;
        default:
          goto switchD_0013ee65_default;
        }
      case 1:
switchD_0013ee65_caseD_9:
        snprintf(buf,buflen,
                 "X509 - Certificate verification failed, e.g. CRL, CA or signature check failed");
switchD_0013efb5_default:
        switch(uVar3 - 0x2780 >> 7) {
        case 0:
          goto switchD_0013ee65_caseD_a;
        case 1:
          goto switchD_0013ee65_caseD_b;
        case 2:
          goto switchD_0013ee65_caseD_c;
        case 3:
          goto switchD_0013ee65_caseD_d;
        case 4:
          break;
        default:
          goto switchD_0013ee65_default;
        }
      case 2:
switchD_0013ee65_caseD_a:
        snprintf(buf,buflen,"X509 - Format not recognized as DER or PEM");
LAB_0013f0ab:
        switch(uVar3 - 0x2800 >> 7) {
        case 0:
          goto switchD_0013ee65_caseD_b;
        case 1:
          goto switchD_0013ee65_caseD_c;
        case 2:
          goto switchD_0013ee65_caseD_d;
        case 3:
          break;
        default:
          goto switchD_0013ee65_default;
        }
      case 3:
switchD_0013ee65_caseD_b:
        snprintf(buf,buflen,"X509 - Input invalid");
LAB_0013f0e3:
        if (uVar3 != 0x2980) {
          if (uVar3 != 0x2900) goto LAB_0013f0f5;
          goto switchD_0013ee65_caseD_d;
        }
        break;
      case 4:
switchD_0013ee65_caseD_c:
        snprintf(buf,buflen,"X509 - Allocation of memory failed");
        goto LAB_0013f112;
      case 5:
switchD_0013ee65_caseD_d:
        snprintf(buf,buflen,"X509 - Read/write of file failed");
        goto LAB_0013f138;
      case 6:
        break;
      default:
        goto switchD_0013ee65_default;
      }
switchD_0013ee65_caseD_e:
      snprintf(buf,buflen,"X509 - Destination buffer is too small");
      goto switchD_0013ee65_default;
    }
    if (0x13ff < uVar3) {
      if (0x1eff < uVar3) {
        if (uVar3 < 0x2e00) {
          if (uVar3 == 0x1f00) goto LAB_00138927;
          if (uVar3 != 0x1f80) goto LAB_0013a94b;
LAB_00138a11:
          snprintf(buf,buflen,"PKCS12 - Bad input parameters to function");
LAB_00138a25:
          if (uVar3 < 0x7300) {
            if (uVar3 < 0x4200) {
              if (uVar3 < 0x2f00) {
                if (uVar3 < 0x1f00) {
                  if (uVar3 == 0x1e00) goto LAB_00139dde;
                  if (uVar3 == 0x1e80) goto LAB_00139d95;
                }
                else {
                  if (uVar3 == 0x1f00) goto LAB_00138927;
                  if (uVar3 == 0x2e00) goto LAB_0013a409;
                  if (uVar3 == 0x2e80) goto LAB_00139f71;
                }
              }
              else if (uVar3 < 0x4080) {
                if (uVar3 == 0x2f00) goto LAB_00139eae;
                if (uVar3 == 0x2f80) goto LAB_00139e66;
              }
              else {
                if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
                if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
                if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
              }
            }
            else if (uVar3 < 0x4480) {
              if (uVar3 < 0x4300) {
                if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
                if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              }
              else {
                if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
                if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
                if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
              }
            }
            else if (uVar3 < 0x7180) {
              if (uVar3 == 0x4480) goto LAB_0013b56e;
              if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
              if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
            }
            else {
              if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
              if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
              if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
            }
          }
          else if (uVar3 < 0x7800) {
            if (uVar3 < 0x7580) {
              if (uVar3 < 0x7400) {
                if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
                if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
              }
              else {
                if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
                if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
                if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
              }
            }
            else if (uVar3 < 0x7680) {
              if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
            }
            else {
              if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
              if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
            }
          }
          else {
            if (0x7a7f < uVar3) {
              if (uVar3 < 0x7c00) {
                if (uVar3 != 0x7a80) {
                  if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
                  if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
                  goto LAB_0013d1f6;
                }
                goto switchD_0013b8fc_caseD_27;
              }
              if (uVar3 != 0x7c00) {
                if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
                if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
                goto LAB_0013d1f6;
              }
              goto switchD_0013b8fc_caseD_2a;
            }
            if (uVar3 < 0x7900) {
              if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
              if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
            }
            else {
              if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
              if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
              if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
            }
          }
          goto LAB_0013d1f6;
        }
        if (uVar3 != 0x2e00) {
          if (uVar3 != 0x2e80) goto LAB_0013a94b;
LAB_00139f71:
          snprintf(buf,buflen,"PKCS5 - Requested encryption or digest alg not available");
          goto LAB_00139f85;
        }
LAB_0013a409:
        snprintf(buf,buflen,
                 "PKCS5 - Given private key password does not allow for correct decryption");
        switch(uVar3 - 0x4080 >> 7) {
        case 0:
          goto switchD_0013a43f_caseD_0;
        case 1:
switchD_0013a43f_caseD_1:
          snprintf(buf,buflen,"RSA - Input data contains invalid padding and is rejected");
          goto LAB_0013a8b4;
        case 2:
          goto switchD_0013a43f_caseD_2;
        case 3:
          goto switchD_0013a935_caseD_0;
        case 4:
switchD_0013a935_caseD_1:
          snprintf(buf,buflen,"RSA - The public key operation failed");
        }
        if (uVar3 < 0x7580) {
          if (uVar3 < 0x6f80) {
            if (uVar3 < 0x6d00) {
              if (uVar3 < 0x4400) {
                if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
                if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
              }
              else {
                if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
                if (uVar3 == 0x4480) goto LAB_0013b56e;
                if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
              }
            }
            else if (uVar3 < 0x6e00) {
              if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
              if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
            }
            else {
              if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
              if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
              if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
            }
          }
          else if (uVar3 < 0x7280) {
            if (uVar3 < 0x7100) {
              if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
              if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            }
            else {
              if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
              if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
              if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
            }
          }
          else if (uVar3 < 0x7400) {
            if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
            if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
            if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
          }
          else {
            if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
            if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
            if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
          }
        }
        else if (uVar3 < 0x7a80) {
          if (uVar3 < 0x7800) {
            if (uVar3 < 0x7680) {
              if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
            }
            else {
              if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
              if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
            }
          }
          else if (uVar3 < 0x7900) {
            if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
            if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
          }
          else {
            if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
            if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
            if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          }
        }
        else if (uVar3 < 32000) {
          if (uVar3 < 0x7b80) {
            if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
            if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
          }
          else {
            if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
            if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
            if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
          }
        }
        else if (uVar3 < 0x7e80) {
          if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
          if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
          if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
        }
        else {
          if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
          if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
          if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
        }
LAB_0013e33e:
        if (uVar3 < 0x2880) goto LAB_0013e347;
        if (uVar3 < 0x6880) goto LAB_0013e392;
        if (0x6a7f < uVar3) {
          if (uVar3 < 0x6b80) goto LAB_0013e5cf;
LAB_0013e418:
          if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
          if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
          goto switchD_0013ee65_default;
        }
LAB_0013e3d5:
        if (uVar3 < 0x6980) {
LAB_0013e538:
          if (uVar3 != 0x6880) {
            if (uVar3 != 0x6900) goto switchD_0013ee65_default;
switchD_0013e653_caseD_1:
            snprintf(buf,buflen,"SSL - Connection requires a read call");
            goto switchD_0013e61b_default;
          }
          goto switchD_0013e653_caseD_0;
        }
LAB_0013e5b0:
        if (uVar3 != 0x6980) {
          if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
          goto switchD_0013ee65_default;
        }
switchD_0013e653_caseD_2:
        snprintf(buf,buflen,
                 "SSL - None of the common ciphersuites is usable (eg, no suitable certificate, see debug messages)"
                );
        uVar1 = uVar3 - 0x6780 >> 7;
        if (3 < uVar1) goto switchD_0013b8c4_caseD_11;
        bVar5 = *(int *)(&DAT_001606b8 + (ulong)uVar1 * 4) == -0x1606b8;
code_r0x0013ed77:
        if (!bVar5) {
          if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
          goto LAB_0013f138;
        }
switchD_0013ec95_caseD_0:
        snprintf(buf,buflen,"X509 - Unavailable feature, e.g. RSA hashing/encryption combination");
        uVar1 = uVar3 - 0x2100 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00160714 + *(int *)(&DAT_00160714 + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_0013ee7b;
      }
      if (uVar3 < 0x1e00) {
        if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
        if (uVar3 != 0x1480) goto LAB_0013a94b;
        goto switchD_00136e93_caseD_8;
      }
      if (uVar3 != 0x1e00) {
        if (uVar3 != 0x1e80) goto LAB_0013a94b;
LAB_00139d95:
        snprintf(buf,buflen,"PKCS12 - PBE ASN.1 data not as expected");
        if (uVar3 < 0x2f00) {
          if (uVar3 == 0x1e00) goto LAB_00139dde;
          if (uVar3 == 0x2e00) goto LAB_0013a409;
          if (uVar3 == 0x2e80) goto LAB_00139f71;
        }
        else {
          if (uVar3 == 0x2f00) goto LAB_00139eae;
          if (uVar3 == 0x2f80) goto LAB_00139e66;
          if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
        }
        goto LAB_0013a455;
      }
LAB_00139dde:
      snprintf(buf,buflen,
               "PKCS12 - Given private key password does not allow for correct decryption");
      if (uVar3 < 0x2f80) {
        if (uVar3 == 0x2e00) goto LAB_0013a409;
        if (uVar3 == 0x2e80) goto LAB_00139f71;
LAB_00139ea1:
        if (uVar3 == 0x2f00) goto LAB_00139eae;
      }
      else {
        if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
        if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
        if (uVar3 == 0x2f80) goto LAB_00139e66;
      }
LAB_0013a8b4:
      if (uVar3 < 0x7500) {
        if (uVar3 < 0x7100) {
          if (uVar3 < 0x4380) {
            if (uVar3 < 0x4280) {
              if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
              if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
            }
            else {
              if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
            }
          }
          else if (uVar3 < 0x4480) {
            if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
            if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
          }
          else {
            if (uVar3 == 0x4480) goto LAB_0013b56e;
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
          }
        }
        else if (uVar3 < 0x7300) {
          if (uVar3 < 0x7200) {
            if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
            if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
          }
          else {
            if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
            if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
          }
        }
        else if (uVar3 < 0x7400) {
          if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
          if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
        }
        else {
          if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
          if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
        }
      }
      else if (uVar3 < 0x7900) {
        if (uVar3 < 0x7700) {
          if (uVar3 < 0x7600) {
            if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
            if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
          }
          else {
            if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
            if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
          }
        }
        else if (uVar3 < 0x7800) {
          if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
          if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
        }
        else {
          if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
          if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
        }
      }
      else if (uVar3 < 0x7b00) {
        if (uVar3 < 0x7a00) {
          if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
          if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
        }
        else {
          if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
        }
      }
      else if (uVar3 < 0x7c00) {
        if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
        if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
      }
      else {
        if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
        if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
      }
LAB_0013cc9b:
      if (uVar3 < 0x6880) {
        if (uVar3 < 0x2580) {
          if (0x22ff < uVar3) {
            if (uVar3 < 0x2400) {
              if (uVar3 != 0x2300) {
                if (uVar3 != 0x2380) goto LAB_0013f0e3;
                goto switchD_0013ee65_caseD_2;
              }
              goto switchD_0013ee65_caseD_1;
            }
            if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
            if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
            if (uVar3 != 0x2500) goto LAB_0013f0e3;
            goto switchD_0013ee65_caseD_5;
          }
          if (uVar3 < 0x2180) {
            if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
            if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
          }
          else {
            if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
            if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
            if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
          }
        }
        else {
          if (uVar3 < 0x2800) {
            if (0x267f < uVar3) {
              if (uVar3 == 0x2680) goto switchD_0013ee65_caseD_8;
              if (uVar3 != 0x2700) {
                if (uVar3 != 0x2780) goto LAB_0013f0e3;
                goto switchD_0013ee65_caseD_a;
              }
              goto switchD_0013ee65_caseD_9;
            }
            if (uVar3 != 0x2580) {
              if (uVar3 != 0x2600) goto LAB_0013f0e3;
              goto switchD_0013ee65_caseD_7;
            }
            goto switchD_0013ee65_caseD_6;
          }
          if (uVar3 < 0x6700) {
            if (uVar3 == 0x2800) goto switchD_0013ee65_caseD_b;
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
          }
          else {
            if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
            if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
            if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
          }
        }
        goto LAB_0013f0e3;
      }
      if (uVar3 < 0x6d80) {
        if (uVar3 < 0x6b00) {
          if (uVar3 < 0x6980) {
            if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
            if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
          }
          else {
            if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
            if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
            if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
          }
        }
        else if (uVar3 < 0x6c00) {
          if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
          if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
        }
        else {
          if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
          if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
          if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
        }
        goto LAB_0013f0e3;
      }
      if (uVar3 < 32000) {
        if (uVar3 < 0x6e80) {
          if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
          if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
          goto LAB_0013f0e3;
        }
        if (uVar3 != 0x6e80) {
          if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
          if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
          goto LAB_0013f0e3;
        }
switchD_0013b8fc_caseD_f:
        snprintf(buf,buflen,"SSL - Handshake protocol not within min/max boundaries");
LAB_0013de9a:
        if (uVar3 < 0x6680) {
          if (uVar3 < 0x2480) {
            if (uVar3 < 0x2280) {
              if (uVar3 < 0x2180) {
                if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
                if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
              }
              else {
                if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
                if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
              }
            }
            else if (uVar3 < 0x2380) {
              if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
              if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
            }
            else {
              if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
              if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
            }
          }
          else if (uVar3 < 0x2680) {
            if (uVar3 < 0x2580) {
              if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
              if (uVar3 == 0x2500) goto switchD_0013ee65_caseD_5;
            }
            else {
              if (uVar3 == 0x2580) goto switchD_0013ee65_caseD_6;
              if (uVar3 == 0x2600) goto switchD_0013ee65_caseD_7;
            }
          }
          else if (uVar3 < 0x2780) {
            if (uVar3 == 0x2680) goto switchD_0013ee65_caseD_8;
            if (uVar3 == 0x2700) goto switchD_0013ee65_caseD_9;
          }
          else {
            if (uVar3 == 0x2780) goto switchD_0013ee65_caseD_a;
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
          }
        }
        else if (uVar3 < 0x6a80) {
          if (uVar3 < 0x6880) {
            if (uVar3 < 0x6780) {
              if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
              if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
            }
            else {
              if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
              if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            }
          }
          else if (uVar3 < 0x6980) {
            if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
            if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
          }
          else {
            if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
            if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
          }
        }
        else if (uVar3 < 0x6c80) {
          if (uVar3 < 0x6b80) {
            if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
            if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
          }
          else {
            if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
            if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
          }
        }
        else if (uVar3 < 0x6d80) {
          if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
          if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
        }
        else {
          if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
          if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
        }
        goto LAB_0013f0ab;
      }
      if (0x7e7f < uVar3) {
        if (uVar3 == 0x7e80) {
switchD_0013b8fc_caseD_2f:
          snprintf(buf,buflen,"SSL - Processing of the Finished handshake message failed");
          if (uVar3 < 0x7f00) {
            if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
            if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
          }
          else {
            if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
            if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
          }
          goto LAB_0013d957;
        }
        if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
        if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
        goto LAB_0013f0e3;
      }
      if (uVar3 != 32000) {
        if (uVar3 == 0x7d80) {
switchD_0013b8fc_caseD_2d:
          snprintf(buf,buflen,"SSL - Processing of the CertificateVerify handshake message failed");
          goto LAB_0013d2b5;
        }
        if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
        goto LAB_0013f0e3;
      }
switchD_0013b8fc_caseD_2c:
      snprintf(buf,buflen,
               "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Calculate Secret"
              );
LAB_0013d1f6:
      if (uVar3 < 0x6800) {
        if (uVar3 < 0x2580) {
          if (uVar3 < 0x2300) {
            if (uVar3 < 0x2180) {
              if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
              if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
            }
            else {
              if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
              if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
              if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
            }
          }
          else if (uVar3 < 0x2400) {
            if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
            if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
          }
          else {
            if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
            if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
            if (uVar3 == 0x2500) goto switchD_0013ee65_caseD_5;
          }
        }
        else if (uVar3 < 0x2800) {
          if (uVar3 < 0x2680) {
            if (uVar3 == 0x2580) goto switchD_0013ee65_caseD_6;
            if (uVar3 == 0x2600) goto switchD_0013ee65_caseD_7;
          }
          else {
            if (uVar3 == 0x2680) goto switchD_0013ee65_caseD_8;
            if (uVar3 == 0x2700) goto switchD_0013ee65_caseD_9;
            if (uVar3 == 0x2780) goto switchD_0013ee65_caseD_a;
          }
        }
        else {
          if (uVar3 < 0x6680) {
            if (uVar3 == 0x2800) goto switchD_0013ee65_caseD_b;
            if (uVar3 != 0x2880) {
              if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
              goto LAB_0013f112;
            }
            goto switchD_0013ee65_caseD_c;
          }
          if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
          if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
          if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
        }
      }
      else if (uVar3 < 0x6d00) {
        if (uVar3 < 0x6a80) {
          if (uVar3 < 0x6900) {
            if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
          }
          else {
            if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
            if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
            if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
          }
        }
        else if (uVar3 < 0x6b80) {
          if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
          if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
        }
        else {
          if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
          if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
          if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
        }
      }
      else if (uVar3 < 0x6f80) {
        if (uVar3 < 0x6e00) {
          if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
          if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
        }
        else {
          if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
          if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
          if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
        }
      }
      else if (uVar3 < 0x7e80) {
        if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
        if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
        if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
      }
      else {
        if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
        if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
        if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
      }
LAB_0013f112:
      if (uVar3 == 0x2980) goto switchD_0013ee65_caseD_e;
      goto LAB_0013f11b;
    }
    if (0x11ff < uVar3) {
      if (0x12ff < uVar3) {
        if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
        if (uVar3 != 0x1380) goto LAB_0013a94b;
        goto switchD_00136e93_caseD_6;
      }
      if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
      if (uVar3 != 0x1280) goto LAB_0013a94b;
switchD_00136e93_caseD_4:
      snprintf(buf,buflen,"PEM - Unsupported key encryption algorithm");
      if (0x147f < uVar3) {
LAB_00137318:
        if (uVar3 < 0x3f00) {
          if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
          if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
LAB_00137d38:
          if (uVar3 < 0x3d00) {
            if (uVar3 < 0x3900) {
              if (uVar3 < 0x2e00) {
                if (uVar3 < 0x1f00) {
                  if (uVar3 == 0x1e00) goto LAB_00139dde;
                  if (uVar3 == 0x1e80) goto LAB_00139d95;
                }
                else {
                  if (uVar3 == 0x1f00) goto LAB_00138927;
                  if (uVar3 == 0x1f80) goto LAB_00138a11;
                }
              }
              else if (uVar3 < 0x2f00) {
                if (uVar3 == 0x2e00) goto LAB_0013a409;
                if (uVar3 == 0x2e80) goto LAB_00139f71;
              }
              else {
                if (uVar3 == 0x2f00) goto LAB_00139eae;
                if (uVar3 == 0x2f80) goto LAB_00139e66;
              }
            }
            else if (uVar3 < 0x3b00) {
              if (uVar3 < 0x3a00) {
                if (uVar3 == 0x3900) goto LAB_001388df;
                if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
              }
              else {
                if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
                if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
              }
            }
            else if (uVar3 < 0x3c00) {
              if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
              if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
            }
            else {
              if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
              if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
            }
          }
          else if (uVar3 < 0x4300) {
            if (uVar3 < 0x4100) {
              if (uVar3 < 0x3e00) {
                if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
                if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
              }
              else {
                if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
                if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
              }
            }
            else if (uVar3 < 0x4200) {
              if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
              if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            }
            else {
              if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
              if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
            }
          }
          else if (uVar3 < 0x7080) {
            if (uVar3 < 0x4400) {
              if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
              if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
            }
            else {
              if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
              if (uVar3 == 0x4480) goto LAB_0013b56e;
            }
          }
          else if (uVar3 < 0x7180) {
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
          }
          else {
            if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
            if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
          }
          goto LAB_0013b832;
        }
        if (uVar3 != 0x3f00) {
          if (uVar3 == 0x3f80) goto LAB_001378e5;
          goto LAB_00137d38;
        }
switchD_0013791b_caseD_5:
        snprintf(buf,buflen,"PK - Type mismatch, eg attempt to encrypt with an ECDSA key");
LAB_00137931:
        if (uVar3 < 0x3d00) {
          if (uVar3 < 0x3900) {
            if (uVar3 < 0x2e00) {
              if (uVar3 < 0x1f00) goto LAB_0013795d;
              goto LAB_00137b57;
            }
            if (uVar3 < 0x2f00) {
              if (uVar3 == 0x2e00) goto LAB_0013a409;
              if (uVar3 == 0x2e80) goto LAB_00139f71;
            }
            else {
              if (uVar3 == 0x2f00) goto LAB_00139eae;
              if (uVar3 == 0x2f80) goto LAB_00139e66;
            }
          }
          else if (uVar3 < 0x3b00) {
            if (uVar3 < 0x3a00) goto LAB_001379d8;
            if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
            if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
          }
          else if (uVar3 < 0x3c00) {
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
          }
          else {
            if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
          }
          goto LAB_0013b7fa;
        }
        if (uVar3 < 0x4280) {
          if (uVar3 < 0x4080) {
            if (0x3dff < uVar3) goto LAB_00137b38;
            goto LAB_0013799f;
          }
          if (uVar3 < 0x4180) {
            if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
            if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
          }
          else {
            if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
          }
          goto LAB_0013b7fa;
        }
        if (uVar3 < 0x4480) {
          if (uVar3 < 0x4380) goto LAB_00137a11;
          if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
          if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
          goto LAB_0013b7fa;
        }
        if (uVar3 < 0x7100) {
          if (uVar3 != 0x4480) {
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            goto LAB_0013b7fa;
          }
          goto LAB_0013b56e;
        }
LAB_0013b4d9:
        if (uVar3 != 0x7100) {
          if (uVar3 != 0x7180) goto LAB_0013b7fa;
          goto switchD_0013b5dc_caseD_f;
        }
switchD_0013b5dc_caseD_e:
        snprintf(buf,buflen,"SSL - Bad input parameters to function");
        uVar1 = uVar3 - 0x7180 >> 7;
        if (uVar1 < 5) {
          (*(code *)(&DAT_00160020 + *(int *)(&DAT_00160020 + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_0013b8da;
      }
      if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
LAB_00137368:
      if (uVar3 != 0x1380) {
        if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
        goto LAB_00137d38;
      }
switchD_00136e93_caseD_6:
      snprintf(buf,buflen,"PEM - Given private key password does not allow for correct decryption");
LAB_00137480:
      if (uVar3 < 16000) {
        if (uVar3 < 0x3900) {
          if (uVar3 < 0x1f80) {
            if (uVar3 < 0x1e00) {
              if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
              if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
            }
            else {
              if (uVar3 == 0x1e00) goto LAB_00139dde;
              if (uVar3 == 0x1e80) goto LAB_00139d95;
              if (uVar3 == 0x1f00) goto LAB_00138927;
            }
          }
          else if (uVar3 < 0x2e80) {
            if (uVar3 == 0x1f80) goto LAB_00138a11;
            if (uVar3 == 0x2e00) goto LAB_0013a409;
          }
          else {
            if (uVar3 == 0x2e80) goto LAB_00139f71;
            if (uVar3 == 0x2f00) goto LAB_00139eae;
            if (uVar3 == 0x2f80) goto LAB_00139e66;
          }
        }
        else if (uVar3 < 0x3b80) {
          if (uVar3 < 0x3a00) {
            if (uVar3 == 0x3900) goto LAB_001388df;
            if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
          }
          else {
            if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
            if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
          }
        }
        else if (uVar3 < 0x3d00) {
          if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
          if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
          if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
        }
        else {
          if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
          if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
          if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
        }
        goto LAB_0013b94a;
      }
      if (0x43ff < uVar3) {
        if (uVar3 < 0x7200) {
          if (uVar3 < 0x7080) {
            if (uVar3 != 0x4400) {
              if (uVar3 != 0x4480) goto LAB_0013b94a;
              goto LAB_0013b56e;
            }
            goto switchD_0013a935_caseD_4;
          }
          if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
          if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
          if (uVar3 != 0x7180) goto LAB_0013b94a;
          goto switchD_0013b5dc_caseD_f;
        }
        if (uVar3 < 0x7380) {
          if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
          if (uVar3 != 0x7280) {
            if (uVar3 != 0x7300) goto LAB_0013b94a;
            goto switchD_0013b88c_caseD_16;
          }
          goto switchD_0013b854_caseD_14;
        }
        if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
        if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
        if (uVar3 != 0x7480) goto LAB_0013b94a;
        goto switchD_0013b8fc_caseD_1b;
      }
      if (0x417f < uVar3) {
        if (uVar3 < 0x4280) {
          if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
          if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
          goto LAB_0013b94a;
        }
        if (uVar3 != 0x4280) {
          if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
          if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
          goto LAB_0013b94a;
        }
        goto switchD_0013a935_caseD_1;
      }
      if (uVar3 < 0x3f80) {
        if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
        if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
      }
      else {
        if (uVar3 == 0x3f80) goto LAB_001378e5;
        if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
        if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
      }
LAB_0013b94a:
      switch(uVar3 - 0x6600 >> 7) {
      case 0:
        goto switchD_0013b96c_caseD_0;
      case 1:
        goto switchD_0013b96c_caseD_1;
      case 2:
        goto switchD_0013b8fc_caseD_0;
      case 3:
        goto switchD_0013b8fc_caseD_1;
      case 4:
        goto switchD_0013b8fc_caseD_2;
      case 5:
        goto switchD_0013e653_caseD_0;
      case 6:
        goto switchD_0013e653_caseD_1;
      case 7:
        goto switchD_0013e653_caseD_2;
      case 8:
        goto switchD_0013e653_caseD_3;
      case 9:
        goto switchD_0013e61b_caseD_3;
      case 10:
        goto switchD_0013b8fc_caseD_8;
      case 0xb:
        goto switchD_0013b8fc_caseD_9;
      case 0xc:
        goto switchD_0013b8fc_caseD_a;
      case 0xd:
        goto switchD_0013b8fc_caseD_b;
      case 0xe:
        goto switchD_0013b8fc_caseD_c;
      case 0xf:
        goto switchD_0013b8fc_caseD_d;
      case 0x10:
        goto switchD_0013b8fc_caseD_e;
      case 0x11:
        goto switchD_0013b8fc_caseD_f;
      case 0x12:
        goto switchD_0013b8fc_caseD_10;
      case 0x13:
        goto switchD_0013b8fc_caseD_11;
      case 0x1e:
        goto switchD_0013b8fc_caseD_1c;
      case 0x1f:
        goto switchD_0013b8fc_caseD_1d;
      case 0x20:
        goto switchD_0013b8fc_caseD_1e;
      case 0x21:
        goto switchD_0013b8fc_caseD_1f;
      case 0x22:
        goto switchD_0013b8fc_caseD_20;
      case 0x23:
        goto switchD_0013b8fc_caseD_21;
      case 0x24:
        goto switchD_0013b8fc_caseD_22;
      case 0x25:
        goto switchD_0013b8fc_caseD_23;
      case 0x26:
        goto switchD_0013b8fc_caseD_24;
      case 0x27:
        goto switchD_0013b8fc_caseD_25;
      case 0x28:
        goto switchD_0013b8fc_caseD_26;
      case 0x29:
        goto switchD_0013b8fc_caseD_27;
      case 0x2a:
        goto switchD_0013b8fc_caseD_28;
      case 0x2b:
        goto switchD_0013b8fc_caseD_29;
      case 0x2c:
        goto switchD_0013b8fc_caseD_2a;
      case 0x2d:
        goto switchD_0013b8fc_caseD_2b;
      case 0x2e:
        goto switchD_0013b8fc_caseD_2c;
      case 0x2f:
        goto switchD_0013b8fc_caseD_2d;
      case 0x30:
        goto switchD_0013b8fc_caseD_2e;
      case 0x31:
        goto switchD_0013b8fc_caseD_2f;
      case 0x32:
        goto switchD_0013b8fc_caseD_30;
      case 0x33:
        goto switchD_0013b8fc_caseD_31;
      }
switchD_0013b96c_caseD_14:
      switch(uVar3 - 0x2080 >> 7) {
      case 0:
        goto switchD_0013ec95_caseD_0;
      case 1:
switchD_0013ec95_caseD_1:
        snprintf(buf,buflen,"X509 - Requested OID is unknown");
        uVar1 = uVar3 - 0x2180 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00160724 + *(int *)(&DAT_00160724 + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_0013eeb3;
      case 2:
switchD_0013ec95_caseD_2:
        snprintf(buf,buflen,"X509 - The CRT/CRL/CSR format is invalid, e.g. different type expected"
                );
        uVar1 = uVar3 - 0x2200 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00160734 + *(int *)(&DAT_00160734 + (ulong)uVar1 * 4)))();
          return;
        }
        break;
      case 3:
switchD_0013ec95_caseD_3:
        snprintf(buf,buflen,"X509 - The CRT/CRL/CSR version element is invalid");
        goto LAB_0013ee43;
      case 4:
        goto switchD_0013ee65_caseD_0;
      case 5:
        goto switchD_0013ee65_caseD_1;
      case 6:
        goto switchD_0013ee65_caseD_2;
      case 7:
        goto switchD_0013ee65_caseD_3;
      case 8:
        goto switchD_0013ee65_caseD_4;
      case 9:
        goto switchD_0013ee65_caseD_5;
      case 10:
        goto switchD_0013ee65_caseD_6;
      case 0xb:
        goto switchD_0013ee65_caseD_7;
      case 0xc:
        goto switchD_0013ee65_caseD_8;
      case 0xd:
        goto switchD_0013ee65_caseD_9;
      case 0xe:
        goto switchD_0013ee65_caseD_a;
      case 0xf:
        goto switchD_0013ee65_caseD_b;
      case 0x10:
        goto switchD_0013ee65_caseD_c;
      case 0x11:
        goto switchD_0013ee65_caseD_d;
      case 0x12:
        goto switchD_0013ee65_caseD_e;
      default:
        goto switchD_0013ee65_default;
      }
LAB_0013eeeb:
      switch(uVar3 - 0x2400 >> 7) {
      case 0:
        goto switchD_0013ee65_caseD_3;
      case 1:
        goto switchD_0013ee65_caseD_4;
      case 2:
        goto switchD_0013ee65_caseD_5;
      case 3:
        goto switchD_0013ee65_caseD_6;
      case 4:
        goto switchD_0013ee65_caseD_7;
      case 5:
        goto switchD_0013ee65_caseD_8;
      case 6:
        goto switchD_0013ee65_caseD_9;
      case 7:
        goto switchD_0013ee65_caseD_a;
      case 8:
        goto switchD_0013ee65_caseD_b;
      case 9:
        goto switchD_0013ee65_caseD_c;
      case 10:
        goto switchD_0013ee65_caseD_d;
      case 0xb:
        goto switchD_0013ee65_caseD_e;
      }
      goto switchD_0013ee65_default;
    }
    if (0x10ff < uVar3) {
      if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
      if (uVar3 != 0x1180) goto LAB_0013a94b;
      goto switchD_00136e93_caseD_2;
    }
    if (uVar3 != 0) {
      if (uVar3 != 0x1080) goto LAB_0013a94b;
      goto switchD_00136e93_caseD_0;
    }
  }
  else {
    if (uVar3 < 0x4d80) {
      if (0x3f7f < uVar3) {
        if (0x41ff < uVar3) {
          if (0x4c7f < uVar3) {
            if (uVar3 != 0x4c80) {
              if (uVar3 != 0x4d00) goto LAB_0013a94b;
              goto switchD_00136000_caseD_1;
            }
switchD_00136000_caseD_0:
            snprintf(buf,buflen,"ECP - Invalid private or public key");
            goto switchD_00136000_default;
          }
          if (uVar3 != 0x4200) {
            if (uVar3 != 0x4c00) goto LAB_0013a94b;
            goto switchD_0013613d_caseD_0;
          }
switchD_0013a935_caseD_0:
          snprintf(buf,buflen,"RSA - Key failed to pass the library\'s validity check");
          goto LAB_0013a94b;
        }
        if (0x40ff < uVar3) {
          if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
          if (uVar3 != 0x4180) goto LAB_0013a94b;
switchD_0013a43f_caseD_2:
          snprintf(buf,buflen,"RSA - Something failed during generation of a key");
          switch(uVar3 - 0x4200 >> 7) {
          case 0:
            goto switchD_0013a935_caseD_0;
          case 1:
            goto switchD_0013a935_caseD_1;
          case 2:
switchD_0013a935_caseD_2:
            snprintf(buf,buflen,"RSA - The private key operation failed");
            goto LAB_0013b18e;
          case 3:
switchD_0013a935_caseD_3:
            snprintf(buf,buflen,"RSA - The PKCS#1 verification failed");
            if (uVar3 < 0x7080) goto LAB_0013b4f8;
LAB_0013b4cc:
            if (uVar3 != 0x7080) goto LAB_0013b4d9;
            break;
          case 4:
switchD_0013a935_caseD_4:
            snprintf(buf,buflen,"RSA - The output buffer for decryption is not large enough");
          default:
            goto switchD_0013a935_default;
          }
          goto switchD_0013b5a4_caseD_0;
        }
        if (uVar3 == 0x3f80) goto LAB_001378e5;
        if (uVar3 != 0x4080) goto LAB_0013a94b;
switchD_0013a43f_caseD_0:
        snprintf(buf,buflen,"RSA - Bad input parameters to function");
LAB_0013a455:
        if (0x757f < uVar3) {
          if (uVar3 < 0x7a80) {
            if (uVar3 < 0x7800) {
              if (uVar3 < 0x7680) {
                if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
                if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
              }
              else {
                if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
                if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
                if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
              }
            }
            else if (uVar3 < 0x7900) {
              if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
              if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
            }
            else {
              if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
              if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
              if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
            }
            goto LAB_0013de9a;
          }
          if (uVar3 < 32000) {
            if (uVar3 < 0x7b80) {
              if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
              if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
            }
            else {
              if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
              if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
              if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
            }
            goto LAB_0013de9a;
          }
          if (uVar3 < 0x7e80) {
            if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
            if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
            if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
            goto LAB_0013de9a;
          }
          if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
          if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
          goto LAB_0013d9d2;
        }
        if (uVar3 < 0x6f80) {
          if (uVar3 < 0x4380) {
            if (uVar3 < 0x4200) {
              if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
              if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            }
            else {
              if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
              if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
            }
            goto LAB_0013de9a;
          }
          if (uVar3 < 0x4480) {
            if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
            if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
            goto LAB_0013de9a;
          }
          if (uVar3 == 0x4480) goto LAB_0013b56e;
          goto LAB_0013d929;
        }
        if (uVar3 < 0x7280) {
          if (uVar3 < 0x7100) {
            if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
          }
          else {
            if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
            if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
            if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
          }
        }
        else if (uVar3 < 0x7400) {
          if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
          if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
          if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
        }
        else {
          if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
          if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
          if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
        }
        goto LAB_0013de9a;
      }
      if (uVar3 < 0x3d80) {
        if (0x3c7f < uVar3) {
          if (uVar3 != 0x3c80) {
            if (uVar3 != 0x3d00) goto LAB_0013a94b;
            goto switchD_0013791b_caseD_1;
          }
switchD_0013806b_caseD_6:
          snprintf(buf,buflen,"PK - Key algorithm is unsupported (only RSA and EC are supported)");
          goto switchD_0013791b_default;
        }
        if (uVar3 != 0x3b80) {
          if (uVar3 != 0x3c00) goto LAB_0013a94b;
          goto switchD_0013806b_caseD_5;
        }
switchD_0013806b_caseD_4:
        snprintf(buf,buflen,"PK - Given private key password does not allow for correct decryption")
        ;
        if (uVar3 < 0x3980) {
          if (uVar3 == 0x1f00) {
LAB_00138927:
            snprintf(buf,buflen,"PKCS12 - Feature not available, e.g. unsupported encryption scheme"
                    );
          }
          else {
            if (uVar3 == 0x1f80) goto LAB_00138a11;
            if (uVar3 == 0x3900) goto LAB_001388df;
          }
        }
        else if (uVar3 < 0x3a80) {
          if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
          if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
        }
        else {
          if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
          if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
        }
        if (0x737f < uVar3) {
          if (uVar3 < 0x7880) {
            if (uVar3 < 0x7600) {
              if (uVar3 < 0x7480) {
                if (uVar3 != 0x7380) {
                  if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
                  goto LAB_0013d2b5;
                }
                goto switchD_0013b8c4_caseD_18;
              }
              if (uVar3 != 0x7480) {
                if (uVar3 != 0x7500) {
                  if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
                  goto LAB_0013d2b5;
                }
                goto switchD_0013b8fc_caseD_1c;
              }
              goto switchD_0013b8fc_caseD_1b;
            }
            if (0x76ff < uVar3) {
              if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
              if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
              goto LAB_0013d2b5;
            }
            if (uVar3 != 0x7600) {
              if (uVar3 != 0x7680) goto LAB_0013d2b5;
              goto switchD_0013b8fc_caseD_1f;
            }
            goto switchD_0013b8fc_caseD_1e;
          }
          if (uVar3 < 0x7b00) {
            if (uVar3 < 0x7980) {
              if (uVar3 != 0x7880) {
                if (uVar3 != 0x7900) goto LAB_0013d2b5;
                goto switchD_0013b8fc_caseD_24;
              }
              goto switchD_0013b8fc_caseD_23;
            }
            if (uVar3 != 0x7980) {
              if (uVar3 != 0x7a00) {
                if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
                goto LAB_0013d2b5;
              }
              goto switchD_0013b8fc_caseD_26;
            }
            goto switchD_0013b8fc_caseD_25;
          }
          if (uVar3 < 0x7c80) {
            if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
            if (uVar3 != 0x7b80) {
              if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
              goto LAB_0013d2b5;
            }
            goto switchD_0013b8fc_caseD_29;
          }
          if (uVar3 != 0x7c80) {
            if (uVar3 != 32000) {
              if (uVar3 != 0x7d80) goto LAB_0013d2b5;
              goto switchD_0013b8fc_caseD_2d;
            }
            goto switchD_0013b8fc_caseD_2c;
          }
          goto switchD_0013b8fc_caseD_2b;
        }
        if (uVar3 < 0x4280) {
          if (uVar3 < 0x2f80) {
            if (uVar3 < 0x2e00) {
              if (uVar3 == 0x1e00) goto LAB_00139dde;
              if (uVar3 == 0x1e80) goto LAB_00139d95;
            }
            else {
              if (uVar3 == 0x2e00) goto LAB_0013a409;
              if (uVar3 == 0x2e80) goto LAB_00139f71;
              if (uVar3 == 0x2f00) goto LAB_00139eae;
            }
          }
          else if (uVar3 < 0x4100) {
            if (uVar3 == 0x2f80) goto LAB_00139e66;
            if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
          }
          else {
            if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
            if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
          }
        }
        else {
          if (0x707f < uVar3) {
            if (uVar3 < 0x7200) {
              if (uVar3 != 0x7080) {
                if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
                if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
                goto LAB_0013d2b5;
              }
              goto switchD_0013b5a4_caseD_0;
            }
            if (uVar3 != 0x7200) {
              if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
              if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
              goto LAB_0013d2b5;
            }
            goto switchD_0013b81c_caseD_0;
          }
          if (uVar3 < 0x4380) {
            if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
            if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
          }
          else {
            if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
            if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
            if (uVar3 == 0x4480) goto LAB_0013b56e;
          }
        }
LAB_0013d2b5:
        if (uVar3 < 0x6780) {
          if (uVar3 < 0x2580) {
            if (uVar3 < 0x2300) {
              if (uVar3 < 0x2180) {
                bVar5 = uVar3 == 0x2080;
                goto code_r0x0013ed77;
              }
              if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
              if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
              if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
            }
            else if (uVar3 < 0x2400) {
              if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
              if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
            }
            else {
              if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
              if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
              if (uVar3 == 0x2500) goto switchD_0013ee65_caseD_5;
            }
          }
          else if (uVar3 < 0x2800) {
            if (uVar3 < 0x2680) {
              if (uVar3 == 0x2580) goto switchD_0013ee65_caseD_6;
              if (uVar3 == 0x2600) goto switchD_0013ee65_caseD_7;
            }
            else {
              if (uVar3 == 0x2680) goto switchD_0013ee65_caseD_8;
              if (uVar3 == 0x2700) goto switchD_0013ee65_caseD_9;
              if (uVar3 == 0x2780) goto switchD_0013ee65_caseD_a;
            }
          }
          else {
            if (uVar3 < 0x6600) {
              if (uVar3 == 0x2800) goto switchD_0013ee65_caseD_b;
              goto LAB_0013e9bd;
            }
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
            if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
          }
        }
        else if (uVar3 < 0x6c80) {
          if (uVar3 < 0x6a00) {
            if (uVar3 < 0x6880) {
              if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
              if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            }
            else {
              if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
              if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
              if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
            }
          }
          else if (uVar3 < 0x6b00) {
            if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
            if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
          }
          else {
            if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
            if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
            if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
          }
        }
        else if (uVar3 < 0x6f00) {
          if (uVar3 < 0x6d80) {
            if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
            if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
          }
          else {
            if (uVar3 == 0x6d80) {
switchD_0013b8fc_caseD_d:
              snprintf(buf,buflen,"SSL - Session ticket has expired");
              switch(uVar3 - 0x6b80 >> 7) {
              case 0:
                goto switchD_0013b8fc_caseD_9;
              case 1:
                goto switchD_0013b8fc_caseD_a;
              case 2:
                goto switchD_0013b8fc_caseD_b;
              case 3:
                goto switchD_0013b8fc_caseD_c;
              }
              goto switchD_0013e2bd_default;
            }
            if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
            if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
          }
        }
        else if (uVar3 < 0x7e80) {
          if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
          if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
          if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
        }
        else {
          if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
          if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
          if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
        }
      }
      else {
        if (15999 < uVar3) {
          if (uVar3 != 16000) {
            if (uVar3 != 0x3f00) goto LAB_0013a94b;
            goto switchD_0013791b_caseD_5;
          }
switchD_0013791b_caseD_4:
          snprintf(buf,buflen,"PK - Bad input parameters to function");
          goto LAB_00137d38;
        }
        if (uVar3 != 0x3d80) {
          if (uVar3 != 0x3e00) goto LAB_0013a94b;
          goto switchD_0013791b_caseD_3;
        }
switchD_0013791b_caseD_2:
        snprintf(buf,buflen,"PK - Unsupported key version");
LAB_00137fa4:
        if (uVar3 < 0x3d00) {
          if (uVar3 < 0x3900) {
            if (uVar3 < 0x2e00) {
              if (uVar3 < 0x1f00) {
                if (uVar3 == 0x1e00) goto LAB_00139dde;
                if (uVar3 == 0x1e80) goto LAB_00139d95;
              }
              else {
                if (uVar3 == 0x1f00) goto LAB_00138927;
                if (uVar3 == 0x1f80) goto LAB_00138a11;
              }
            }
            else if (uVar3 < 0x2f00) {
              if (uVar3 == 0x2e00) goto LAB_0013a409;
              if (uVar3 == 0x2e80) goto LAB_00139f71;
            }
            else {
              if (uVar3 == 0x2f00) goto LAB_00139eae;
              if (uVar3 == 0x2f80) goto LAB_00139e66;
            }
          }
          else if (uVar3 < 0x3b00) {
            if (uVar3 < 0x3a00) {
              if (uVar3 == 0x3900) goto LAB_001388df;
              if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
            }
            else {
              if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
              if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            }
          }
          else if (uVar3 < 0x3c00) {
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
          }
          else {
            if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
          }
        }
        else {
          if (0x43ff < uVar3) {
            if (uVar3 < 0x7180) {
              if (uVar3 < 0x7080) {
                if (uVar3 != 0x4400) {
                  if (uVar3 != 0x4480) goto LAB_0013b8a2;
                  goto LAB_0013b56e;
                }
                goto switchD_0013a935_caseD_4;
              }
              if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
              if (uVar3 != 0x7100) goto LAB_0013b8a2;
              goto switchD_0013b5dc_caseD_e;
            }
            if (uVar3 < 0x7280) {
              if (uVar3 != 0x7180) {
                if (uVar3 != 0x7200) goto LAB_0013b8a2;
                goto switchD_0013b81c_caseD_0;
              }
              goto switchD_0013b5dc_caseD_f;
            }
            if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
            if (uVar3 != 0x7300) goto LAB_0013b8a2;
            goto switchD_0013b88c_caseD_16;
          }
          if (uVar3 < 0x4200) {
            if (uVar3 < 0x4100) {
              if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
              if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
            }
            else {
              if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
              if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            }
          }
          else if (uVar3 < 0x4300) {
            if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
            if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
          }
          else {
            if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
            if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
          }
        }
LAB_0013b8a2:
        switch(uVar3 - 0x6780 >> 7) {
        case 0:
          goto switchD_0013b8fc_caseD_1;
        case 1:
          goto switchD_0013b8fc_caseD_2;
        case 2:
          goto switchD_0013e653_caseD_0;
        case 3:
          goto switchD_0013e653_caseD_1;
        case 4:
          goto switchD_0013e653_caseD_2;
        case 5:
          goto switchD_0013e653_caseD_3;
        case 6:
          goto switchD_0013e61b_caseD_3;
        case 7:
          goto switchD_0013b8fc_caseD_8;
        case 8:
          goto switchD_0013b8fc_caseD_9;
        case 9:
          goto switchD_0013b8fc_caseD_a;
        case 10:
          goto switchD_0013b8fc_caseD_b;
        case 0xb:
          goto switchD_0013b8fc_caseD_c;
        case 0xc:
          goto switchD_0013b8fc_caseD_d;
        case 0xd:
          goto switchD_0013b8fc_caseD_e;
        case 0xe:
          goto switchD_0013b8fc_caseD_f;
        case 0xf:
          goto switchD_0013b8fc_caseD_10;
        case 0x10:
          goto switchD_0013b8fc_caseD_11;
        case 0x18:
          goto switchD_0013b8c4_caseD_18;
        case 0x19:
          goto switchD_0013b8fc_caseD_1a;
        case 0x1a:
          goto switchD_0013b8fc_caseD_1b;
        case 0x1b:
          goto switchD_0013b8fc_caseD_1c;
        case 0x1c:
          goto switchD_0013b8fc_caseD_1d;
        case 0x1d:
          goto switchD_0013b8fc_caseD_1e;
        case 0x1e:
          goto switchD_0013b8fc_caseD_1f;
        case 0x1f:
          goto switchD_0013b8fc_caseD_20;
        case 0x20:
          goto switchD_0013b8fc_caseD_21;
        case 0x21:
          goto switchD_0013b8fc_caseD_22;
        case 0x22:
          goto switchD_0013b8fc_caseD_23;
        case 0x23:
          goto switchD_0013b8fc_caseD_24;
        case 0x24:
          goto switchD_0013b8fc_caseD_25;
        case 0x25:
          goto switchD_0013b8fc_caseD_26;
        case 0x26:
          goto switchD_0013b8fc_caseD_27;
        case 0x27:
          goto switchD_0013b8fc_caseD_28;
        case 0x28:
          goto switchD_0013b8fc_caseD_29;
        case 0x29:
          goto switchD_0013b8fc_caseD_2a;
        case 0x2a:
          goto switchD_0013b8fc_caseD_2b;
        case 0x2b:
          goto switchD_0013b8fc_caseD_2c;
        case 0x2c:
          goto switchD_0013b8fc_caseD_2d;
        case 0x2d:
          goto switchD_0013b8fc_caseD_2e;
        case 0x2e:
          goto switchD_0013b8fc_caseD_2f;
        case 0x2f:
          goto switchD_0013b8fc_caseD_30;
        case 0x30:
          goto switchD_0013b8fc_caseD_31;
        }
switchD_0013b8c4_caseD_11:
        if (uVar3 < 0x2600) {
LAB_0013e965:
          if (0x22ff < uVar3) {
            if (uVar3 < 0x2480) {
              if (uVar3 != 0x2300) goto LAB_0013e988;
              goto switchD_0013ee65_caseD_1;
            }
            if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
LAB_0013e9e9:
            if (uVar3 == 0x2500) goto switchD_0013ee65_caseD_5;
            if (uVar3 == 0x2580) goto switchD_0013ee65_caseD_6;
            goto switchD_0013ee65_default;
          }
LAB_0013eb26:
          if (uVar3 < 0x2180) goto LAB_0013eb5b;
          if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
LAB_0013eb3c:
          if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
          if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
          goto switchD_0013ee65_default;
        }
        if (uVar3 < 0x2880) {
          if (0x26ff < uVar3) goto LAB_0013ea11;
LAB_0013ea3d:
          if (uVar3 == 0x2600) goto switchD_0013ee65_caseD_7;
          if (uVar3 != 0x2680) goto switchD_0013ee65_default;
          goto switchD_0013ee65_caseD_8;
        }
        if (0x65ff < uVar3) {
          if (uVar3 != 0x6600) goto LAB_0013ea69;
switchD_0013b96c_caseD_0:
          snprintf(buf,buflen,"SSL - Couldn\'t set the hash for verifying CertificateVerify");
          goto switchD_0013b96c_caseD_14;
        }
LAB_0013e9bd:
        if (uVar3 == 0x2880) goto switchD_0013ee65_caseD_c;
LAB_0013e9ca:
        if (uVar3 == 0x2900) goto switchD_0013ee65_caseD_d;
      }
LAB_0013f138:
      if (uVar3 == 0x2980) goto switchD_0013ee65_caseD_e;
    }
    else if (uVar3 < 0x5200) {
      if (uVar3 < 0x4f80) {
        if (uVar3 < 0x4e80) {
          if (uVar3 != 0x4d80) {
            if (uVar3 != 0x4e00) goto LAB_0013a94b;
            goto switchD_00136000_caseD_3;
          }
switchD_00136000_caseD_2:
          snprintf(buf,buflen,"ECP - Memory allocation failed");
          goto LAB_00136153;
        }
        if (uVar3 != 0x4e80) {
          if (uVar3 != 0x4f00) goto LAB_0013a94b;
switchD_00136000_caseD_5:
          snprintf(buf,buflen,"ECP - The buffer is too small to write to");
          switch(uVar3 - 0x4c00 >> 7) {
          case 0:
            goto switchD_0013613d_caseD_0;
          case 1:
            goto switchD_00136000_caseD_0;
          case 2:
            goto switchD_00136000_caseD_1;
          case 3:
            goto switchD_00136000_caseD_2;
          case 4:
            goto switchD_00136000_caseD_3;
          case 5:
            break;
          default:
            goto switchD_00136095_default;
          }
        }
switchD_00136000_caseD_4:
        snprintf(buf,buflen,"ECP - Requested curve not available");
        switch(uVar3 - 0x4c00 >> 7) {
        case 0:
switchD_0013613d_caseD_0:
          snprintf(buf,buflen,"ECP - Signature is valid but shorter than the user-supplied length");
          break;
        case 1:
          goto switchD_00136000_caseD_0;
        case 2:
switchD_00136000_caseD_1:
          snprintf(buf,buflen,"ECP - Generation of random value, such as (ephemeral) key, failed");
LAB_001361b6:
          if (uVar3 < 0x3c80) {
            if (uVar3 < 0x1380) {
              if (uVar3 < 0x1200) {
                if (uVar3 == 0x1080) goto switchD_00136e93_caseD_0;
                if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
                if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
              }
              else {
                if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
                if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
                if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
              }
            }
            else if (uVar3 < 0x3b00) {
              if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
              if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
              if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
            }
            else {
              if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
              if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
              if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            }
          }
          else if (uVar3 < 0x3f80) {
            if (uVar3 < 0x3e00) {
              if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
              if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
              if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
            }
            else {
              if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
              if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
              if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
            }
          }
          else if (uVar3 < 0x5080) {
            if (uVar3 == 0x3f80) goto LAB_001378e5;
            if (uVar3 == 0x4c00) goto switchD_0013613d_caseD_0;
            if (uVar3 == 0x4c80) goto switchD_00136000_caseD_0;
          }
          else if (uVar3 < 0x5180) {
            if (uVar3 == 0x5080) goto switchD_0013613d_caseD_9;
            if (uVar3 == 0x5100) goto switchD_0013613d_caseD_a;
          }
          else {
            if (uVar3 == 0x5180) goto LAB_00136dd7;
            if (uVar3 == 0x5200) goto LAB_00136e5d;
          }
          goto LAB_00138b8e;
        case 3:
          goto switchD_00136000_caseD_2;
        case 4:
switchD_00136000_caseD_3:
          snprintf(buf,buflen,"ECP - The signature is not valid");
          switch(uVar3 - 0x4c00 >> 7) {
          case 0:
            goto switchD_0013613d_caseD_0;
          case 1:
            goto switchD_00136000_caseD_0;
          case 2:
            goto switchD_00136000_caseD_1;
          case 3:
            goto switchD_00136000_caseD_2;
          default:
            goto switchD_0013613d_caseD_4;
          case 9:
            goto switchD_0013613d_caseD_9;
          case 10:
            goto switchD_0013613d_caseD_a;
          }
        default:
          goto switchD_00136105_caseD_5;
        case 9:
          goto switchD_0013613d_caseD_9;
        }
switchD_00136095_default:
        if (uVar3 < 0x3b80) {
          if (uVar3 < 0x1380) {
            if (uVar3 < 0x1200) {
              if (uVar3 == 0x1080) goto switchD_00136e93_caseD_0;
              if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
              if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
            }
            else {
              if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
              if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
              if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
            }
          }
          else if (uVar3 < 0x3a00) {
            if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
            if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
            if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
          }
          else {
            if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
            if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
          }
          goto LAB_001396fb;
        }
        if (uVar3 < 16000) {
          if (uVar3 < 0x3d00) {
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
            if (uVar3 != 0x3c00) {
              if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
              goto LAB_001396fb;
            }
switchD_0013806b_caseD_5:
            snprintf(buf,buflen,"PK - Private key password can\'t be empty");
            if (uVar3 < 0x3a00) {
              if (uVar3 == 0x1f80) goto LAB_00138a11;
              if (uVar3 == 0x3900) goto LAB_001388df;
              if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
            }
            else if (uVar3 < 0x3b00) {
              if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
              if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            }
            else {
              if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
              if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
            }
            goto LAB_00138a25;
          }
          if (uVar3 != 0x3d00) {
            if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
            if (uVar3 != 0x3e00) goto LAB_001396fb;
            goto switchD_0013791b_caseD_3;
          }
switchD_0013791b_caseD_1:
          snprintf(buf,buflen,"PK - Invalid key tag or value");
          switch(uVar3 - 0x3980 >> 7) {
          case 0:
            goto switchD_0013806b_caseD_0;
          case 1:
            goto switchD_0013806b_caseD_1;
          case 2:
            goto switchD_0013806b_caseD_2;
          case 3:
switchD_0013806b_caseD_3:
            snprintf(buf,buflen,
                     "PK - The pubkey tag or value is invalid (only RSA and EC are supported)");
LAB_00138b8e:
            if (uVar3 < 0x7080) {
              if (uVar3 < 0x3a00) {
                if (uVar3 < 0x2e80) {
                  if (uVar3 < 0x1f00) {
                    if (uVar3 == 0x1e00) goto LAB_00139dde;
                    if (uVar3 == 0x1e80) goto LAB_00139d95;
                  }
                  else {
                    if (uVar3 == 0x1f00) goto LAB_00138927;
                    if (uVar3 == 0x1f80) goto LAB_00138a11;
                    if (uVar3 == 0x2e00) goto LAB_0013a409;
                  }
                }
                else if (uVar3 < 0x2f80) {
                  if (uVar3 == 0x2e80) goto LAB_00139f71;
                  if (uVar3 == 0x2f00) goto LAB_00139eae;
                }
                else {
                  if (uVar3 == 0x2f80) goto LAB_00139e66;
                  if (uVar3 == 0x3900) goto LAB_001388df;
                  if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
                }
              }
              else if (uVar3 < 0x4200) {
                if (uVar3 < 0x4080) {
                  if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
                  if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
                }
                else {
                  if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
                  if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
                  if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
                }
              }
              else if (uVar3 < 0x4380) {
                if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
                if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
                if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
              }
              else {
                if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
                if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
                if (uVar3 == 0x4480) goto LAB_0013b56e;
              }
            }
            else if (uVar3 < 0x7580) {
              if (uVar3 < 0x7300) {
                if (uVar3 < 0x7180) {
                  if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
                  if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
                }
                else {
                  if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
                  if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
                  if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
                }
              }
              else if (uVar3 < 0x7400) {
                if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
                if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
              }
              else {
                if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
                if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
                if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
              }
            }
            else {
              if (0x77ff < uVar3) {
                if (uVar3 < 0x7980) {
                  if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
                  if (uVar3 != 0x7880) {
                    if (uVar3 != 0x7900) break;
                    goto switchD_0013b8fc_caseD_24;
                  }
                  goto switchD_0013b8fc_caseD_23;
                }
                if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
                if (uVar3 != 0x7a00) {
                  if (uVar3 != 0x7a80) break;
                  goto switchD_0013b8fc_caseD_27;
                }
                goto switchD_0013b8fc_caseD_26;
              }
              if (uVar3 < 0x7680) {
                if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
                if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
              }
              else {
                if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
                if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
                if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
              }
            }
            break;
          case 4:
            goto switchD_0013806b_caseD_4;
          case 5:
            goto switchD_0013806b_caseD_5;
          case 6:
            goto switchD_0013806b_caseD_6;
          default:
            goto switchD_0013806b_default;
          }
          goto LAB_0013c334;
        }
        if (uVar3 < 0x5080) {
          if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
          if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
          if (uVar3 != 0x3f80) goto LAB_001396fb;
LAB_001378e5:
          snprintf(buf,buflen,"PK - Memory allocation failed");
          switch(uVar3 - 0x3c80 >> 7) {
          case 0:
            goto switchD_0013806b_caseD_6;
          case 1:
            goto switchD_0013791b_caseD_1;
          case 2:
            goto switchD_0013791b_caseD_2;
          case 3:
            goto switchD_0013791b_caseD_3;
          case 4:
            goto switchD_0013791b_caseD_4;
          case 5:
            goto switchD_0013791b_caseD_5;
          default:
            goto switchD_0013791b_default;
          }
        }
        if (0x517f < uVar3) {
          if (uVar3 == 0x5180) goto LAB_00136dd7;
          if (uVar3 == 0x5200) goto LAB_00136e5d;
          goto LAB_001396fb;
        }
        if (uVar3 == 0x5080) goto switchD_0013613d_caseD_9;
        if (uVar3 != 0x5100) goto LAB_001396fb;
switchD_0013613d_caseD_a:
        snprintf(buf,buflen,"MD - Bad input parameters to function");
switchD_0013613d_caseD_4:
        if (uVar3 < 0x3900) {
          if (uVar3 < 0x1480) {
            if (uVar3 < 0x1280) {
              if (uVar3 < 0x1180) {
                if (uVar3 == 0x1080) goto switchD_00136e93_caseD_0;
                if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
              }
              else {
                if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
                if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
              }
            }
            else if (uVar3 < 0x1380) {
              if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
              if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
            }
            else {
              if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
              if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
            }
          }
          else if (uVar3 < 0x1f80) {
            if (uVar3 < 0x1e80) {
              if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
              if (uVar3 == 0x1e00) goto LAB_00139dde;
            }
            else {
              if (uVar3 == 0x1e80) goto LAB_00139d95;
              if (uVar3 == 0x1f00) goto LAB_00138927;
            }
          }
          else if (uVar3 < 0x2f00) {
            if (uVar3 == 0x1f80) goto LAB_00138a11;
            if (uVar3 == 0x2e80) goto LAB_00139f71;
          }
          else {
            if (uVar3 == 0x2f00) goto LAB_00139eae;
            if (uVar3 == 0x2f80) goto LAB_00139e66;
          }
        }
        else if (uVar3 < 0x3d00) {
          if (uVar3 < 0x3b00) {
            if (uVar3 < 0x3a00) {
              if (uVar3 == 0x3900) goto LAB_001388df;
              if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
            }
            else {
              if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
              if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            }
          }
          else if (uVar3 < 0x3c00) {
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
          }
          else {
            if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
          }
        }
        else if (uVar3 < 0x3f00) {
          if (uVar3 < 0x3e00) {
            if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
            if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
          }
          else {
            if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
            if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
          }
        }
        else if (uVar3 < 0x5180) {
          if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
          if (uVar3 == 0x3f80) goto LAB_001378e5;
        }
        else {
          if (uVar3 == 0x5200) goto LAB_00136e5d;
          if (uVar3 == 0x5180) goto LAB_00136dd7;
        }
LAB_00139f85:
        if (uVar3 < 0x7580) {
          if (uVar3 < 0x6f80) {
            if (uVar3 < 0x4280) {
              if (uVar3 < 0x4100) {
                if (uVar3 == 0x2e00) goto LAB_0013a409;
                if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
              }
              else {
                if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
                if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
                if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
              }
            }
            else if (uVar3 < 0x4380) {
              if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
            }
            else {
              if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
              if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
              if (uVar3 == 0x4480) goto LAB_0013b56e;
            }
          }
          else if (uVar3 < 0x7280) {
            if (uVar3 < 0x7100) {
              if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
              if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            }
            else {
              if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
              if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
              if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
            }
          }
          else if (uVar3 < 0x7400) {
            if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
            if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
            if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
          }
          else {
            if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
            if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
            if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
          }
        }
        else if (uVar3 < 0x7a80) {
          if (uVar3 < 0x7800) {
            if (uVar3 < 0x7680) {
              if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
            }
            else {
              if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
              if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
            }
          }
          else if (uVar3 < 0x7900) {
            if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
            if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
          }
          else {
            if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
            if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
            if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          }
        }
        else if (uVar3 < 32000) {
          if (uVar3 < 0x7b80) {
            if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
            if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
          }
          else {
            if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
            if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
            if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
          }
        }
        else {
          if (0x7e7f < uVar3) {
            if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
            if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
            if (uVar3 != 0x7f80) goto LAB_0013dde7;
            goto switchD_0013b8fc_caseD_31;
          }
          if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
          if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
          if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
        }
LAB_0013dde7:
        if (uVar3 < 0x6600) {
          if (0x24ff < uVar3) {
            if (0x277f < uVar3) {
              if (uVar3 < 0x2880) goto LAB_0013ea1e;
              goto LAB_0013e9bd;
            }
            if (uVar3 < 0x2600) goto LAB_0013e9e9;
            goto LAB_0013e8d6;
          }
LAB_0013de18:
          if (uVar3 < 0x2280) goto LAB_0013e35d;
          if (uVar3 < 0x2380) goto LAB_0013e84c;
LAB_0013e813:
          if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
LAB_0013e820:
          if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
          if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
        }
        else {
          if (0x6a7f < uVar3) {
            if (0x6cff < uVar3) {
              if (uVar3 < 0x6e00) {
                if (uVar3 == 0x6d00) {
switchD_0013b8fc_caseD_c:
                  snprintf(buf,buflen,
                           "SSL - Public key type mismatch (eg, asked for RSA key exchange and presented EC key)"
                          );
                  goto LAB_0013e2d3;
                }
                if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
              }
              else {
                if (uVar3 == 0x6e00) {
switchD_0013b8fc_caseD_e:
                  snprintf(buf,buflen,
                           "SSL - Processing of the NewSessionTicket handshake message failed");
                  switch(uVar3 - 0x6c00 >> 7) {
                  case 0:
                    goto switchD_0013b8fc_caseD_a;
                  case 1:
                    goto switchD_0013b8fc_caseD_b;
                  case 2:
                    goto switchD_0013b8fc_caseD_c;
                  case 3:
                    goto switchD_0013b8fc_caseD_d;
                  default:
                    goto switchD_0013e285_default;
                  }
                }
                if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
                if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
              }
              goto switchD_0013ee65_default;
            }
            goto LAB_0013e2f6;
          }
          if (uVar3 < 0x6800) goto LAB_0013e4ac;
          if (0x68ff < uVar3) {
            if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
            goto LAB_0013e5b0;
          }
LAB_0013e772:
          if (uVar3 == 0x6800) {
switchD_0013b8fc_caseD_2:
            snprintf(buf,buflen,"SSL - The operation timed out");
switchD_0013b88c_caseD_10:
            if (uVar3 < 0x2600) goto LAB_0013e965;
            if (0x28ff < uVar3) {
              if (0x667f < uVar3) goto LAB_0013e921;
LAB_0013ec38:
              if (uVar3 != 0x2900) goto LAB_0013ec45;
              goto switchD_0013ee65_caseD_d;
            }
            if (0x277f < uVar3) {
              if (uVar3 != 0x2780) goto LAB_0013eca4;
              goto switchD_0013ee65_caseD_a;
            }
LAB_0013e8d6:
            if (uVar3 == 0x2600) goto switchD_0013ee65_caseD_7;
            goto LAB_0013e8e3;
          }
          if (uVar3 != 0x6880) goto switchD_0013ee65_default;
switchD_0013e653_caseD_0:
          snprintf(buf,buflen,"SSL - Connection requires a write call");
switchD_0013e653_default:
          if (uVar3 < 0x2680) goto LAB_0013e7a9;
          if (0x297f < uVar3) {
            if (0x66ff < uVar3) {
              if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
              goto LAB_0013e885;
            }
LAB_0013ead5:
            if (uVar3 != 0x2980) goto LAB_0013eae2;
            goto switchD_0013ee65_caseD_e;
          }
LAB_0013e7f4:
          if (0x27ff < uVar3) goto LAB_0013eab6;
LAB_0013ebc5:
          if (uVar3 == 0x2680) goto switchD_0013ee65_caseD_8;
LAB_0013ebd2:
          if (uVar3 == 0x2700) goto switchD_0013ee65_caseD_9;
          if (uVar3 == 0x2780) goto switchD_0013ee65_caseD_a;
        }
      }
      else {
        if (uVar3 < 0x5100) {
          if (uVar3 == 0x4f80) {
switchD_00136000_caseD_6:
            snprintf(buf,buflen,"ECP - Bad input parameters to function");
            switch(uVar3 - 0x4c00 >> 7) {
            case 0:
              goto switchD_0013613d_caseD_0;
            case 1:
              goto switchD_00136000_caseD_0;
            case 2:
              goto switchD_00136000_caseD_1;
            case 3:
              goto switchD_00136000_caseD_2;
            case 4:
              goto switchD_00136000_caseD_3;
            case 5:
              goto switchD_00136000_caseD_4;
            case 6:
              goto switchD_00136000_caseD_5;
            default:
              goto switchD_00136095_default;
            }
          }
          if (uVar3 != 0x5080) goto LAB_0013a94b;
switchD_0013613d_caseD_9:
          snprintf(buf,buflen,"MD - The selected feature is not available");
switchD_00136105_caseD_5:
          if (uVar3 < 0x3b00) {
            if (uVar3 < 0x1e80) {
              if (uVar3 < 0x1300) {
                if (uVar3 < 0x1180) {
                  if (uVar3 == 0x1080) goto switchD_00136e93_caseD_0;
                  if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
                }
                else {
                  if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
                  if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
                  if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
                }
              }
              else if (uVar3 < 0x1400) {
                if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
                if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
              }
              else {
                if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
                if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
                if (uVar3 == 0x1e00) goto LAB_00139dde;
              }
            }
            else if (uVar3 < 0x2f00) {
              if (uVar3 < 0x1f80) {
                if (uVar3 == 0x1e80) goto LAB_00139d95;
                if (uVar3 == 0x1f00) goto LAB_00138927;
              }
              else {
                if (uVar3 == 0x1f80) goto LAB_00138a11;
                if (uVar3 == 0x2e00) goto LAB_0013a409;
                if (uVar3 == 0x2e80) goto LAB_00139f71;
              }
            }
            else if (uVar3 < 0x3980) {
              if (uVar3 == 0x2f00) goto LAB_00139eae;
              if (uVar3 == 0x2f80) goto LAB_00139e66;
              if (uVar3 == 0x3900) goto LAB_001388df;
            }
            else {
              if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
              if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
              if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            }
            goto switchD_0013a935_default;
          }
          if (0x407f < uVar3) {
            if (uVar3 < 0x4300) {
              if (uVar3 < 0x4180) {
                if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
                if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
              }
              else {
                if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
                if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
                if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
              }
              goto switchD_0013a935_default;
            }
            if (0x50ff < uVar3) {
              if (uVar3 == 0x5200) goto LAB_00136e5d;
              if (uVar3 == 0x5180) goto LAB_00136dd7;
              if (uVar3 == 0x5100) goto switchD_0013613d_caseD_a;
              goto switchD_0013a935_default;
            }
            if (uVar3 != 0x4300) {
              if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
              if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
              goto switchD_0013a935_default;
            }
            goto switchD_0013a935_caseD_2;
          }
          if (uVar3 < 0x3d80) {
            if (0x3bff < uVar3) {
              if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
              if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
              if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
              goto switchD_0013a935_default;
            }
            if (uVar3 != 0x3b00) {
              if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
              goto switchD_0013a935_default;
            }
            goto switchD_0013806b_caseD_3;
          }
          if (uVar3 < 16000) {
            if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
            if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
          }
          else {
            if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
            if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
            if (uVar3 == 0x3f80) goto LAB_001378e5;
          }
switchD_0013a935_default:
          if (uVar3 < 0x7800) {
            if (uVar3 < 0x7400) {
              if (uVar3 < 0x7200) {
                if (uVar3 < 0x7100) goto LAB_0013b557;
                if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
                if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
              }
              else {
                if (0x72ff < uVar3) goto LAB_0013b759;
                if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
                if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
              }
            }
            else if (uVar3 < 0x7600) {
              if (uVar3 < 0x7500) {
                if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
                if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
              }
              else {
                if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
                if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
              }
            }
            else {
              if (0x76ff < uVar3) goto LAB_0013b73a;
              if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
              if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
            }
          }
          else if (uVar3 < 0x7c00) {
            if (uVar3 < 0x7a00) {
              if (uVar3 < 0x7900) goto LAB_0013b601;
              if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
              if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
            }
            else if (uVar3 < 0x7b00) {
              if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
              if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
            }
            else {
              if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
              if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
            }
          }
          else {
            if (0x7dff < uVar3) {
              if (0x7eff < uVar3) goto LAB_0013b778;
              if (uVar3 != 0x7e00) {
                if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
                goto LAB_0013d9f3;
              }
              goto switchD_0013b8fc_caseD_2e;
            }
            if (uVar3 < 32000) goto LAB_0013b673;
            if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
            if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
          }
          goto LAB_0013d9f3;
        }
        if (uVar3 == 0x5100) goto switchD_0013613d_caseD_a;
        if (uVar3 != 0x5180) goto LAB_0013a94b;
LAB_00136dd7:
        snprintf(buf,buflen,"MD - Failed to allocate memory");
        if (0x12ff < uVar3) {
          if (0x13ff < uVar3) {
            if (uVar3 != 0x1400) {
              if (uVar3 == 0x1480) {
switchD_00136e93_caseD_8:
                snprintf(buf,buflen,"PEM - Bad input parameters to function");
              }
              else if (uVar3 == 0x5200) {
LAB_00136e5d:
                snprintf(buf,buflen,"MD - Opening or reading of file failed");
                switch(uVar3 - 0x1080 >> 7) {
                case 0:
                  goto switchD_00136e93_caseD_0;
                case 1:
                  goto switchD_00136e93_caseD_1;
                case 2:
                  goto switchD_00136e93_caseD_2;
                case 3:
                  goto switchD_00136e93_caseD_3;
                case 4:
                  goto switchD_00136e93_caseD_4;
                case 5:
                  goto switchD_00136e93_caseD_5;
                case 6:
                  goto switchD_00136e93_caseD_6;
                case 7:
                  goto switchD_00136e93_caseD_7;
                case 8:
                  goto switchD_00136e93_caseD_8;
                }
              }
              goto switchD_00136e93_default;
            }
switchD_00136e93_caseD_7:
            snprintf(buf,buflen,"PEM - Unavailable feature, e.g. hashing/encryption combination");
            if (uVar3 < 16000) {
              if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
              if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
              if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
            }
            else {
              if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
              if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
              if (uVar3 == 0x3f80) goto LAB_001378e5;
            }
            goto LAB_00137fa4;
          }
          if (uVar3 != 0x1300) {
            if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
            goto switchD_00136e93_default;
          }
switchD_00136e93_caseD_5:
          snprintf(buf,buflen,"PEM - Private key password can\'t be empty");
          if (uVar3 < 0x3e00) {
            if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
            if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
            if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
          }
          else if (uVar3 < 0x3f00) {
            if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
            if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
          }
          else {
            if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
            if (uVar3 == 0x3f80) goto LAB_001378e5;
          }
LAB_00137f35:
          if (0x41ff < uVar3) {
            if (uVar3 < 0x7280) {
              if (uVar3 < 0x4480) {
                if (uVar3 < 0x4300) {
                  if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
                  if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
                }
                else {
                  if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
                  if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
                  if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
                }
              }
              else if (uVar3 < 0x7100) {
                if (uVar3 == 0x4480) goto LAB_0013b56e;
                if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
              }
              else {
                if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
                if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
                if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
              }
              goto LAB_0013bad8;
            }
            if (uVar3 < 0x7500) {
              if (uVar3 < 0x7380) {
                if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
                if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
              }
              else {
                if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
                if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
                if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
              }
              goto LAB_0013bad8;
            }
            if (uVar3 < 0x7680) {
              if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
              if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
              if (uVar3 != 0x7600) goto LAB_0013bad8;
              goto switchD_0013b8fc_caseD_1e;
            }
            if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
            if (uVar3 != 0x7700) {
              if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
              goto LAB_0013bad8;
            }
            goto switchD_0013b8fc_caseD_20;
          }
          if (uVar3 < 0x3a00) {
            if (uVar3 < 0x2e80) {
              if (uVar3 < 0x1f00) {
                if (uVar3 == 0x1e00) goto LAB_00139dde;
                if (uVar3 == 0x1e80) goto LAB_00139d95;
              }
              else {
                if (uVar3 == 0x1f00) goto LAB_00138927;
                if (uVar3 == 0x1f80) goto LAB_00138a11;
                if (uVar3 == 0x2e00) goto LAB_0013a409;
              }
            }
            else if (uVar3 < 0x2f80) {
              if (uVar3 == 0x2e80) goto LAB_00139f71;
              if (uVar3 == 0x2f00) goto LAB_00139eae;
            }
            else {
              if (uVar3 == 0x2f80) goto LAB_00139e66;
              if (uVar3 == 0x3900) goto LAB_001388df;
              if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
            }
          }
          else if (uVar3 < 0x3c80) {
            if (uVar3 < 0x3b00) {
              if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
              if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            }
            else {
              if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
              if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
              if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            }
          }
          else if (uVar3 < 0x4080) {
            if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
            if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
            if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
          }
          else {
            if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
            if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
            if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
          }
          goto LAB_0013bad8;
        }
        if (0x117f < uVar3) {
          if (uVar3 != 0x1180) {
            if (uVar3 == 0x1200) {
switchD_00136e93_caseD_3:
              snprintf(buf,buflen,"PEM - RSA IV is not in hex-format");
              if (0x147f < uVar3) goto LAB_00137318;
              if (0x137f < uVar3) goto LAB_00137368;
              if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
              if (uVar3 != 0x1300) goto LAB_00137d38;
              goto switchD_00136e93_caseD_5;
            }
            if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
            goto switchD_00136e93_default;
          }
switchD_00136e93_caseD_2:
          snprintf(buf,buflen,"PEM - Failed to allocate memory");
          if (uVar3 < 0x1400) {
            if (uVar3 < 0x1300) {
              if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
              if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
            }
            else {
              if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
              if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
            }
          }
          else if (uVar3 < 0x3f00) {
            if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
            if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
          }
          else {
LAB_001372a2:
            if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
            if (uVar3 == 0x3f80) goto LAB_001378e5;
          }
          goto LAB_00137931;
        }
        if (uVar3 == 0x1080) {
switchD_00136e93_caseD_0:
          snprintf(buf,buflen,"PEM - No PEM header or footer found");
          goto LAB_00136efe;
        }
        if (uVar3 == 0x1100) goto switchD_00136e93_caseD_1;
switchD_00136e93_default:
        if (uVar3 < 0x3d00) {
          if (uVar3 < 0x3900) {
            if (uVar3 < 0x2e00) {
              if (uVar3 < 0x1f00) {
                if (uVar3 == 0x1e00) goto LAB_00139dde;
                if (uVar3 == 0x1e80) goto LAB_00139d95;
              }
              else {
                if (uVar3 == 0x1f00) goto LAB_00138927;
                if (uVar3 == 0x1f80) goto LAB_00138a11;
              }
            }
            else if (uVar3 < 0x2f00) {
              if (uVar3 == 0x2e00) goto LAB_0013a409;
              if (uVar3 == 0x2e80) goto LAB_00139f71;
            }
            else {
              if (uVar3 == 0x2f00) goto LAB_00139eae;
              if (uVar3 == 0x2f80) goto LAB_00139e66;
            }
          }
          else if (uVar3 < 0x3b00) {
            if (uVar3 < 0x3a00) {
              if (uVar3 == 0x3900) goto LAB_001388df;
              if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
            }
            else {
              if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
              if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            }
          }
          else if (uVar3 < 0x3c00) {
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
          }
          else {
            if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
          }
        }
        else if (uVar3 < 0x4180) {
          if (uVar3 < 0x3f00) {
            if (uVar3 < 0x3e00) {
              if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
              if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
            }
            else {
              if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
              if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
            }
          }
          else if (uVar3 < 0x4080) {
            if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
            if (uVar3 == 0x3f80) goto LAB_001378e5;
          }
          else {
            if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
            if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
          }
        }
        else if (uVar3 < 0x4380) {
          if (uVar3 < 0x4280) {
            if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
          }
          else {
            if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
            if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
          }
        }
        else if (uVar3 < 0x4480) {
          if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
          if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
        }
        else {
          if (uVar3 == 0x4480) goto LAB_0013b56e;
          if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
        }
LAB_0013b5ba:
        switch(uVar3 - 0x6a00 >> 7) {
        case 0:
          goto switchD_0013e653_caseD_3;
        case 1:
          goto switchD_0013e61b_caseD_3;
        case 2:
          goto switchD_0013b8fc_caseD_8;
        case 3:
          goto switchD_0013b8fc_caseD_9;
        case 4:
          goto switchD_0013b8fc_caseD_a;
        case 5:
          goto switchD_0013b8fc_caseD_b;
        case 6:
          goto switchD_0013b8fc_caseD_c;
        case 7:
          goto switchD_0013b8fc_caseD_d;
        case 8:
          goto switchD_0013b8fc_caseD_e;
        case 9:
          goto switchD_0013b8fc_caseD_f;
        case 10:
          goto switchD_0013b8fc_caseD_10;
        case 0xb:
          goto switchD_0013b8fc_caseD_11;
        case 0xe:
          goto switchD_0013b5dc_caseD_e;
        case 0xf:
switchD_0013b5dc_caseD_f:
          snprintf(buf,buflen,"SSL - Verification of the message MAC failed");
          goto LAB_0013b7fa;
        case 0x10:
          goto switchD_0013b81c_caseD_0;
        case 0x11:
          goto switchD_0013b854_caseD_14;
        case 0x12:
          goto switchD_0013b88c_caseD_16;
        case 0x13:
          goto switchD_0013b8c4_caseD_18;
        case 0x14:
          goto switchD_0013b8fc_caseD_1a;
        case 0x15:
          goto switchD_0013b8fc_caseD_1b;
        case 0x16:
          goto switchD_0013b8fc_caseD_1c;
        case 0x17:
          goto switchD_0013b8fc_caseD_1d;
        case 0x18:
          goto switchD_0013b8fc_caseD_1e;
        case 0x19:
          goto switchD_0013b8fc_caseD_1f;
        case 0x1a:
          goto switchD_0013b8fc_caseD_20;
        case 0x1b:
          goto switchD_0013b8fc_caseD_21;
        case 0x1c:
          goto switchD_0013b8fc_caseD_22;
        case 0x1d:
          goto switchD_0013b8fc_caseD_23;
        case 0x1e:
          goto switchD_0013b8fc_caseD_24;
        case 0x1f:
          goto switchD_0013b8fc_caseD_25;
        case 0x20:
          goto switchD_0013b8fc_caseD_26;
        case 0x21:
          goto switchD_0013b8fc_caseD_27;
        case 0x22:
          goto switchD_0013b8fc_caseD_28;
        case 0x23:
          goto switchD_0013b8fc_caseD_29;
        case 0x24:
          goto switchD_0013b8fc_caseD_2a;
        case 0x25:
          goto switchD_0013b8fc_caseD_2b;
        case 0x26:
          goto switchD_0013b8fc_caseD_2c;
        case 0x27:
          goto switchD_0013b8fc_caseD_2d;
        case 0x28:
          goto switchD_0013b8fc_caseD_2e;
        case 0x29:
          goto switchD_0013b8fc_caseD_2f;
        case 0x2a:
          goto switchD_0013b8fc_caseD_30;
        case 0x2b:
          goto switchD_0013b8fc_caseD_31;
        }
switchD_0013b5dc_caseD_c:
        if (uVar3 < 0x2700) {
          if (0x237f < uVar3) {
            if (uVar3 < 0x2500) goto LAB_0013e813;
LAB_0013e6b4:
            if (0x25ff < uVar3) goto LAB_0013ea3d;
            goto LAB_0013e9e9;
          }
LAB_0013e7b2:
          if (uVar3 < 0x2200) {
LAB_0013e7bf:
            if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
            if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
            if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
          }
          else {
            if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
LAB_0013e84c:
            if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
            if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
          }
        }
        else if (uVar3 < 0x6680) {
          if (0x287f < uVar3) goto LAB_0013e688;
LAB_0013ea11:
          if (uVar3 == 0x2700) goto switchD_0013ee65_caseD_9;
LAB_0013ea1e:
          if (uVar3 == 0x2780) goto switchD_0013ee65_caseD_a;
          if (uVar3 == 0x2800) goto switchD_0013ee65_caseD_b;
        }
        else {
          if (0x67ff < uVar3) {
LAB_0013e6d3:
            if (0x68ff < uVar3) {
LAB_0013e6e0:
              if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
              if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
              goto switchD_0013ee65_default;
            }
            goto LAB_0013e772;
          }
LAB_0013e921:
          if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
LAB_0013e92e:
          if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
          if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
        }
      }
    }
    else if (uVar3 < 0x6200) {
      if (0x60ff < uVar3) {
        if (uVar3 != 0x6100) {
          if (uVar3 != 0x6180) goto LAB_0013a94b;
          snprintf(buf,buflen,"CIPHER - Failed to allocate memory");
          goto LAB_00137480;
        }
        snprintf(buf,buflen,"CIPHER - Bad input parameters to function");
switchD_0013791b_default:
        if (uVar3 < 0x4100) {
          if (uVar3 < 0x3900) {
            if (uVar3 < 0x2e00) {
              if (uVar3 < 0x1f00) {
                if (uVar3 == 0x1e00) goto LAB_00139dde;
                if (uVar3 == 0x1e80) goto LAB_00139d95;
              }
              else {
                if (uVar3 == 0x1f00) goto LAB_00138927;
                if (uVar3 == 0x1f80) goto LAB_00138a11;
              }
            }
            else if (uVar3 < 0x2f00) {
              if (uVar3 == 0x2e00) goto LAB_0013a409;
              if (uVar3 == 0x2e80) goto LAB_00139f71;
            }
            else {
              if (uVar3 == 0x2f00) goto LAB_00139eae;
              if (uVar3 == 0x2f80) goto LAB_00139e66;
            }
          }
          else if (uVar3 < 0x3b00) {
            if (uVar3 < 0x3a00) {
              if (uVar3 == 0x3900) goto LAB_001388df;
              if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
            }
            else {
              if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
              if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            }
          }
          else if (uVar3 < 0x3c00) {
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
          }
          else {
            if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
          }
        }
        else if (uVar3 < 0x7080) {
          if (uVar3 < 0x4300) {
            if (uVar3 < 0x4200) {
              if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
              if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            }
            else {
              if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
              if (uVar3 == 0x4280) goto switchD_0013a935_caseD_1;
            }
          }
          else if (uVar3 < 0x4400) {
            if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
            if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
          }
          else {
            if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
            if (uVar3 == 0x4480) goto LAB_0013b56e;
          }
        }
        else {
          if (0x727f < uVar3) {
            if (uVar3 < 0x7380) {
              if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
              if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
              goto LAB_0013b912;
            }
            if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
            if (uVar3 != 0x7400) goto LAB_0013b912;
            goto switchD_0013b8fc_caseD_1a;
          }
          if (uVar3 < 0x7180) {
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
            if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
          }
          else {
            if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
            if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
          }
        }
        goto LAB_0013b912;
      }
      if (uVar3 == 0x5200) goto LAB_00136e5d;
      if (uVar3 != 0x6080) goto LAB_0013a94b;
      snprintf(buf,buflen,"CIPHER - The selected feature is not available");
LAB_0013b18e:
      if (uVar3 < 0x7580) {
        if (uVar3 < 0x6f80) {
          if (uVar3 < 0x6d00) {
            if (0x447f < uVar3) {
              if (uVar3 == 0x4480) goto LAB_0013b56e;
              if (uVar3 != 0x6c00) {
                if (uVar3 != 0x6c80) goto switchD_0013e285_default;
                goto switchD_0013b8fc_caseD_b;
              }
              goto switchD_0013b8fc_caseD_a;
            }
            if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
            if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
          }
          else if (uVar3 < 0x6e00) {
            if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
            if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
          }
          else {
            if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
            if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
            if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
          }
        }
        else if (uVar3 < 0x7280) {
          if (uVar3 < 0x7100) {
            if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
            if (uVar3 == 0x7080) goto switchD_0013b5a4_caseD_0;
          }
          else {
            if (uVar3 == 0x7100) goto switchD_0013b5dc_caseD_e;
            if (uVar3 == 0x7180) goto switchD_0013b5dc_caseD_f;
            if (uVar3 == 0x7200) goto switchD_0013b81c_caseD_0;
          }
        }
        else if (uVar3 < 0x7400) {
          if (uVar3 == 0x7280) goto switchD_0013b854_caseD_14;
          if (uVar3 == 0x7300) goto switchD_0013b88c_caseD_16;
          if (uVar3 == 0x7380) goto switchD_0013b8c4_caseD_18;
        }
        else {
          if (uVar3 == 0x7400) goto switchD_0013b8fc_caseD_1a;
          if (uVar3 == 0x7480) goto switchD_0013b8fc_caseD_1b;
          if (uVar3 == 0x7500) goto switchD_0013b8fc_caseD_1c;
        }
      }
      else if (uVar3 < 0x7a80) {
        if (uVar3 < 0x7800) {
          if (uVar3 < 0x7680) {
            if (uVar3 == 0x7580) goto switchD_0013b8fc_caseD_1d;
            if (uVar3 == 0x7600) goto switchD_0013b8fc_caseD_1e;
          }
          else {
            if (uVar3 == 0x7680) goto switchD_0013b8fc_caseD_1f;
            if (uVar3 == 0x7700) goto switchD_0013b8fc_caseD_20;
            if (uVar3 == 0x7780) goto switchD_0013b8fc_caseD_21;
          }
        }
        else if (uVar3 < 0x7900) {
          if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
          if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
        }
        else {
          if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
          if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
          if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
        }
      }
      else if (uVar3 < 32000) {
        if (uVar3 < 0x7b80) {
          if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
          if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
        }
        else {
          if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
          if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
          if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
        }
      }
      else if (uVar3 < 0x7e80) {
        if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
        if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
        if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
      }
      else {
        if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
        if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
        if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
      }
switchD_0013e285_default:
      if (uVar3 < 0x2800) {
LAB_0013e4f5:
        if (0x23ff < uVar3) {
          if (uVar3 < 0x2600) {
            if (0x24ff < uVar3) goto LAB_0013e9e9;
            goto LAB_0013e820;
          }
          if (uVar3 < 0x2700) goto LAB_0013ea3d;
          goto LAB_0013ebd2;
        }
        if (uVar3 < 0x2200) goto LAB_0013e7bf;
        if (uVar3 < 0x2300) goto LAB_0013eb3c;
LAB_0013ec10:
        if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
        if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
      }
      else {
        if (0x67ff < uVar3) {
          if (uVar3 < 0x6a00) goto LAB_0013e6d3;
          if (uVar3 < 0x6b00) {
LAB_0013e48d:
            if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
            if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
          }
          else {
LAB_0013e4be:
            if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
            if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
          }
          goto switchD_0013ee65_default;
        }
        if (0x65ff < uVar3) {
LAB_0013e4ac:
          if (0x66ff < uVar3) goto LAB_0013e92e;
LAB_0013eae2:
          if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
          if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
          goto switchD_0013ee65_default;
        }
        if (0x28ff < uVar3) goto LAB_0013e9ca;
LAB_0013eca4:
        if (uVar3 == 0x2800) goto switchD_0013ee65_caseD_b;
LAB_0013f0f5:
        if (uVar3 == 0x2880) goto switchD_0013ee65_caseD_c;
      }
    }
    else {
      if (0x62ff < uVar3) {
        if (uVar3 != 0x6300) {
          if (uVar3 != 0x6380) goto LAB_0013a94b;
          snprintf(buf,buflen,"CIPHER - The context is invalid, eg because it was free()ed");
          goto LAB_00135f9d;
        }
        snprintf(buf,buflen,"CIPHER - Authentication failed (for AEAD modes)");
        goto switchD_00136095_default;
      }
      if (uVar3 != 0x6200) {
        if (uVar3 != 0x6280) goto LAB_0013a94b;
        snprintf(buf,buflen,"CIPHER - Decryption of block requires a full block");
        goto switchD_0013613d_caseD_4;
      }
      snprintf(buf,buflen,"CIPHER - Input data contains invalid padding and is rejected");
LAB_00136efe:
      if (uVar3 < 0x3b80) {
        if (uVar3 < 0x1f00) {
          if (uVar3 < 0x1380) {
            if (uVar3 < 0x1200) {
              if (uVar3 == 0x1100) {
switchD_00136e93_caseD_1:
                snprintf(buf,buflen,"PEM - PEM string is not as expected");
                if (uVar3 < 0x1380) {
                  if (uVar3 < 0x1280) {
                    if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
                    if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
                  }
                  else {
                    if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
                    if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
                  }
                }
                else {
                  if (0x147f < uVar3) {
                    if (uVar3 != 0x1480) goto LAB_001372a2;
                    goto switchD_00136e93_caseD_8;
                  }
                  if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
                  if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
                }
                goto LAB_00137931;
              }
              if (uVar3 == 0x1180) goto switchD_00136e93_caseD_2;
            }
            else {
              if (uVar3 == 0x1200) goto switchD_00136e93_caseD_3;
              if (uVar3 == 0x1280) goto switchD_00136e93_caseD_4;
              if (uVar3 == 0x1300) goto switchD_00136e93_caseD_5;
            }
          }
          else if (uVar3 < 0x1480) {
            if (uVar3 == 0x1380) goto switchD_00136e93_caseD_6;
            if (uVar3 == 0x1400) goto switchD_00136e93_caseD_7;
          }
          else {
            if (uVar3 == 0x1480) goto switchD_00136e93_caseD_8;
LAB_0013795d:
            if (uVar3 == 0x1e00) goto LAB_00139dde;
            if (uVar3 == 0x1e80) goto LAB_00139d95;
          }
        }
        else if (uVar3 < 0x2f80) {
          if (0x2dff < uVar3) {
            if (uVar3 == 0x2e00) goto LAB_0013a409;
            if (uVar3 == 0x2e80) goto LAB_00139f71;
            if (uVar3 == 0x2f00) goto LAB_00139eae;
            goto LAB_0013b7fa;
          }
LAB_00137b57:
          if (uVar3 == 0x1f00) goto LAB_00138927;
          if (uVar3 == 0x1f80) goto LAB_00138a11;
        }
        else {
          if (0x39ff < uVar3) {
            if (uVar3 == 0x3a00) goto switchD_0013806b_caseD_1;
            if (uVar3 == 0x3a80) goto switchD_0013806b_caseD_2;
            if (uVar3 == 0x3b00) goto switchD_0013806b_caseD_3;
            goto LAB_0013b7fa;
          }
          if (uVar3 == 0x2f80) goto LAB_00139e66;
LAB_001379d8:
          if (uVar3 == 0x3900) goto LAB_001388df;
          if (uVar3 == 0x3980) goto switchD_0013806b_caseD_0;
        }
      }
      else if (uVar3 < 0x4100) {
        if (uVar3 < 0x3e00) {
          if (uVar3 < 0x3c80) {
            if (uVar3 == 0x3b80) goto switchD_0013806b_caseD_4;
            if (uVar3 == 0x3c00) goto switchD_0013806b_caseD_5;
            goto LAB_0013b7fa;
          }
          if (uVar3 == 0x3c80) goto switchD_0013806b_caseD_6;
LAB_0013799f:
          if (uVar3 == 0x3d00) goto switchD_0013791b_caseD_1;
          if (uVar3 == 0x3d80) goto switchD_0013791b_caseD_2;
        }
        else {
          if (0x3eff < uVar3) {
            if (uVar3 == 0x3f00) goto switchD_0013791b_caseD_5;
            if (uVar3 == 0x3f80) goto LAB_001378e5;
            if (uVar3 == 0x4080) goto switchD_0013a43f_caseD_0;
            goto LAB_0013b7fa;
          }
LAB_00137b38:
          if (uVar3 == 0x3e00) goto switchD_0013791b_caseD_3;
          if (uVar3 == 16000) goto switchD_0013791b_caseD_4;
        }
      }
      else {
        if (uVar3 < 0x4380) {
          if (uVar3 < 0x4200) {
            if (uVar3 == 0x4100) goto switchD_0013a43f_caseD_1;
            if (uVar3 == 0x4180) goto switchD_0013a43f_caseD_2;
            goto LAB_0013b7fa;
          }
          if (uVar3 == 0x4200) goto switchD_0013a935_caseD_0;
LAB_00137a11:
          if (uVar3 != 0x4280) {
            if (uVar3 == 0x4300) goto switchD_0013a935_caseD_2;
            goto LAB_0013b7fa;
          }
          goto switchD_0013a935_caseD_1;
        }
        if (0x707f < uVar3) goto LAB_0013b4cc;
        if (uVar3 == 0x4380) goto switchD_0013a935_caseD_3;
LAB_0013b4f8:
        if (uVar3 == 0x4400) goto switchD_0013a935_caseD_4;
        if (uVar3 == 0x4480) goto LAB_0013b56e;
      }
LAB_0013b7fa:
      switch(uVar3 - 0x7200 >> 7) {
      case 0:
switchD_0013b81c_caseD_0:
        snprintf(buf,buflen,"SSL - An invalid SSL record was received");
LAB_0013b832:
        switch(uVar3 - 0x6880 >> 7) {
        case 0:
          goto switchD_0013e653_caseD_0;
        case 1:
          goto switchD_0013e653_caseD_1;
        case 2:
          goto switchD_0013e653_caseD_2;
        case 3:
          goto switchD_0013e653_caseD_3;
        case 4:
          goto switchD_0013e61b_caseD_3;
        case 5:
          goto switchD_0013b8fc_caseD_8;
        case 6:
          goto switchD_0013b8fc_caseD_9;
        case 7:
          goto switchD_0013b8fc_caseD_a;
        case 8:
          goto switchD_0013b8fc_caseD_b;
        case 9:
          goto switchD_0013b8fc_caseD_c;
        case 10:
          goto switchD_0013b8fc_caseD_d;
        case 0xb:
          goto switchD_0013b8fc_caseD_e;
        case 0xc:
          goto switchD_0013b8fc_caseD_f;
        case 0xd:
          goto switchD_0013b8fc_caseD_10;
        case 0xe:
          goto switchD_0013b8fc_caseD_11;
        case 0x14:
          goto switchD_0013b854_caseD_14;
        case 0x15:
          goto switchD_0013b88c_caseD_16;
        case 0x16:
          goto switchD_0013b8c4_caseD_18;
        case 0x17:
          goto switchD_0013b8fc_caseD_1a;
        case 0x18:
          goto switchD_0013b8fc_caseD_1b;
        case 0x19:
          goto switchD_0013b8fc_caseD_1c;
        case 0x1a:
          goto switchD_0013b8fc_caseD_1d;
        case 0x1b:
          goto switchD_0013b8fc_caseD_1e;
        case 0x1c:
          goto switchD_0013b8fc_caseD_1f;
        case 0x1d:
          goto switchD_0013b8fc_caseD_20;
        case 0x1e:
          goto switchD_0013b8fc_caseD_21;
        case 0x1f:
          goto switchD_0013b8fc_caseD_22;
        case 0x20:
          goto switchD_0013b8fc_caseD_23;
        case 0x21:
          goto switchD_0013b8fc_caseD_24;
        case 0x22:
          goto switchD_0013b8fc_caseD_25;
        case 0x23:
          goto switchD_0013b8fc_caseD_26;
        case 0x24:
          goto switchD_0013b8fc_caseD_27;
        case 0x25:
          goto switchD_0013b8fc_caseD_28;
        case 0x26:
          goto switchD_0013b8fc_caseD_29;
        case 0x27:
          goto switchD_0013b8fc_caseD_2a;
        case 0x28:
          goto switchD_0013b8fc_caseD_2b;
        case 0x29:
          goto switchD_0013b8fc_caseD_2c;
        case 0x2a:
          goto switchD_0013b8fc_caseD_2d;
        case 0x2b:
          goto switchD_0013b8fc_caseD_2e;
        case 0x2c:
          goto switchD_0013b8fc_caseD_2f;
        case 0x2d:
          goto switchD_0013b8fc_caseD_30;
        case 0x2e:
          goto switchD_0013b8fc_caseD_31;
        }
        goto switchD_0013e653_default;
      case 1:
switchD_0013b854_caseD_14:
        snprintf(buf,buflen,"SSL - The connection indicated an EOF");
switchD_0013b5a4_default:
        switch(uVar3 - 0x6800 >> 7) {
        case 0:
          goto switchD_0013b8fc_caseD_2;
        case 1:
          goto switchD_0013e653_caseD_0;
        case 2:
          goto switchD_0013e653_caseD_1;
        case 3:
          goto switchD_0013e653_caseD_2;
        case 4:
          goto switchD_0013e653_caseD_3;
        case 5:
          goto switchD_0013e61b_caseD_3;
        case 6:
          goto switchD_0013b8fc_caseD_8;
        case 7:
          goto switchD_0013b8fc_caseD_9;
        case 8:
          goto switchD_0013b8fc_caseD_a;
        case 9:
          goto switchD_0013b8fc_caseD_b;
        case 10:
          goto switchD_0013b8fc_caseD_c;
        case 0xb:
          goto switchD_0013b8fc_caseD_d;
        case 0xc:
          goto switchD_0013b8fc_caseD_e;
        case 0xd:
          goto switchD_0013b8fc_caseD_f;
        case 0xe:
          goto switchD_0013b8fc_caseD_10;
        case 0xf:
          goto switchD_0013b8fc_caseD_11;
        case 0x16:
          goto switchD_0013b88c_caseD_16;
        case 0x17:
          goto switchD_0013b8c4_caseD_18;
        case 0x18:
          goto switchD_0013b8fc_caseD_1a;
        case 0x19:
          goto switchD_0013b8fc_caseD_1b;
        case 0x1a:
          goto switchD_0013b8fc_caseD_1c;
        case 0x1b:
          goto switchD_0013b8fc_caseD_1d;
        case 0x1c:
          goto switchD_0013b8fc_caseD_1e;
        case 0x1d:
          goto switchD_0013b8fc_caseD_1f;
        case 0x1e:
          goto switchD_0013b8fc_caseD_20;
        case 0x1f:
          goto switchD_0013b8fc_caseD_21;
        case 0x20:
          goto switchD_0013b8fc_caseD_22;
        case 0x21:
          goto switchD_0013b8fc_caseD_23;
        case 0x22:
          goto switchD_0013b8fc_caseD_24;
        case 0x23:
          goto switchD_0013b8fc_caseD_25;
        case 0x24:
          goto switchD_0013b8fc_caseD_26;
        case 0x25:
          goto switchD_0013b8fc_caseD_27;
        case 0x26:
          goto switchD_0013b8fc_caseD_28;
        case 0x27:
          goto switchD_0013b8fc_caseD_29;
        case 0x28:
          goto switchD_0013b8fc_caseD_2a;
        case 0x29:
          goto switchD_0013b8fc_caseD_2b;
        case 0x2a:
          goto switchD_0013b8fc_caseD_2c;
        case 0x2b:
          goto switchD_0013b8fc_caseD_2d;
        case 0x2c:
          goto switchD_0013b8fc_caseD_2e;
        case 0x2d:
          goto switchD_0013b8fc_caseD_2f;
        case 0x2e:
          goto switchD_0013b8fc_caseD_30;
        case 0x2f:
          goto switchD_0013b8fc_caseD_31;
        }
        goto switchD_0013b88c_caseD_10;
      case 2:
switchD_0013b88c_caseD_16:
        snprintf(buf,buflen,"SSL - An unknown cipher was received");
        goto LAB_0013b8a2;
      case 3:
switchD_0013b8c4_caseD_18:
        snprintf(buf,buflen,"SSL - The server has no ciphersuites in common with the client");
LAB_0013b8da:
        switch(uVar3 - 0x6700 >> 7) {
        case 0:
          goto switchD_0013b8fc_caseD_0;
        case 1:
          goto switchD_0013b8fc_caseD_1;
        case 2:
          goto switchD_0013b8fc_caseD_2;
        case 3:
          goto switchD_0013e653_caseD_0;
        case 4:
          goto switchD_0013e653_caseD_1;
        case 5:
          goto switchD_0013e653_caseD_2;
        case 6:
          goto switchD_0013e653_caseD_3;
        case 7:
          goto switchD_0013e61b_caseD_3;
        case 8:
          goto switchD_0013b8fc_caseD_8;
        case 9:
          goto switchD_0013b8fc_caseD_9;
        case 10:
          goto switchD_0013b8fc_caseD_a;
        case 0xb:
          goto switchD_0013b8fc_caseD_b;
        case 0xc:
          goto switchD_0013b8fc_caseD_c;
        case 0xd:
          goto switchD_0013b8fc_caseD_d;
        case 0xe:
          goto switchD_0013b8fc_caseD_e;
        case 0xf:
          goto switchD_0013b8fc_caseD_f;
        case 0x10:
          goto switchD_0013b8fc_caseD_10;
        case 0x11:
          goto switchD_0013b8fc_caseD_11;
        case 0x1a:
          goto switchD_0013b8fc_caseD_1a;
        case 0x1b:
          goto switchD_0013b8fc_caseD_1b;
        case 0x1c:
          goto switchD_0013b8fc_caseD_1c;
        case 0x1d:
          goto switchD_0013b8fc_caseD_1d;
        case 0x1e:
          goto switchD_0013b8fc_caseD_1e;
        case 0x1f:
          goto switchD_0013b8fc_caseD_1f;
        case 0x20:
          goto switchD_0013b8fc_caseD_20;
        case 0x21:
          goto switchD_0013b8fc_caseD_21;
        case 0x22:
          goto switchD_0013b8fc_caseD_22;
        case 0x23:
          goto switchD_0013b8fc_caseD_23;
        case 0x24:
          goto switchD_0013b8fc_caseD_24;
        case 0x25:
          goto switchD_0013b8fc_caseD_25;
        case 0x26:
          goto switchD_0013b8fc_caseD_26;
        case 0x27:
          goto switchD_0013b8fc_caseD_27;
        case 0x28:
          goto switchD_0013b8fc_caseD_28;
        case 0x29:
          goto switchD_0013b8fc_caseD_29;
        case 0x2a:
          goto switchD_0013b8fc_caseD_2a;
        case 0x2b:
          goto switchD_0013b8fc_caseD_2b;
        case 0x2c:
          goto switchD_0013b8fc_caseD_2c;
        case 0x2d:
          goto switchD_0013b8fc_caseD_2d;
        case 0x2e:
          goto switchD_0013b8fc_caseD_2e;
        case 0x2f:
          goto switchD_0013b8fc_caseD_2f;
        case 0x30:
          goto switchD_0013b8fc_caseD_30;
        case 0x31:
          goto switchD_0013b8fc_caseD_31;
        }
        goto switchD_0013b8fc_caseD_12;
      case 4:
switchD_0013b8fc_caseD_1a:
        snprintf(buf,buflen,"SSL - No RNG was provided to the SSL module");
LAB_0013b912:
        switch(uVar3 - 0x6680 >> 7) {
        case 0:
          goto switchD_0013b96c_caseD_1;
        case 1:
          goto switchD_0013b8fc_caseD_0;
        case 2:
          goto switchD_0013b8fc_caseD_1;
        case 3:
          goto switchD_0013b8fc_caseD_2;
        case 4:
          goto switchD_0013e653_caseD_0;
        case 5:
          goto switchD_0013e653_caseD_1;
        case 6:
          goto switchD_0013e653_caseD_2;
        case 7:
          goto switchD_0013e653_caseD_3;
        case 8:
          goto switchD_0013e61b_caseD_3;
        case 9:
          goto switchD_0013b8fc_caseD_8;
        case 10:
          goto switchD_0013b8fc_caseD_9;
        case 0xb:
          goto switchD_0013b8fc_caseD_a;
        case 0xc:
          goto switchD_0013b8fc_caseD_b;
        case 0xd:
          goto switchD_0013b8fc_caseD_c;
        case 0xe:
          goto switchD_0013b8fc_caseD_d;
        case 0xf:
          goto switchD_0013b8fc_caseD_e;
        case 0x10:
          goto switchD_0013b8fc_caseD_f;
        case 0x11:
          goto switchD_0013b8fc_caseD_10;
        case 0x12:
          goto switchD_0013b8fc_caseD_11;
        case 0x1c:
          goto switchD_0013b8fc_caseD_1b;
        case 0x1d:
          goto switchD_0013b8fc_caseD_1c;
        case 0x1e:
          goto switchD_0013b8fc_caseD_1d;
        case 0x1f:
          goto switchD_0013b8fc_caseD_1e;
        case 0x20:
          goto switchD_0013b8fc_caseD_1f;
        case 0x21:
          goto switchD_0013b8fc_caseD_20;
        case 0x22:
          goto switchD_0013b8fc_caseD_21;
        case 0x23:
          goto switchD_0013b8fc_caseD_22;
        case 0x24:
          goto switchD_0013b8fc_caseD_23;
        case 0x25:
          goto switchD_0013b8fc_caseD_24;
        case 0x26:
          goto switchD_0013b8fc_caseD_25;
        case 0x27:
          goto switchD_0013b8fc_caseD_26;
        case 0x28:
          goto switchD_0013b8fc_caseD_27;
        case 0x29:
          goto switchD_0013b8fc_caseD_28;
        case 0x2a:
          goto switchD_0013b8fc_caseD_29;
        case 0x2b:
          goto switchD_0013b8fc_caseD_2a;
        case 0x2c:
          goto switchD_0013b8fc_caseD_2b;
        case 0x2d:
          goto switchD_0013b8fc_caseD_2c;
        case 0x2e:
          goto switchD_0013b8fc_caseD_2d;
        case 0x2f:
          goto switchD_0013b8fc_caseD_2e;
        case 0x30:
          goto switchD_0013b8fc_caseD_2f;
        case 0x31:
          goto switchD_0013b8fc_caseD_30;
        case 0x32:
          goto switchD_0013b8fc_caseD_31;
        }
        goto switchD_0013b934_caseD_13;
      case 5:
switchD_0013b8fc_caseD_1b:
        snprintf(buf,buflen,
                 "SSL - No client certification received from the client, but required by the authentication mode"
                );
        goto LAB_0013b94a;
      case 6:
switchD_0013b8fc_caseD_1c:
        snprintf(buf,buflen,
                 "SSL - Our own certificate(s) is/are too large to send in an SSL message");
        uVar1 = uVar3 - 0x7580 >> 7;
        if (uVar1 < 5) {
          (*(code *)(&DAT_0016053c + *(int *)(&DAT_0016053c + (ulong)uVar1 * 4)))();
          return;
        }
LAB_0013bad8:
        if (uVar3 < 0x6d80) {
          if (0x67ff < uVar3) {
            if (uVar3 < 0x6a80) {
              if (uVar3 < 0x6900) {
                if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
                if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
              }
              else {
                if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
                if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
                if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
              }
            }
            else if (uVar3 < 0x6c00) {
              if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
              if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
              if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
            }
            else {
              if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
              if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
              if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
            }
            goto LAB_0013eeb3;
          }
          if (uVar3 < 0x2300) {
            if (0x217f < uVar3) {
              if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
              if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
              if (uVar3 != 0x2280) goto LAB_0013eeb3;
              goto switchD_0013ee65_caseD_0;
            }
            if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
            if (uVar3 != 0x2100) goto LAB_0013eeb3;
            goto switchD_0013ec95_caseD_1;
          }
          if (0x667f < uVar3) {
            if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
            if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
            if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
            goto LAB_0013eeb3;
          }
          if (uVar3 != 0x2300) {
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            goto LAB_0013eeb3;
          }
          goto switchD_0013ee65_caseD_1;
        }
        if (uVar3 < 0x7a80) {
          if (uVar3 < 0x7800) {
            if (uVar3 < 0x6e80) {
              if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
              if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
            }
            else {
              if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
              if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
              if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
            }
          }
          else if (uVar3 < 0x7900) {
            if (uVar3 == 0x7800) goto switchD_0013b8fc_caseD_22;
            if (uVar3 == 0x7880) goto switchD_0013b8fc_caseD_23;
          }
          else {
            if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
            if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
            if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          }
        }
        else if (uVar3 < 32000) {
          if (uVar3 < 0x7b80) {
            if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
            if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
          }
          else {
            if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
            if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
            if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
          }
        }
        else if (uVar3 < 0x7e80) {
          if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
          if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
          if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
        }
        else {
          if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
          if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
          if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
        }
        goto LAB_0013eeb3;
      case 7:
switchD_0013b8fc_caseD_1d:
        snprintf(buf,buflen,"SSL - The own certificate is not set, but needed by the server");
        uVar1 = uVar3 - 0x7600 >> 7;
        if (uVar1 < 5) {
          (*(code *)(&DAT_00160550 + *(int *)(&DAT_00160550 + (ulong)uVar1 * 4)))();
          return;
        }
        break;
      case 8:
switchD_0013b8fc_caseD_1e:
        snprintf(buf,buflen,"SSL - The own private key or pre-shared key is not set, but needed");
        uVar1 = uVar3 - 0x7680 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00160564 + *(int *)(&DAT_00160564 + (ulong)uVar1 * 4)))();
          return;
        }
        break;
      case 9:
switchD_0013b8fc_caseD_1f:
        snprintf(buf,buflen,"SSL - No CA Chain is set, but required to operate");
        switch(uVar3 - 0x7700 >> 7) {
        case 0:
          goto switchD_0013b8fc_caseD_20;
        case 1:
switchD_0013b8fc_caseD_21:
          snprintf(buf,buflen,"SSL - A fatal alert message was received from our peer");
          return;
        case 2:
          goto switchD_0013b8fc_caseD_22;
        case 3:
          goto switchD_0013b8fc_caseD_23;
        }
        goto switchD_0013ba82_default;
      case 10:
switchD_0013b8fc_caseD_20:
        snprintf(buf,buflen,"SSL - An unexpected message was received from our peer");
        uVar1 = uVar3 - 0x7780 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00160584 + *(int *)(&DAT_00160584 + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_0013c099;
      case 0xb:
        goto switchD_0013b8fc_caseD_21;
      case 0xc:
switchD_0013b8fc_caseD_22:
        snprintf(buf,buflen,"SSL - Verification of our peer failed");
        break;
      case 0xd:
        goto switchD_0013b8fc_caseD_23;
      case 0xe:
        goto switchD_0013b8fc_caseD_24;
      case 0xf:
        goto switchD_0013b8fc_caseD_25;
      case 0x10:
        goto switchD_0013b8fc_caseD_26;
      case 0x11:
        goto switchD_0013b8fc_caseD_27;
      case 0x12:
        goto switchD_0013b8fc_caseD_28;
      case 0x13:
        goto switchD_0013b8fc_caseD_29;
      case 0x14:
        goto switchD_0013b8fc_caseD_2a;
      case 0x15:
        goto switchD_0013b8fc_caseD_2b;
      case 0x16:
        goto switchD_0013b8fc_caseD_2c;
      case 0x17:
        goto switchD_0013b8fc_caseD_2d;
      case 0x18:
        goto switchD_0013b8fc_caseD_2e;
      default:
        goto switchD_0013b81c_default;
      }
      switch(uVar3 - 0x6780 >> 7) {
      case 0:
        goto switchD_0013b8fc_caseD_1;
      case 1:
        goto switchD_0013b8fc_caseD_2;
      case 2:
        goto switchD_0013e653_caseD_0;
      case 3:
        goto switchD_0013e653_caseD_1;
      case 4:
        goto switchD_0013e653_caseD_2;
      case 5:
        goto switchD_0013e653_caseD_3;
      case 6:
        goto switchD_0013e61b_caseD_3;
      case 7:
        goto switchD_0013b8fc_caseD_8;
      case 8:
        goto switchD_0013b8fc_caseD_9;
      case 9:
        goto switchD_0013b8fc_caseD_a;
      case 10:
        goto switchD_0013b8fc_caseD_b;
      case 0xb:
        goto switchD_0013b8fc_caseD_c;
      case 0xc:
        goto switchD_0013b8fc_caseD_d;
      case 0xd:
        goto switchD_0013b8fc_caseD_e;
      case 0xe:
        goto switchD_0013b8fc_caseD_f;
      case 0xf:
        goto switchD_0013b8fc_caseD_10;
      case 0x10:
        goto switchD_0013b8fc_caseD_11;
      default:
        goto switchD_0013b8c4_caseD_11;
      case 0x22:
switchD_0013b8fc_caseD_23:
        snprintf(buf,buflen,"SSL - The peer notified us that the connection is going to be closed");
switchD_0013ba82_default:
        if (uVar3 < 0x6c80) {
          if (0x66ff < uVar3) {
            if (uVar3 < 0x6980) {
              if (uVar3 < 0x6800) {
                if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
                if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
              }
              else {
                if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
                if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
                if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
              }
            }
            else if (uVar3 < 0x6b00) {
              if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
              if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
              if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
            }
            else {
              if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
              if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
              if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
            }
            goto LAB_0013ef23;
          }
          if (uVar3 < 0x2300) {
            if (0x217f < uVar3) {
              if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
              if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
              if (uVar3 != 0x2280) goto LAB_0013ef23;
              goto switchD_0013ee65_caseD_0;
            }
            if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
            if (uVar3 != 0x2100) goto LAB_0013ef23;
            goto switchD_0013ec95_caseD_1;
          }
          if (0x23ff < uVar3) {
            if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
            if (uVar3 != 0x6600) {
              if (uVar3 != 0x6680) goto LAB_0013ef23;
              goto switchD_0013b96c_caseD_1;
            }
            goto switchD_0013b96c_caseD_0;
          }
          if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
          if (uVar3 != 0x2380) goto LAB_0013ef23;
          goto switchD_0013ee65_caseD_2;
        }
        if (uVar3 < 0x7a80) {
          if (uVar3 < 0x6f00) {
            if (uVar3 < 0x6d80) {
              if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
              if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
            }
            else {
              if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
              if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
              if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
            }
          }
          else if (uVar3 < 0x7900) {
            if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
            if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
          }
          else {
            if (uVar3 == 0x7900) goto switchD_0013b8fc_caseD_24;
            if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
            if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
          }
        }
        else if (uVar3 < 32000) {
          if (uVar3 < 0x7b80) {
            if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
            if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
          }
          else {
            if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
            if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
            if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
          }
        }
        else if (uVar3 < 0x7e80) {
          if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
          if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
          if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
        }
        else {
          if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
          if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
          if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
        }
        goto LAB_0013ef23;
      case 0x23:
switchD_0013b8fc_caseD_24:
        snprintf(buf,buflen,"SSL - Processing of the ClientHello handshake message failed");
LAB_0013c099:
        if (0x6bff < uVar3) {
          if (uVar3 < 0x7a80) {
            if (uVar3 < 0x6e80) {
              if (uVar3 < 0x6d00) {
                if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
                if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
              }
              else {
                if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
                if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
                if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
              }
            }
            else if (uVar3 < 0x6f80) {
              if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
              if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
            }
            else {
              if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
              if (uVar3 == 0x7980) goto switchD_0013b8fc_caseD_25;
              if (uVar3 == 0x7a00) goto switchD_0013b8fc_caseD_26;
            }
          }
          else if (uVar3 < 32000) {
            if (uVar3 < 0x7b80) {
              if (uVar3 == 0x7a80) goto switchD_0013b8fc_caseD_27;
              if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
            }
            else {
              if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
              if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
              if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
            }
          }
          else if (uVar3 < 0x7e80) {
            if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
            if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
            if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
          }
          else {
            if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
            if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
            if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
          }
          goto LAB_0013ef5b;
        }
        if (uVar3 < 0x6680) {
          if (uVar3 < 0x2300) {
            if (0x217f < uVar3) {
              if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
              if (uVar3 != 0x2200) {
                if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
                goto LAB_0013ef5b;
              }
              goto switchD_0013ec95_caseD_3;
            }
            if (uVar3 != 0x2080) {
              if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
              goto LAB_0013ef5b;
            }
            goto switchD_0013ec95_caseD_0;
          }
          if (uVar3 < 0x2400) {
            if (uVar3 != 0x2300) {
              if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
              goto LAB_0013ef5b;
            }
            goto switchD_0013ee65_caseD_1;
          }
          if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
          if (uVar3 != 0x2480) {
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            goto LAB_0013ef5b;
          }
          goto switchD_0013ee65_caseD_4;
        }
        if (uVar3 < 0x6900) {
          if (0x677f < uVar3) {
            if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
            if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
            goto LAB_0013ef5b;
          }
          if (uVar3 != 0x6680) {
            if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
            goto LAB_0013ef5b;
          }
          goto switchD_0013b96c_caseD_1;
        }
        if (uVar3 < 0x6a80) {
          if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
          if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
          if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
        }
        else {
          if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
          if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
          if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
        }
        goto LAB_0013ef5b;
      case 0x24:
switchD_0013b8fc_caseD_25:
        snprintf(buf,buflen,"SSL - Processing of the ServerHello handshake message failed");
        uVar1 = uVar3 - 0x7a00 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00160658 + *(int *)(&DAT_00160658 + (ulong)uVar1 * 4)))();
          return;
        }
        break;
      case 0x25:
switchD_0013b8fc_caseD_26:
        snprintf(buf,buflen,"SSL - Processing of the Certificate handshake message failed");
        uVar1 = uVar3 - 0x7a80 >> 7;
        if (uVar1 < 4) {
          (*(code *)(&DAT_00160668 + *(int *)(&DAT_00160668 + (ulong)uVar1 * 4)))();
          return;
        }
        goto LAB_0013cb8d;
      case 0x26:
switchD_0013b8fc_caseD_27:
        snprintf(buf,buflen,"SSL - Processing of the CertificateRequest handshake message failed");
LAB_0013c334:
        if (0x6a7f < uVar3) {
          if (0x6f7f < uVar3) {
            if (uVar3 < 32000) {
              if (uVar3 < 0x7b80) {
                if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
                if (uVar3 == 0x7b00) goto switchD_0013b8fc_caseD_28;
              }
              else {
                if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
                if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
                if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
              }
            }
            else if (uVar3 < 0x7e80) {
              if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
              if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
              if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
            }
            else {
              if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
              if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
              if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
            }
            goto LAB_0013f003;
          }
          if (uVar3 < 0x6d00) {
            if (uVar3 < 0x6b80) {
              if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
              if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
              goto LAB_0013f003;
            }
            if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
            goto LAB_0013dad3;
          }
          if (0x6dff < uVar3) {
            if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
            if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
            if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
            goto LAB_0013f003;
          }
          goto LAB_0013dc07;
        }
        if (0x257f < uVar3) {
          if (0x677f < uVar3) {
            if (0x68ff < uVar3) {
              if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
              if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
              if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
              goto LAB_0013f003;
            }
            if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
            goto LAB_0013da61;
          }
          if (0x65ff < uVar3) {
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
            if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
            goto LAB_0013f003;
          }
          goto LAB_0013dc26;
        }
        if (0x22ff < uVar3) {
          if (uVar3 < 0x2400) {
            if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
            if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
            goto LAB_0013f003;
          }
          if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
          goto LAB_0013da9a;
        }
        if (uVar3 < 0x2180) goto LAB_0013da1f;
        if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
        if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
        if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
        goto LAB_0013f003;
      case 0x27:
switchD_0013b8fc_caseD_28:
        snprintf(buf,buflen,"SSL - Processing of the ServerKeyExchange handshake message failed");
LAB_0013c857:
        if (0x69ff < uVar3) {
          if (uVar3 < 0x6f00) {
            if (uVar3 < 0x6c80) {
              if (uVar3 < 0x6b00) {
                if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
                if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
              }
              else {
                if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
                if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
                if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
              }
            }
            else if (uVar3 < 0x6d80) {
              if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
              if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
            }
            else {
              if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
              if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
              if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
            }
          }
          else if (uVar3 < 32000) {
            if (uVar3 < 0x7b80) {
              if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
              if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
            }
            else {
              if (uVar3 == 0x7b80) goto switchD_0013b8fc_caseD_29;
              if (uVar3 == 0x7c00) goto switchD_0013b8fc_caseD_2a;
              if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
            }
          }
          else if (uVar3 < 0x7e80) {
            if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
            if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
            if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
          }
          else {
            if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
            if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
            if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
          }
          goto LAB_0013f03b;
        }
        if (uVar3 < 0x2580) {
          if (0x22ff < uVar3) {
            if (uVar3 < 0x2400) {
              if (uVar3 == 0x2300) goto switchD_0013ee65_caseD_1;
              if (uVar3 == 0x2380) goto switchD_0013ee65_caseD_2;
              goto LAB_0013f03b;
            }
            if (uVar3 == 0x2400) goto switchD_0013ee65_caseD_3;
            if (uVar3 == 0x2480) goto switchD_0013ee65_caseD_4;
            if (uVar3 != 0x2500) goto LAB_0013f03b;
            goto switchD_0013ee65_caseD_5;
          }
          if (uVar3 < 0x2180) {
            if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
            if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
          }
          else {
            if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
            if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
            if (uVar3 == 0x2280) goto switchD_0013ee65_caseD_0;
          }
          goto LAB_0013f03b;
        }
        if (0x66ff < uVar3) {
          if (0x687f < uVar3) {
            if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
            if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
            if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
            goto LAB_0013f03b;
          }
          if (uVar3 != 0x6700) {
            if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
            if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            goto LAB_0013f03b;
          }
          goto switchD_0013b8fc_caseD_0;
        }
        if (0x267f < uVar3) {
          if (uVar3 != 0x2680) {
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
            goto LAB_0013f03b;
          }
          goto switchD_0013ee65_caseD_8;
        }
        if (uVar3 != 0x2580) {
          if (uVar3 != 0x2600) goto LAB_0013f03b;
          goto switchD_0013ee65_caseD_7;
        }
        goto switchD_0013ee65_caseD_6;
      case 0x28:
switchD_0013b8fc_caseD_29:
        snprintf(buf,buflen,"SSL - Processing of the ServerHelloDone handshake message failed");
        break;
      case 0x29:
        goto switchD_0013b8fc_caseD_2a;
      case 0x2a:
        goto switchD_0013b8fc_caseD_2b;
      case 0x2b:
        goto switchD_0013b8fc_caseD_2c;
      case 0x2c:
        goto switchD_0013b8fc_caseD_2d;
      case 0x2d:
        goto switchD_0013b8fc_caseD_2e;
      case 0x2e:
        goto switchD_0013b8fc_caseD_2f;
      case 0x2f:
        goto switchD_0013b8fc_caseD_30;
      case 0x30:
        goto switchD_0013b8fc_caseD_31;
      }
LAB_0013ca7e:
      if (uVar3 < 0x6c00) {
        if (uVar3 < 0x6800) {
          if (uVar3 < 0x6600) {
            if (uVar3 < 0x2180) {
              if (uVar3 == 0x2080) goto switchD_0013ec95_caseD_0;
              if (uVar3 == 0x2100) goto switchD_0013ec95_caseD_1;
            }
            else {
              if (uVar3 == 0x2180) goto switchD_0013ec95_caseD_2;
              if (uVar3 == 0x2200) goto switchD_0013ec95_caseD_3;
            }
          }
          else if (uVar3 < 0x6700) {
            if (uVar3 == 0x6600) goto switchD_0013b96c_caseD_0;
            if (uVar3 == 0x6680) goto switchD_0013b96c_caseD_1;
          }
          else {
            if (uVar3 == 0x6700) goto switchD_0013b8fc_caseD_0;
            if (uVar3 == 0x6780) goto switchD_0013b8fc_caseD_1;
          }
        }
        else if (uVar3 < 0x6a00) {
          if (uVar3 < 0x6900) {
            if (uVar3 == 0x6800) goto switchD_0013b8fc_caseD_2;
            if (uVar3 == 0x6880) goto switchD_0013e653_caseD_0;
          }
          else {
            if (uVar3 == 0x6900) goto switchD_0013e653_caseD_1;
            if (uVar3 == 0x6980) goto switchD_0013e653_caseD_2;
          }
        }
        else if (uVar3 < 0x6b00) {
          if (uVar3 == 0x6a00) goto switchD_0013e653_caseD_3;
          if (uVar3 == 0x6a80) goto switchD_0013e61b_caseD_3;
        }
        else {
          if (uVar3 == 0x6b00) goto switchD_0013b8fc_caseD_8;
          if (uVar3 == 0x6b80) goto switchD_0013b8fc_caseD_9;
        }
      }
      else if (uVar3 < 0x7c00) {
        if (uVar3 < 0x6e00) {
          if (uVar3 < 0x6d00) {
            if (uVar3 == 0x6c00) goto switchD_0013b8fc_caseD_a;
            if (uVar3 == 0x6c80) goto switchD_0013b8fc_caseD_b;
          }
          else {
            if (uVar3 == 0x6d00) goto switchD_0013b8fc_caseD_c;
            if (uVar3 == 0x6d80) goto switchD_0013b8fc_caseD_d;
          }
        }
        else if (uVar3 < 0x6f00) {
          if (uVar3 == 0x6e00) goto switchD_0013b8fc_caseD_e;
          if (uVar3 == 0x6e80) goto switchD_0013b8fc_caseD_f;
        }
        else {
          if (uVar3 == 0x6f00) goto switchD_0013b8fc_caseD_10;
          if (uVar3 == 0x6f80) goto switchD_0013b8fc_caseD_11;
        }
      }
      else if (uVar3 < 0x7e00) {
        if (uVar3 < 32000) {
          if (uVar3 == 0x7c00) {
switchD_0013b8fc_caseD_2a:
            snprintf(buf,buflen,"SSL - Processing of the ClientKeyExchange handshake message failed"
                    );
            goto LAB_0013cb8d;
          }
          if (uVar3 == 0x7c80) goto switchD_0013b8fc_caseD_2b;
        }
        else {
          if (uVar3 == 32000) goto switchD_0013b8fc_caseD_2c;
          if (uVar3 == 0x7d80) goto switchD_0013b8fc_caseD_2d;
        }
      }
      else if (uVar3 < 0x7f00) {
        if (uVar3 == 0x7e00) goto switchD_0013b8fc_caseD_2e;
        if (uVar3 == 0x7e80) goto switchD_0013b8fc_caseD_2f;
      }
      else {
        if (uVar3 == 0x7f00) goto switchD_0013b8fc_caseD_30;
        if (uVar3 == 0x7f80) goto switchD_0013b8fc_caseD_31;
      }
LAB_0013ee43:
      switch(uVar3 - 0x2280 >> 7) {
      case 0:
switchD_0013ee65_caseD_0:
        snprintf(buf,buflen,"X509 - The serial tag or value is invalid");
        goto LAB_0013ee7b;
      case 1:
        goto switchD_0013ee65_caseD_1;
      case 2:
        goto switchD_0013ee65_caseD_2;
      case 3:
        goto switchD_0013ee65_caseD_3;
      case 4:
        goto switchD_0013ee65_caseD_4;
      case 5:
        goto switchD_0013ee65_caseD_5;
      case 6:
        goto switchD_0013ee65_caseD_6;
      case 7:
        goto switchD_0013ee65_caseD_7;
      case 8:
        goto switchD_0013ee65_caseD_8;
      case 9:
        goto switchD_0013ee65_caseD_9;
      case 10:
        goto switchD_0013ee65_caseD_a;
      case 0xb:
        goto switchD_0013ee65_caseD_b;
      case 0xc:
        goto switchD_0013ee65_caseD_c;
      case 0xd:
        goto switchD_0013ee65_caseD_d;
      case 0xe:
        goto switchD_0013ee65_caseD_e;
      }
    }
switchD_0013ee65_default:
    if (*buf == '\0') {
      snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar3);
    }
  }
  uVar4 = uVar4 & 0x7fff007f;
  if (uVar4 == 0) {
    return;
  }
  sVar2 = strlen(buf);
  if (sVar2 != 0) {
    if (buflen - sVar2 < 5) {
      return;
    }
    snprintf(buf + sVar2,buflen - sVar2," : ");
    buf = buf + sVar2 + 3;
    buflen = buflen - (sVar2 + 3);
  }
  uVar3 = uVar4 - 2;
  switch(uVar3) {
  case 0:
switchD_0013f1d7_caseD_0:
    snprintf(buf,buflen,"BIGNUM - An error occurred while reading from or writing to a file");
    switch(uVar4) {
    case 4:
      goto switchD_0013f1d7_caseD_2;
    case 6:
      goto switchD_0013f1d7_caseD_4;
    case 8:
      goto switchD_0013f1d7_caseD_6;
    case 10:
      goto switchD_0013f1d7_caseD_8;
    case 0xc:
      goto switchD_0013f1d7_caseD_a;
    case 0xe:
      goto switchD_0013f1d7_caseD_c;
    case 0x10:
      goto switchD_0013f1d7_caseD_e;
    case 0x16:
      goto switchD_0013f1d7_caseD_14;
    case 0x18:
      goto switchD_0013f1d7_caseD_16;
    }
    break;
  case 1:
    goto switchD_0013f1d7_caseD_1;
  case 2:
switchD_0013f1d7_caseD_2:
    snprintf(buf,buflen,"BIGNUM - Bad input parameters to function");
    switch(uVar4 - 6 >> 1 | (uint)((uVar4 - 6 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_0013f1d7_caseD_4;
    case 1:
      goto switchD_0013f1d7_caseD_6;
    case 2:
      goto switchD_0013f1d7_caseD_8;
    case 3:
      goto switchD_0013f1d7_caseD_a;
    case 4:
      goto switchD_0013f1d7_caseD_c;
    case 5:
      goto switchD_0013f1d7_caseD_e;
    default:
      goto code_r0x0013f874;
    case 8:
      goto switchD_0013f1d7_caseD_14;
    case 9:
      goto switchD_0013f1d7_caseD_16;
    case 0xf:
      goto switchD_0013f1d7_caseD_22;
    }
  case 3:
    goto switchD_0013f1d7_caseD_3;
  case 4:
switchD_0013f1d7_caseD_4:
    snprintf(buf,buflen,"BIGNUM - There is an invalid character in the digit string");
    switch(uVar4 - 8 >> 1 | (uint)((uVar4 - 8 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_0013f1d7_caseD_6;
    case 1:
      goto switchD_0013f1d7_caseD_8;
    case 2:
      goto switchD_0013f1d7_caseD_a;
    case 3:
      goto switchD_0013f1d7_caseD_c;
    case 4:
      goto switchD_0013f1d7_caseD_e;
    case 7:
      goto switchD_0013f1d7_caseD_14;
    case 8:
      goto switchD_0013f1d7_caseD_16;
    case 0xe:
      goto switchD_0013f1d7_caseD_22;
    }
    goto code_r0x0013f874;
  case 5:
    goto switchD_0013f1d7_caseD_5;
  case 6:
switchD_0013f1d7_caseD_6:
    snprintf(buf,buflen,"BIGNUM - The buffer is too small to write to");
    switch(uVar4 - 10 >> 1 | (uint)((uVar4 - 10 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_0013f1d7_caseD_8;
    case 1:
      goto switchD_0013f1d7_caseD_a;
    case 2:
      goto switchD_0013f1d7_caseD_c;
    case 3:
      goto switchD_0013f1d7_caseD_e;
    default:
      goto code_r0x0013f8a1;
    case 6:
      goto switchD_0013f1d7_caseD_14;
    case 7:
      goto switchD_0013f1d7_caseD_16;
    case 0xd:
      goto switchD_0013f1d7_caseD_22;
    case 0xe:
      goto switchD_0013f1d7_caseD_24;
    }
  case 7:
    goto switchD_0013f1d7_caseD_7;
  case 8:
switchD_0013f1d7_caseD_8:
    snprintf(buf,buflen,"BIGNUM - The input arguments are negative or result in illegal output");
    switch(uVar4 - 0xc >> 1 | (uint)((uVar4 - 0xc & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_0013f1d7_caseD_a;
    case 1:
      goto switchD_0013f1d7_caseD_c;
    case 2:
      goto switchD_0013f1d7_caseD_e;
    case 5:
      goto switchD_0013f1d7_caseD_14;
    case 6:
      goto switchD_0013f1d7_caseD_16;
    case 0xc:
      goto switchD_0013f1d7_caseD_22;
    case 0xd:
      goto switchD_0013f1d7_caseD_24;
    }
    goto code_r0x0013f8a1;
  case 9:
  case 0xf:
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1f:
  case 0x21:
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x31:
  case 0x33:
  case 0x35:
  case 0x37:
  case 0x39:
  case 0x3f:
    goto switchD_0013f1d7_caseD_9;
  case 10:
switchD_0013f1d7_caseD_a:
    snprintf(buf,buflen,"BIGNUM - The input argument for division is zero, which is not allowed");
    switch(uVar4) {
    case 0xd:
      goto switchD_0013f1d7_caseD_b;
    case 0xe:
      goto switchD_0013f1d7_caseD_c;
    case 0xf:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      break;
    case 0x10:
      goto switchD_0013f1d7_caseD_e;
    case 0x16:
      goto switchD_0013f1d7_caseD_14;
    case 0x18:
      goto switchD_0013f1d7_caseD_16;
    default:
switchD_0013f731_default:
      if (uVar4 == 0x24) goto switchD_0013f1d7_caseD_22;
      if (uVar4 == 0x26) goto switchD_0013f1d7_caseD_24;
    }
    goto switchD_0013f731_caseD_f;
  case 0xb:
    goto switchD_0013f1d7_caseD_b;
  case 0xc:
switchD_0013f1d7_caseD_c:
    snprintf(buf,buflen,"BIGNUM - The input arguments are not acceptable");
    if (0x17 < uVar4) {
      if (uVar4 != 0x18) goto switchD_0013f731_default;
      goto switchD_0013f1d7_caseD_16;
    }
    if (uVar4 != 0xd) {
      if (uVar4 == 0x10) goto switchD_0013f1d7_caseD_e;
      if (uVar4 != 0x16) goto switchD_0013f731_caseD_f;
      goto switchD_0013f1d7_caseD_14;
    }
    goto switchD_0013f1d7_caseD_b;
  case 0xd:
    goto switchD_0013f1d7_caseD_d;
  case 0xe:
switchD_0013f1d7_caseD_e:
    snprintf(buf,buflen,"BIGNUM - Memory allocation failed");
    if (0x17 < uVar4) {
      if (uVar4 == 0x18) goto switchD_0013f1d7_caseD_16;
      if (uVar4 == 0x24) goto switchD_0013f1d7_caseD_22;
      if (uVar4 != 0x26) goto code_r0x0013f98e;
      goto switchD_0013f1d7_caseD_24;
    }
    if (uVar4 == 0xd) goto switchD_0013f1d7_caseD_b;
    if (uVar4 == 0xf) goto switchD_0013f1d7_caseD_d;
    if (uVar4 == 0x16) goto switchD_0013f1d7_caseD_14;
    goto code_r0x0013f98e;
  case 0x10:
    goto switchD_0013f1d7_caseD_10;
  case 0x12:
    goto switchD_0013f1d7_caseD_12;
  case 0x14:
switchD_0013f1d7_caseD_14:
    snprintf(buf,buflen,"BLOWFISH - Invalid key length");
    if (0x23 < uVar4) {
      if (uVar4 == 0x24) goto switchD_0013f1d7_caseD_22;
      if (uVar4 != 0x26) goto switchD_0013f455_default;
      goto switchD_0013f1d7_caseD_24;
    }
    if (uVar4 == 0xd) goto switchD_0013f1d7_caseD_b;
    if (uVar4 != 0xf) {
      if (uVar4 != 0x18) goto switchD_0013f42f_caseD_1;
      goto switchD_0013f1d7_caseD_16;
    }
    goto switchD_0013f1d7_caseD_d;
  case 0x16:
switchD_0013f1d7_caseD_16:
    snprintf(buf,buflen,"BLOWFISH - Invalid data input length");
    break;
  case 0x1e:
    snprintf(buf,buflen,"AES - Invalid key length");
    switch(uVar3) {
    case 0:
      goto switchD_0013f1d7_caseD_0;
    case 1:
      goto switchD_0013f1d7_caseD_1;
    case 2:
      goto switchD_0013f1d7_caseD_2;
    case 3:
      goto switchD_0013f1d7_caseD_3;
    case 4:
      goto switchD_0013f1d7_caseD_4;
    case 5:
      goto switchD_0013f1d7_caseD_5;
    case 6:
      goto switchD_0013f1d7_caseD_6;
    case 7:
      goto switchD_0013f1d7_caseD_7;
    case 8:
      goto switchD_0013f1d7_caseD_8;
    case 9:
      goto switchD_0013fddc_caseD_b;
    case 10:
      goto switchD_0013f1d7_caseD_a;
    case 0xb:
      goto switchD_0013f1d7_caseD_b;
    case 0xc:
      goto switchD_0013f1d7_caseD_c;
    case 0xd:
      goto switchD_0013f1d7_caseD_d;
    case 0xe:
      goto switchD_0013f1d7_caseD_e;
    default:
      goto switchD_0013ff41_caseD_47;
    case 0x10:
      goto switchD_0013f1d7_caseD_10;
    case 0x12:
      goto switchD_0013f1d7_caseD_12;
    case 0x14:
      goto switchD_0013f1d7_caseD_14;
    case 0x16:
      goto switchD_0013f1d7_caseD_16;
    case 0x20:
      goto switchD_0013f1d7_caseD_20;
    case 0x22:
      goto switchD_0013f1d7_caseD_22;
    case 0x24:
      goto switchD_0013f1d7_caseD_24;
    case 0x26:
      goto switchD_0013fa74_caseD_28;
    case 0x28:
      goto switchD_0013f1d7_caseD_28;
    case 0x2a:
      goto switchD_0013f1d7_caseD_2a;
    case 0x2c:
      goto switchD_0013fa74_caseD_2e;
    case 0x2e:
      goto switchD_0013fa74_caseD_30;
    case 0x30:
      goto switchD_0013f1d7_caseD_30;
    case 0x32:
      goto switchD_0013f1d7_caseD_32;
    case 0x34:
      goto switchD_0013f1d7_caseD_34;
    case 0x36:
      goto switchD_0013f1d7_caseD_36;
    case 0x38:
      goto switchD_0013f1d7_caseD_38;
    case 0x3a:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3b:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3d;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3e;
    case 0x40:
      goto switchD_0013f1d7_caseD_40;
    case 0x41:
      goto switchD_0013ff41_caseD_43;
    case 0x42:
      goto switchD_0013ff41_caseD_44;
    case 0x43:
      goto switchD_0013ff41_caseD_45;
    case 0x44:
      goto switchD_0013ff41_caseD_46;
    case 0x46:
      goto switchD_0013ff41_caseD_48;
    case 0x48:
      goto switchD_0013ff41_caseD_4a;
    case 0x4a:
      goto switchD_0013ff41_caseD_4c;
    case 0x4c:
      goto switchD_0013ff41_caseD_4e;
    case 0x4e:
      goto switchD_0013ff41_caseD_50;
    case 0x50:
      goto switchD_0013ff41_caseD_52;
    case 0x5e:
switchD_0013f225_caseD_60:
      snprintf(buf,buflen,"ASN1 - Out of data when parsing an ASN1 data structure");
      switch(uVar3) {
      case 0:
        goto switchD_0013f1d7_caseD_0;
      case 1:
      case 3:
      case 5:
      case 7:
      case 9:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x15:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x23:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x29:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x31:
      case 0x33:
      case 0x35:
      case 0x37:
      case 0x39:
        break;
      case 2:
        goto switchD_0013f1d7_caseD_2;
      case 4:
        goto switchD_0013f1d7_caseD_4;
      case 6:
        goto switchD_0013f1d7_caseD_6;
      case 8:
        goto switchD_0013f1d7_caseD_8;
      case 10:
        goto switchD_0013f1d7_caseD_a;
      case 0xb:
        goto switchD_0013f1d7_caseD_b;
      case 0xc:
        goto switchD_0013f1d7_caseD_c;
      case 0xd:
        goto switchD_0013f1d7_caseD_d;
      case 0xe:
        goto switchD_0013f1d7_caseD_e;
      case 0x14:
        goto switchD_0013f1d7_caseD_14;
      case 0x16:
        goto switchD_0013f1d7_caseD_16;
      case 0x22:
        goto switchD_0013f1d7_caseD_22;
      case 0x24:
        goto switchD_0013f1d7_caseD_24;
      case 0x28:
        goto switchD_0013f1d7_caseD_28;
      case 0x2a:
        goto switchD_0013f1d7_caseD_2a;
      case 0x30:
        goto switchD_0013f1d7_caseD_30;
      case 0x32:
        goto switchD_0013f1d7_caseD_32;
      case 0x34:
        goto switchD_0013f1d7_caseD_34;
      case 0x36:
        goto switchD_0013f1d7_caseD_36;
      case 0x38:
        goto switchD_0013f1d7_caseD_38;
      case 0x3a:
        goto switchD_0013f1d7_caseD_3a;
      case 0x3b:
        goto switchD_0013f1d7_caseD_3b;
      case 0x3c:
        goto switchD_0013f1d7_caseD_3c;
      case 0x3d:
        goto switchD_0013f1d7_caseD_3d;
      case 0x3e:
        goto switchD_0013f1d7_caseD_3e;
      default:
        switch(uVar4) {
        case 0x62:
          goto switchD_0013f225_caseD_62;
        case 100:
          goto switchD_0013f225_caseD_64;
        case 0x66:
          goto switchD_0013f225_caseD_66;
        case 0x68:
          goto switchD_0013f225_caseD_68;
        case 0x6a:
          goto switchD_0013f225_caseD_6a;
        case 0x6c:
          goto switchD_0013f225_caseD_6c;
        }
      }
      goto switchD_0013f253_caseD_1;
    case 0x60:
switchD_0013f225_caseD_62:
      snprintf(buf,buflen,"ASN1 - ASN1 tag was of an unexpected value");
      if (uVar4 < 0x24) {
        switch(uVar3) {
        case 0:
          goto switchD_0013f1d7_caseD_0;
        case 2:
          goto switchD_0013f1d7_caseD_2;
        case 4:
          goto switchD_0013f1d7_caseD_4;
        case 6:
          goto switchD_0013f1d7_caseD_6;
        case 8:
          goto switchD_0013f1d7_caseD_8;
        case 10:
          goto switchD_0013f1d7_caseD_a;
        case 0xb:
          goto switchD_0013f1d7_caseD_b;
        case 0xc:
          goto switchD_0013f1d7_caseD_c;
        case 0xd:
          goto switchD_0013f1d7_caseD_d;
        case 0xe:
          goto switchD_0013f1d7_caseD_e;
        case 0x14:
          goto switchD_0013f1d7_caseD_14;
        case 0x16:
          goto switchD_0013f1d7_caseD_16;
        }
      }
      else {
        switch(uVar4) {
        case 100:
          goto switchD_0013f225_caseD_64;
        case 0x65:
        case 0x67:
        case 0x69:
        case 0x6b:
          break;
        case 0x66:
          goto switchD_0013f225_caseD_66;
        case 0x68:
          goto switchD_0013f225_caseD_68;
        case 0x6a:
          goto switchD_0013f225_caseD_6a;
        case 0x6c:
          goto switchD_0013f225_caseD_6c;
        default:
          switch(uVar4) {
          case 0x24:
            goto switchD_0013f1d7_caseD_22;
          case 0x25:
          case 0x27:
          case 0x28:
          case 0x29:
          case 0x2b:
            break;
          case 0x26:
            goto switchD_0013f1d7_caseD_24;
          case 0x2a:
            goto switchD_0013f1d7_caseD_28;
          case 0x2c:
            goto switchD_0013f1d7_caseD_2a;
          default:
            switch(uVar4) {
            case 0x34:
              goto switchD_0013f1d7_caseD_32;
            case 0x36:
              goto switchD_0013f1d7_caseD_34;
            case 0x38:
              goto switchD_0013f1d7_caseD_36;
            case 0x3a:
              goto switchD_0013f1d7_caseD_38;
            }
          }
        }
      }
      goto switchD_0013f3d1_caseD_35;
    case 0x62:
switchD_0013f225_caseD_64:
      snprintf(buf,buflen,"ASN1 - Error when trying to determine the length or invalid length");
      if (uVar4 < 0x24) {
        switch(uVar3) {
        case 0:
          goto switchD_0013f1d7_caseD_0;
        case 2:
          goto switchD_0013f1d7_caseD_2;
        case 4:
          goto switchD_0013f1d7_caseD_4;
        case 6:
          goto switchD_0013f1d7_caseD_6;
        case 8:
          goto switchD_0013f1d7_caseD_8;
        case 10:
          goto switchD_0013f1d7_caseD_a;
        case 0xb:
          goto switchD_0013f1d7_caseD_b;
        case 0xc:
          goto switchD_0013f1d7_caseD_c;
        case 0xd:
          goto switchD_0013f1d7_caseD_d;
        case 0xe:
          goto switchD_0013f1d7_caseD_e;
        case 0x14:
          goto switchD_0013f1d7_caseD_14;
        case 0x16:
          goto switchD_0013f1d7_caseD_16;
        }
      }
      else {
        switch(uVar4) {
        case 0x24:
          goto switchD_0013f1d7_caseD_22;
        case 0x25:
        case 0x27:
        case 0x28:
        case 0x29:
        case 0x2b:
          goto switchD_0013f42f_caseD_1;
        case 0x26:
          goto switchD_0013f1d7_caseD_24;
        case 0x2a:
          goto switchD_0013f1d7_caseD_28;
        case 0x2c:
          goto switchD_0013f1d7_caseD_2a;
        default:
          switch(uVar4) {
          case 0x66:
            goto switchD_0013f225_caseD_66;
          case 0x67:
          case 0x69:
          case 0x6b:
            goto switchD_0013f42f_caseD_1;
          case 0x68:
            goto switchD_0013f225_caseD_68;
          case 0x6a:
            goto switchD_0013f225_caseD_6a;
          case 0x6c:
            goto switchD_0013f225_caseD_6c;
          }
        }
switchD_0013f455_default:
        if (uVar4 == 0x34) goto switchD_0013f1d7_caseD_32;
      }
      goto switchD_0013f42f_caseD_1;
    case 100:
switchD_0013f225_caseD_66:
      snprintf(buf,buflen,"ASN1 - Actual length differs from expected length");
      if (uVar4 < 0x24) {
        switch(uVar3) {
        case 0:
          goto switchD_0013f1d7_caseD_0;
        case 2:
          goto switchD_0013f1d7_caseD_2;
        case 4:
          goto switchD_0013f1d7_caseD_4;
        case 6:
          goto switchD_0013f1d7_caseD_6;
        case 8:
          goto switchD_0013f1d7_caseD_8;
        case 10:
          goto switchD_0013f1d7_caseD_a;
        case 0xb:
          goto switchD_0013f1d7_caseD_b;
        case 0xc:
          goto switchD_0013f1d7_caseD_c;
        case 0xe:
          goto switchD_0013f1d7_caseD_e;
        case 0x14:
          goto switchD_0013f1d7_caseD_14;
        case 0x16:
          goto switchD_0013f1d7_caseD_16;
        }
      }
      else if (uVar4 < 0x68) {
        switch(uVar4) {
        case 0x24:
          goto switchD_0013f1d7_caseD_22;
        case 0x26:
          goto switchD_0013f1d7_caseD_24;
        case 0x2a:
          goto switchD_0013f1d7_caseD_28;
        case 0x2c:
          goto switchD_0013f1d7_caseD_2a;
        }
      }
      else {
        if (uVar4 == 0x6c) goto switchD_0013f225_caseD_6c;
        if (uVar4 == 0x6a) goto switchD_0013f225_caseD_6a;
        if (uVar4 == 0x68) goto switchD_0013f225_caseD_68;
      }
      goto switchD_0013f731_caseD_f;
    case 0x66:
switchD_0013f225_caseD_68:
      snprintf(buf,buflen,"ASN1 - Data is invalid. (not used)");
      if (uVar4 < 0x24) {
        switch(uVar3) {
        case 0:
          goto switchD_0013f1d7_caseD_0;
        case 2:
          goto switchD_0013f1d7_caseD_2;
        case 4:
          goto switchD_0013f1d7_caseD_4;
        case 6:
          goto switchD_0013f1d7_caseD_6;
        case 8:
          goto switchD_0013f1d7_caseD_8;
        case 10:
          goto switchD_0013f1d7_caseD_a;
        case 0xc:
          goto switchD_0013f1d7_caseD_c;
        case 0xe:
          goto switchD_0013f1d7_caseD_e;
        case 0x14:
          goto switchD_0013f1d7_caseD_14;
        case 0x16:
          goto switchD_0013f1d7_caseD_16;
        }
      }
      else {
        switch(uVar4) {
        case 0x24:
          goto switchD_0013f1d7_caseD_22;
        case 0x25:
        case 0x27:
        case 0x28:
        case 0x29:
        case 0x2b:
          break;
        case 0x26:
          goto switchD_0013f1d7_caseD_24;
        case 0x2a:
          goto switchD_0013f1d7_caseD_28;
        case 0x2c:
          goto switchD_0013f1d7_caseD_2a;
        default:
          if (uVar4 == 0x6c) goto switchD_0013f225_caseD_6c;
          if (uVar4 == 0x6a) goto switchD_0013f225_caseD_6a;
        }
      }
      goto code_r0x0013f8a1;
    case 0x68:
switchD_0013f225_caseD_6a:
      snprintf(buf,buflen,"ASN1 - Memory allocation failed");
      if (uVar4 < 0x24) {
        switch(uVar3) {
        case 0:
          goto switchD_0013f1d7_caseD_0;
        case 2:
          goto switchD_0013f1d7_caseD_2;
        case 4:
          goto switchD_0013f1d7_caseD_4;
        case 6:
          goto switchD_0013f1d7_caseD_6;
        case 8:
          goto switchD_0013f1d7_caseD_8;
        case 10:
          goto switchD_0013f1d7_caseD_a;
        case 0xc:
          goto switchD_0013f1d7_caseD_c;
        case 0xe:
          goto switchD_0013f1d7_caseD_e;
        case 0x14:
          goto switchD_0013f1d7_caseD_14;
        case 0x16:
          goto switchD_0013f1d7_caseD_16;
        }
      }
      else if (uVar4 < 0x2c) {
        if (uVar4 == 0x24) goto switchD_0013f1d7_caseD_22;
        if (uVar4 == 0x2a) goto switchD_0013f1d7_caseD_28;
      }
      else {
        if (uVar4 == 0x2c) goto switchD_0013f1d7_caseD_2a;
        if (uVar4 == 0x6c) goto switchD_0013f225_caseD_6c;
      }
      goto code_r0x0013f874;
    case 0x6a:
switchD_0013f225_caseD_6c:
      snprintf(buf,buflen,"ASN1 - Buffer too small when writing ASN.1 data structure");
      switch(uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) {
      case 0:
        goto switchD_0013f1d7_caseD_0;
      case 1:
        goto switchD_0013f1d7_caseD_2;
      case 2:
        goto switchD_0013f1d7_caseD_4;
      case 3:
        goto switchD_0013f1d7_caseD_6;
      case 4:
        goto switchD_0013f1d7_caseD_8;
      case 5:
        goto switchD_0013f1d7_caseD_a;
      case 6:
        goto switchD_0013f1d7_caseD_c;
      case 7:
        goto switchD_0013f1d7_caseD_e;
      case 10:
        goto switchD_0013f1d7_caseD_14;
      case 0xb:
        goto switchD_0013f1d7_caseD_16;
      case 0x14:
        goto switchD_0013f1d7_caseD_28;
      case 0x15:
        goto switchD_0013f1d7_caseD_2a;
      }
      break;
    }
  case 0x20:
switchD_0013f1d7_caseD_20:
    snprintf(buf,buflen,"AES - Invalid data input length");
    switch(uVar3) {
    case 0:
      goto switchD_0013f1d7_caseD_0;
    case 1:
      goto switchD_0013f1d7_caseD_1;
    case 2:
      goto switchD_0013f1d7_caseD_2;
    case 3:
      goto switchD_0013f1d7_caseD_3;
    case 4:
      goto switchD_0013f1d7_caseD_4;
    case 5:
      goto switchD_0013f1d7_caseD_5;
    case 6:
      goto switchD_0013f1d7_caseD_6;
    case 7:
      goto switchD_0013f1d7_caseD_7;
    case 8:
      goto switchD_0013f1d7_caseD_8;
    case 9:
    case 0xf:
    case 0x11:
    case 0x13:
    case 0x15:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x29:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x31:
    case 0x33:
    case 0x35:
    case 0x37:
    case 0x39:
    case 0x3f:
    case 0x41:
    case 0x43:
      break;
    case 10:
      goto switchD_0013f1d7_caseD_a;
    case 0xb:
      goto switchD_0013f1d7_caseD_b;
    case 0xc:
      goto switchD_0013f1d7_caseD_c;
    case 0xd:
      goto switchD_0013f1d7_caseD_d;
    case 0xe:
      goto switchD_0013f1d7_caseD_e;
    case 0x10:
      goto switchD_0013f1d7_caseD_10;
    case 0x12:
      goto switchD_0013f1d7_caseD_12;
    case 0x14:
      goto switchD_0013f1d7_caseD_14;
    case 0x16:
      goto switchD_0013f1d7_caseD_16;
    case 0x22:
      goto switchD_0013f1d7_caseD_22;
    case 0x24:
      goto switchD_0013f1d7_caseD_24;
    case 0x28:
      goto switchD_0013f1d7_caseD_28;
    case 0x2a:
      goto switchD_0013f1d7_caseD_2a;
    case 0x30:
      goto switchD_0013f1d7_caseD_30;
    case 0x32:
      goto switchD_0013f1d7_caseD_32;
    case 0x34:
      goto switchD_0013f1d7_caseD_34;
    case 0x36:
      goto switchD_0013f1d7_caseD_36;
    case 0x38:
      goto switchD_0013f1d7_caseD_38;
    case 0x3a:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3b:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3d;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3e;
    case 0x40:
      goto switchD_0013f1d7_caseD_40;
    case 0x42:
      goto switchD_0013ff41_caseD_44;
    case 0x44:
      goto switchD_0013ff41_caseD_46;
    default:
      switch(uVar4) {
      case 0x60:
        goto switchD_0013f225_caseD_60;
      case 0x62:
        goto switchD_0013f225_caseD_62;
      case 100:
        goto switchD_0013f225_caseD_64;
      case 0x66:
        goto switchD_0013f225_caseD_66;
      case 0x68:
        goto switchD_0013f225_caseD_68;
      case 0x6a:
        goto switchD_0013f225_caseD_6a;
      case 0x6c:
        goto switchD_0013f225_caseD_6c;
      }
    }
    goto switchD_0013f2af_caseD_9;
  case 0x22:
    goto switchD_0013f1d7_caseD_22;
  case 0x24:
    goto switchD_0013f1d7_caseD_24;
  case 0x28:
switchD_0013f1d7_caseD_28:
    snprintf(buf,buflen,"BASE64 - Output buffer too small");
    switch(uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) {
    case 0:
      goto switchD_0013f1d7_caseD_0;
    case 1:
      goto switchD_0013f1d7_caseD_2;
    case 2:
      goto switchD_0013f1d7_caseD_4;
    case 3:
      goto switchD_0013f1d7_caseD_6;
    case 4:
      goto switchD_0013f1d7_caseD_8;
    case 5:
      goto switchD_0013f1d7_caseD_a;
    case 6:
      goto switchD_0013f1d7_caseD_c;
    case 7:
      goto switchD_0013f1d7_caseD_e;
    default:
      break;
    case 10:
      goto switchD_0013f1d7_caseD_14;
    case 0xb:
      goto switchD_0013f1d7_caseD_16;
    case 0x15:
      goto switchD_0013f1d7_caseD_2a;
    }
  case 0x2a:
switchD_0013f1d7_caseD_2a:
    snprintf(buf,buflen,"BASE64 - Invalid character in input");
    switch(uVar3) {
    case 0:
      goto switchD_0013f1d7_caseD_0;
    default:
      break;
    case 2:
      goto switchD_0013f1d7_caseD_2;
    case 4:
      goto switchD_0013f1d7_caseD_4;
    case 6:
      goto switchD_0013f1d7_caseD_6;
    case 8:
      goto switchD_0013f1d7_caseD_8;
    case 10:
      goto switchD_0013f1d7_caseD_a;
    case 0xc:
      goto switchD_0013f1d7_caseD_c;
    case 0xe:
      goto switchD_0013f1d7_caseD_e;
    case 0x14:
      goto switchD_0013f1d7_caseD_14;
    case 0x16:
      goto switchD_0013f1d7_caseD_16;
    }
  case 0x30:
    goto switchD_0013f1d7_caseD_30;
  case 0x32:
    goto switchD_0013f1d7_caseD_32;
  case 0x34:
    goto switchD_0013f1d7_caseD_34;
  case 0x36:
    goto switchD_0013f1d7_caseD_36;
  case 0x38:
    goto switchD_0013f1d7_caseD_38;
  case 0x3a:
    goto switchD_0013f1d7_caseD_3a;
  case 0x3b:
    goto switchD_0013f1d7_caseD_3b;
  case 0x3c:
    goto switchD_0013f1d7_caseD_3c;
  case 0x3d:
    goto switchD_0013f1d7_caseD_3d;
  case 0x3e:
    goto switchD_0013f1d7_caseD_3e;
  case 0x40:
    goto switchD_0013f1d7_caseD_40;
  default:
    switch(uVar4) {
    case 0x60:
      goto switchD_0013f225_caseD_60;
    case 0x62:
      goto switchD_0013f225_caseD_62;
    case 100:
      goto switchD_0013f225_caseD_64;
    case 0x66:
      goto switchD_0013f225_caseD_66;
    case 0x68:
      goto switchD_0013f225_caseD_68;
    case 0x6a:
      goto switchD_0013f225_caseD_6a;
    case 0x6c:
      goto switchD_0013f225_caseD_6c;
    }
    goto switchD_0013f1d7_caseD_9;
  }
  switch(uVar4) {
  case 0x24:
switchD_0013f1d7_caseD_22:
    snprintf(buf,buflen,"CAMELLIA - Invalid key length");
code_r0x0013f874:
    switch(uVar4) {
    case 0x26:
      goto switchD_0013f1d7_caseD_24;
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x33:
    case 0x35:
    case 0x37:
    case 0x39:
    case 0x3b:
    case 0x41:
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x49:
    case 0x4b:
      break;
    case 0x32:
      goto switchD_0013f1d7_caseD_30;
    case 0x34:
      goto switchD_0013f1d7_caseD_32;
    case 0x36:
      goto switchD_0013f1d7_caseD_34;
    case 0x38:
      goto switchD_0013f1d7_caseD_36;
    case 0x3a:
      goto switchD_0013f1d7_caseD_38;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3f:
      goto switchD_0013f1d7_caseD_3d;
    case 0x40:
      goto switchD_0013f1d7_caseD_3e;
    case 0x42:
      goto switchD_0013f1d7_caseD_40;
    case 0x44:
      goto switchD_0013ff41_caseD_44;
    case 0x46:
      goto switchD_0013ff41_caseD_46;
    case 0x48:
      goto switchD_0013ff41_caseD_48;
    case 0x4a:
      goto switchD_0013ff41_caseD_4a;
    case 0x4c:
      goto switchD_0013ff41_caseD_4c;
    default:
      switch(uVar4) {
      case 3:
        goto switchD_0013f1d7_caseD_1;
      case 5:
        goto switchD_0013f1d7_caseD_3;
      case 7:
        goto switchD_0013f1d7_caseD_5;
      case 9:
        goto switchD_0013f1d7_caseD_7;
      case 0xd:
        goto switchD_0013f1d7_caseD_b;
      case 0xf:
        goto switchD_0013f1d7_caseD_d;
      case 0x12:
        goto switchD_0013f1d7_caseD_10;
      case 0x14:
        goto switchD_0013f1d7_caseD_12;
      }
    }
    goto switchD_0013f882_caseD_27;
  case 0x25:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x33:
  case 0x35:
  case 0x37:
  case 0x39:
  case 0x3b:
  case 0x41:
    goto switchD_0013f1d7_caseD_9;
  case 0x26:
switchD_0013f1d7_caseD_24:
    snprintf(buf,buflen,"CAMELLIA - Invalid data input length");
code_r0x0013f8a1:
    switch(uVar4) {
    case 0x32:
      goto switchD_0013f1d7_caseD_30;
    case 0x33:
    case 0x35:
    case 0x37:
    case 0x39:
    case 0x3b:
    case 0x41:
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x49:
    case 0x4b:
    case 0x4d:
      break;
    case 0x34:
      goto switchD_0013f1d7_caseD_32;
    case 0x36:
      goto switchD_0013f1d7_caseD_34;
    case 0x38:
      goto switchD_0013f1d7_caseD_36;
    case 0x3a:
      goto switchD_0013f1d7_caseD_38;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3f:
      goto switchD_0013f1d7_caseD_3d;
    case 0x40:
      goto switchD_0013f1d7_caseD_3e;
    case 0x42:
      goto switchD_0013f1d7_caseD_40;
    case 0x44:
      goto switchD_0013ff41_caseD_44;
    case 0x46:
      goto switchD_0013ff41_caseD_46;
    case 0x48:
      goto switchD_0013ff41_caseD_48;
    case 0x4a:
      goto switchD_0013ff41_caseD_4a;
    case 0x4c:
      goto switchD_0013ff41_caseD_4c;
    case 0x4e:
      goto switchD_0013ff41_caseD_4e;
    default:
      switch(uVar4) {
      case 3:
        goto switchD_0013f1d7_caseD_1;
      case 5:
        goto switchD_0013f1d7_caseD_3;
      case 7:
        goto switchD_0013f1d7_caseD_5;
      case 9:
        goto switchD_0013f1d7_caseD_7;
      case 0xd:
        goto switchD_0013f1d7_caseD_b;
      case 0xf:
        goto switchD_0013f1d7_caseD_d;
      case 0x12:
        goto switchD_0013f1d7_caseD_10;
      case 0x14:
        goto switchD_0013f1d7_caseD_12;
      }
    }
    goto switchD_0013f8af_caseD_33;
  case 0x32:
switchD_0013f1d7_caseD_30:
    snprintf(buf,buflen,"DES - The data input has an invalid length");
    if (uVar4 < 0x14) goto LAB_0013fac7;
    switch(uVar4) {
    case 0x3c:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3f:
      goto switchD_0013f1d7_caseD_3d;
    case 0x40:
      goto switchD_0013f1d7_caseD_3e;
    }
switchD_0013fb05_default:
    if (uVar4 == 0x14) goto switchD_0013f1d7_caseD_12;
    goto LAB_0013fe2b;
  case 0x34:
switchD_0013f1d7_caseD_32:
    snprintf(buf,buflen,"CTR_DRBG - The entropy source failed");
switchD_0013f42f_caseD_1:
    if (uVar4 < 0x28) {
      switch(uVar4) {
      case 3:
        goto switchD_0013f1d7_caseD_1;
      case 4:
      case 6:
      case 8:
      case 10:
        goto switchD_0013ff41_caseD_47;
      case 5:
        goto switchD_0013f1d7_caseD_3;
      case 7:
        goto switchD_0013f1d7_caseD_5;
      case 9:
        goto switchD_0013f1d7_caseD_7;
      case 0xb:
        goto switchD_0013fddc_caseD_b;
      default:
        goto switchD_0013fd0e_default;
      }
    }
    switch(uVar4) {
    case 0x28:
      goto switchD_0013fa74_caseD_28;
    default:
      goto switchD_0013ff41_caseD_47;
    case 0x2e:
      goto switchD_0013fa74_caseD_2e;
    case 0x30:
      goto switchD_0013fa74_caseD_30;
    case 0x32:
      goto switchD_0013f1d7_caseD_30;
    case 0x36:
      goto switchD_0013f1d7_caseD_34;
    case 0x38:
      goto switchD_0013f1d7_caseD_36;
    case 0x3a:
      goto switchD_0013f1d7_caseD_38;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3f:
      goto switchD_0013f1d7_caseD_3d;
    case 0x40:
      goto switchD_0013f1d7_caseD_3e;
    case 0x42:
      goto switchD_0013f1d7_caseD_40;
    case 0x43:
      goto switchD_0013ff41_caseD_43;
    case 0x44:
      goto switchD_0013ff41_caseD_44;
    case 0x45:
      goto switchD_0013ff41_caseD_45;
    case 0x46:
      goto switchD_0013ff41_caseD_46;
    case 0x48:
      goto switchD_0013ff41_caseD_48;
    case 0x4a:
      goto switchD_0013ff41_caseD_4a;
    case 0x4c:
      goto switchD_0013ff41_caseD_4c;
    case 0x4e:
      goto switchD_0013ff41_caseD_4e;
    case 0x50:
      goto switchD_0013ff41_caseD_50;
    case 0x52:
      goto switchD_0013ff41_caseD_52;
    }
  case 0x36:
switchD_0013f1d7_caseD_34:
    snprintf(buf,buflen,"CTR_DRBG - Too many random requested in single call");
    switch(uVar4) {
    case 0x32:
      goto switchD_0013f1d7_caseD_30;
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x39:
    case 0x3b:
      goto switchD_0013fa39_caseD_33;
    case 0x38:
      goto switchD_0013f1d7_caseD_36;
    case 0x3a:
      goto switchD_0013f1d7_caseD_38;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3f:
      goto switchD_0013f1d7_caseD_3d;
    case 0x40:
      goto switchD_0013f1d7_caseD_3e;
    default:
      goto switchD_0013fa39_default;
    }
  case 0x38:
switchD_0013f1d7_caseD_36:
    snprintf(buf,buflen,"CTR_DRBG - Input too large (Entropy + additional)");
    switch(uVar4) {
    case 0x32:
      goto switchD_0013f1d7_caseD_30;
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3b:
      break;
    case 0x3a:
      goto switchD_0013f1d7_caseD_38;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3f:
      goto switchD_0013f1d7_caseD_3d;
    case 0x40:
      goto switchD_0013f1d7_caseD_3e;
    default:
switchD_0013fa39_default:
      if (uVar4 == 0x12) goto switchD_0013f1d7_caseD_10;
      if (uVar4 == 0x14) goto switchD_0013f1d7_caseD_12;
    }
    goto switchD_0013fa39_caseD_33;
  case 0x3a:
switchD_0013f1d7_caseD_38:
    snprintf(buf,buflen,"CTR_DRBG - Read/write error in file");
switchD_0013f3d1_caseD_35:
    if (uVar4 < 0x28) {
      switch(uVar4) {
      case 3:
        goto switchD_0013f1d7_caseD_1;
      case 4:
      case 6:
      case 8:
      case 10:
        goto switchD_0013ff41_caseD_47;
      case 5:
        goto switchD_0013f1d7_caseD_3;
      case 7:
        goto switchD_0013f1d7_caseD_5;
      case 9:
        goto switchD_0013f1d7_caseD_7;
      case 0xb:
        goto switchD_0013fddc_caseD_b;
      default:
switchD_0013fd0e_default:
        if (uVar4 == 0x12) goto switchD_0013f1d7_caseD_10;
        if (uVar4 != 0x14) goto switchD_0013ff41_caseD_47;
        goto switchD_0013f1d7_caseD_12;
      }
    }
    switch(uVar4) {
    case 0x28:
      goto switchD_0013fa74_caseD_28;
    default:
      goto switchD_0013ff41_caseD_47;
    case 0x2e:
      goto switchD_0013fa74_caseD_2e;
    case 0x30:
      goto switchD_0013fa74_caseD_30;
    case 0x32:
      goto switchD_0013f1d7_caseD_30;
    case 0x3c:
      goto switchD_0013f1d7_caseD_3a;
    case 0x3d:
      goto switchD_0013f1d7_caseD_3b;
    case 0x3e:
      goto switchD_0013f1d7_caseD_3c;
    case 0x3f:
      goto switchD_0013f1d7_caseD_3d;
    case 0x40:
      goto switchD_0013f1d7_caseD_3e;
    case 0x42:
      goto switchD_0013f1d7_caseD_40;
    case 0x43:
      goto switchD_0013ff41_caseD_43;
    case 0x44:
      goto switchD_0013ff41_caseD_44;
    case 0x45:
      goto switchD_0013ff41_caseD_45;
    case 0x46:
      goto switchD_0013ff41_caseD_46;
    case 0x48:
      goto switchD_0013ff41_caseD_48;
    case 0x4a:
      goto switchD_0013ff41_caseD_4a;
    case 0x4c:
      goto switchD_0013ff41_caseD_4c;
    case 0x4e:
      goto switchD_0013ff41_caseD_4e;
    case 0x50:
      goto switchD_0013ff41_caseD_50;
    case 0x52:
      goto switchD_0013ff41_caseD_52;
    }
  case 0x3c:
switchD_0013f1d7_caseD_3a:
    snprintf(buf,buflen,"ENTROPY - Critical entropy source failure");
    if (0x13 < uVar4) {
      switch(uVar4) {
      case 0x3d:
        goto switchD_0013f1d7_caseD_3b;
      case 0x3e:
        goto switchD_0013f1d7_caseD_3c;
      case 0x3f:
        goto switchD_0013f1d7_caseD_3d;
      case 0x40:
        goto switchD_0013f1d7_caseD_3e;
      default:
        goto switchD_0013fb05_default;
      }
    }
LAB_0013fac7:
    if (uVar4 == 3) goto switchD_0013f1d7_caseD_1;
    if (uVar4 == 5) goto switchD_0013f1d7_caseD_3;
    if (uVar4 == 0x12) goto switchD_0013f1d7_caseD_10;
LAB_0013fe2b:
    if (0x2d < uVar4) {
      switch(uVar4) {
      case 0x42:
        goto switchD_0013f1d7_caseD_40;
      case 0x43:
        goto switchD_0013ff41_caseD_43;
      case 0x44:
        goto switchD_0013ff41_caseD_44;
      case 0x45:
        goto switchD_0013ff41_caseD_45;
      case 0x46:
        goto switchD_0013ff41_caseD_46;
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_0013ff41_caseD_47;
      case 0x48:
        goto switchD_0013ff41_caseD_48;
      case 0x4a:
        goto switchD_0013ff41_caseD_4a;
      case 0x4c:
        goto switchD_0013ff41_caseD_4c;
      case 0x4e:
        goto switchD_0013ff41_caseD_4e;
      case 0x50:
        goto switchD_0013ff41_caseD_50;
      case 0x52:
        goto switchD_0013ff41_caseD_52;
      default:
        goto switchD_0013fec1_default;
      }
    }
    if (uVar4 < 0xb) {
      if (uVar4 == 7) {
switchD_0013f1d7_caseD_5:
        snprintf(buf,buflen,"HMAC_DRBG - Read/write error in file");
        break;
      }
      if (uVar4 != 9) goto switchD_0013ff41_caseD_47;
      goto switchD_0013f1d7_caseD_7;
    }
    goto LAB_001401a6;
  case 0x3d:
switchD_0013f1d7_caseD_3b:
    snprintf(buf,buflen,"ENTROPY - No strong sources have been added to poll");
    if (uVar4 < 0x12) {
      switch(uVar4) {
      case 3:
        goto switchD_0013f1d7_caseD_1;
      case 5:
        goto switchD_0013f1d7_caseD_3;
      case 7:
        goto switchD_0013f1d7_caseD_5;
      case 9:
        goto switchD_0013f1d7_caseD_7;
      }
    }
    else {
      if (uVar4 == 0x12) goto switchD_0013f1d7_caseD_10;
      if (uVar4 == 0x14) goto switchD_0013f1d7_caseD_12;
      if (uVar4 == 0x3f) goto switchD_0013f1d7_caseD_3d;
    }
    goto switchD_0013fc59_caseD_4;
  case 0x3e:
switchD_0013f1d7_caseD_3c:
    snprintf(buf,buflen,"ENTROPY - No more sources can be added");
    if (uVar4 < 0x14) {
      if (uVar4 < 7) {
        if (uVar4 == 3) goto switchD_0013f1d7_caseD_1;
        if (uVar4 == 5) goto switchD_0013f1d7_caseD_3;
      }
      else {
        if (uVar4 == 7) goto switchD_0013f1d7_caseD_5;
        if (uVar4 == 0x12) goto switchD_0013f1d7_caseD_10;
      }
    }
    else {
      if (0x3e < uVar4) {
        if (uVar4 != 0x3f) {
          if (uVar4 != 0x40) break;
          goto switchD_0013f1d7_caseD_3e;
        }
        goto switchD_0013f1d7_caseD_3d;
      }
      if (uVar4 == 0x14) goto switchD_0013f1d7_caseD_12;
LAB_0013fc1a:
      if (uVar4 == 0x3d) goto switchD_0013f1d7_caseD_3b;
    }
    break;
  case 0x3f:
switchD_0013f1d7_caseD_3d:
    snprintf(buf,buflen,"ENTROPY - Read/write error in file");
switchD_0013f253_caseD_1:
    if (0x2d < uVar4) {
      switch(uVar4) {
      case 0x42:
        goto switchD_0013f1d7_caseD_40;
      case 0x43:
        goto switchD_0013ff41_caseD_43;
      case 0x44:
        goto switchD_0013ff41_caseD_44;
      case 0x45:
        goto switchD_0013ff41_caseD_45;
      case 0x46:
        goto switchD_0013ff41_caseD_46;
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_0013ff41_caseD_47;
      case 0x48:
        goto switchD_0013ff41_caseD_48;
      case 0x4a:
        goto switchD_0013ff41_caseD_4a;
      case 0x4c:
        goto switchD_0013ff41_caseD_4c;
      case 0x4e:
        goto switchD_0013ff41_caseD_4e;
      case 0x50:
        goto switchD_0013ff41_caseD_50;
      case 0x52:
        goto switchD_0013ff41_caseD_52;
      default:
        goto switchD_0013fec1_default;
      }
    }
    if (uVar4 < 0x12) {
      switch(uVar4) {
      case 3:
switchD_0013f1d7_caseD_1:
        snprintf(buf,buflen,"HMAC_DRBG - Too many random requested in single call");
        if (uVar4 < 0x42) {
          if (uVar4 == 5) goto switchD_0013f1d7_caseD_3;
          if (uVar4 == 7) goto switchD_0013f1d7_caseD_5;
          if (uVar4 == 9) goto switchD_0013f1d7_caseD_7;
        }
        else {
          if (uVar4 == 0x42) goto switchD_0013f1d7_caseD_40;
          if (uVar4 == 0x44) goto switchD_0013ff41_caseD_44;
          if (uVar4 == 0x46) goto switchD_0013ff41_caseD_46;
        }
        goto switchD_0013f2af_caseD_9;
      default:
        goto switchD_0013ff41_caseD_47;
      case 5:
switchD_0013f1d7_caseD_3:
        snprintf(buf,buflen,"HMAC_DRBG - Input too large (Entropy + additional)");
        goto LAB_0013fe2b;
      case 7:
        goto switchD_0013f1d7_caseD_5;
      case 9:
        goto switchD_0013f1d7_caseD_7;
      case 0xb:
        goto switchD_0013fddc_caseD_b;
      }
    }
    if (uVar4 == 0x12) {
switchD_0013f1d7_caseD_10:
      snprintf(buf,buflen,"GCM - Authenticated decryption failed");
      switch(uVar4) {
      case 3:
        goto switchD_0013f1d7_caseD_1;
      case 4:
      case 6:
      case 8:
        break;
      case 5:
        goto switchD_0013f1d7_caseD_3;
      case 7:
        goto switchD_0013f1d7_caseD_5;
      case 9:
        goto switchD_0013f1d7_caseD_7;
      default:
        if (uVar4 == 0x42) goto switchD_0013f1d7_caseD_40;
        if (uVar4 == 0x14) goto switchD_0013f1d7_caseD_12;
      }
      goto switchD_0013f1d7_caseD_9;
    }
    if (uVar4 == 0x14) {
switchD_0013f1d7_caseD_12:
      snprintf(buf,buflen,"GCM - Bad input parameters to function");
switchD_0013fa39_caseD_33:
      if (uVar4 < 0x30) {
        switch(uVar4) {
        case 3:
          goto switchD_0013f1d7_caseD_1;
        case 4:
        case 6:
        case 8:
        case 10:
          goto switchD_0013ff41_caseD_47;
        case 5:
          goto switchD_0013f1d7_caseD_3;
        case 7:
          goto switchD_0013f1d7_caseD_5;
        case 9:
          goto switchD_0013f1d7_caseD_7;
        case 0xb:
          goto switchD_0013fddc_caseD_b;
        }
        goto switchD_0013fddc_default;
      }
      switch(uVar4) {
      case 0x42:
        goto switchD_0013f1d7_caseD_40;
      case 0x43:
        goto switchD_0013ff41_caseD_43;
      case 0x44:
        goto switchD_0013ff41_caseD_44;
      case 0x45:
        goto switchD_0013ff41_caseD_45;
      case 0x46:
        goto switchD_0013ff41_caseD_46;
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_0013ff41_caseD_47;
      case 0x48:
        goto switchD_0013ff41_caseD_48;
      case 0x4a:
        goto switchD_0013ff41_caseD_4a;
      case 0x4c:
        goto switchD_0013ff41_caseD_4c;
      case 0x4e:
        goto switchD_0013ff41_caseD_4e;
      case 0x50:
        goto switchD_0013ff41_caseD_50;
      case 0x52:
        goto switchD_0013ff41_caseD_52;
      }
      goto switchD_0013ff41_default;
    }
    goto LAB_00140214;
  case 0x40:
switchD_0013f1d7_caseD_3e:
    snprintf(buf,buflen,"ENTROPY - No sources have been added to poll");
    if (uVar4 < 0x12) {
      if (uVar4 == 3) goto switchD_0013f1d7_caseD_1;
      if (uVar4 == 5) goto switchD_0013f1d7_caseD_3;
      if (uVar4 == 7) goto switchD_0013f1d7_caseD_5;
    }
    else {
      if (0x3c < uVar4) {
        if (uVar4 != 0x3f) goto LAB_0013fc1a;
        goto switchD_0013f1d7_caseD_3d;
      }
      if (uVar4 == 0x12) goto switchD_0013f1d7_caseD_10;
      if (uVar4 == 0x14) goto switchD_0013f1d7_caseD_12;
    }
    break;
  case 0x42:
    goto switchD_0013f1d7_caseD_40;
  default:
    switch(uVar4) {
    case 3:
      goto switchD_0013f1d7_caseD_1;
    default:
      goto switchD_0013f1d7_caseD_9;
    case 5:
      goto switchD_0013f1d7_caseD_3;
    case 7:
      goto switchD_0013f1d7_caseD_5;
    case 9:
      goto switchD_0013f1d7_caseD_7;
    case 0xd:
switchD_0013f1d7_caseD_b:
      snprintf(buf,buflen,"CCM - Bad input parameters to function");
switchD_0013f731_caseD_f:
      if (uVar4 < 0x14) {
        switch(uVar4) {
        case 3:
          goto switchD_0013f1d7_caseD_1;
        case 4:
        case 6:
        case 8:
          break;
        case 5:
          goto switchD_0013f1d7_caseD_3;
        case 7:
          goto switchD_0013f1d7_caseD_5;
        case 9:
          goto switchD_0013f1d7_caseD_7;
        default:
          if (uVar4 == 0xf) goto switchD_0013f1d7_caseD_d;
          if (uVar4 == 0x12) goto switchD_0013f1d7_caseD_10;
        }
      }
      else {
        switch(uVar4) {
        case 0x32:
          goto switchD_0013f1d7_caseD_30;
        case 0x33:
        case 0x35:
        case 0x37:
        case 0x39:
        case 0x3b:
        case 0x41:
        case 0x43:
        case 0x45:
        case 0x47:
        case 0x49:
        case 0x4b:
        case 0x4d:
        case 0x4f:
          break;
        case 0x34:
          goto switchD_0013f1d7_caseD_32;
        case 0x36:
          goto switchD_0013f1d7_caseD_34;
        case 0x38:
          goto switchD_0013f1d7_caseD_36;
        case 0x3a:
          goto switchD_0013f1d7_caseD_38;
        case 0x3c:
          goto switchD_0013f1d7_caseD_3a;
        case 0x3d:
          goto switchD_0013f1d7_caseD_3b;
        case 0x3e:
          goto switchD_0013f1d7_caseD_3c;
        case 0x3f:
          goto switchD_0013f1d7_caseD_3d;
        case 0x40:
          goto switchD_0013f1d7_caseD_3e;
        case 0x42:
          goto switchD_0013f1d7_caseD_40;
        case 0x44:
          goto switchD_0013ff41_caseD_44;
        case 0x46:
          goto switchD_0013ff41_caseD_46;
        case 0x48:
          goto switchD_0013ff41_caseD_48;
        case 0x4a:
          goto switchD_0013ff41_caseD_4a;
        case 0x4c:
          goto switchD_0013ff41_caseD_4c;
        case 0x4e:
          goto switchD_0013ff41_caseD_4e;
        case 0x50:
          goto switchD_0013ff41_caseD_50;
        default:
          if (uVar4 == 0x14) goto switchD_0013f1d7_caseD_12;
        }
      }
      break;
    case 0xf:
switchD_0013f1d7_caseD_d:
      snprintf(buf,buflen,"CCM - Authenticated decryption failed");
code_r0x0013f98e:
      switch(uVar4) {
      case 0x12:
        goto switchD_0013f1d7_caseD_10;
      case 0x13:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2f:
      case 0x31:
      case 0x33:
      case 0x35:
      case 0x37:
      case 0x39:
      case 0x3b:
      case 0x41:
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_0013ff41_caseD_47;
      case 0x14:
        goto switchD_0013f1d7_caseD_12;
      case 0x28:
        goto switchD_0013fa74_caseD_28;
      case 0x2e:
        goto switchD_0013fa74_caseD_2e;
      case 0x30:
        goto switchD_0013fa74_caseD_30;
      case 0x32:
        goto switchD_0013f1d7_caseD_30;
      case 0x34:
        goto switchD_0013f1d7_caseD_32;
      case 0x36:
        goto switchD_0013f1d7_caseD_34;
      case 0x38:
        goto switchD_0013f1d7_caseD_36;
      case 0x3a:
        goto switchD_0013f1d7_caseD_38;
      case 0x3c:
        goto switchD_0013f1d7_caseD_3a;
      case 0x3d:
        goto switchD_0013f1d7_caseD_3b;
      case 0x3e:
        goto switchD_0013f1d7_caseD_3c;
      case 0x3f:
        goto switchD_0013f1d7_caseD_3d;
      case 0x40:
        goto switchD_0013f1d7_caseD_3e;
      case 0x42:
        goto switchD_0013f1d7_caseD_40;
      case 0x43:
        goto switchD_0013ff41_caseD_43;
      case 0x44:
        goto switchD_0013ff41_caseD_44;
      case 0x45:
        goto switchD_0013ff41_caseD_45;
      case 0x46:
        goto switchD_0013ff41_caseD_46;
      case 0x48:
        goto switchD_0013ff41_caseD_48;
      case 0x4a:
        goto switchD_0013ff41_caseD_4a;
      case 0x4c:
        goto switchD_0013ff41_caseD_4c;
      case 0x4e:
        goto switchD_0013ff41_caseD_4e;
      case 0x50:
        goto switchD_0013ff41_caseD_50;
      case 0x52:
        goto switchD_0013ff41_caseD_52;
      default:
        switch(uVar4) {
        case 3:
          goto switchD_0013f1d7_caseD_1;
        default:
          goto switchD_0013ff41_caseD_47;
        case 5:
          goto switchD_0013f1d7_caseD_3;
        case 7:
          goto switchD_0013f1d7_caseD_5;
        case 9:
          goto switchD_0013f1d7_caseD_7;
        case 0xb:
          goto switchD_0013fddc_caseD_b;
        }
      }
    case 0x12:
      goto switchD_0013f1d7_caseD_10;
    case 0x14:
      goto switchD_0013f1d7_caseD_12;
    }
    goto switchD_0013f93d_caseD_33;
  }
  if (uVar4 < 0x2e) {
    if (uVar4 == 9) {
switchD_0013f1d7_caseD_7:
      snprintf(buf,buflen,"HMAC_DRBG - The entropy source failed");
switchD_0013fc59_caseD_4:
      if (0x2f < uVar4) {
        switch(uVar4) {
        case 0x42:
          goto switchD_0013f1d7_caseD_40;
        case 0x43:
          goto switchD_0013ff41_caseD_43;
        case 0x44:
          goto switchD_0013ff41_caseD_44;
        case 0x45:
          goto switchD_0013ff41_caseD_45;
        case 0x46:
          goto switchD_0013ff41_caseD_46;
        case 0x47:
        case 0x49:
        case 0x4b:
        case 0x4d:
        case 0x4f:
        case 0x51:
          goto switchD_0013ff41_caseD_47;
        case 0x48:
          goto switchD_0013ff41_caseD_48;
        case 0x4a:
          goto switchD_0013ff41_caseD_4a;
        case 0x4c:
          goto switchD_0013ff41_caseD_4c;
        case 0x4e:
          goto switchD_0013ff41_caseD_4e;
        case 0x50:
          goto switchD_0013ff41_caseD_50;
        case 0x52:
          goto switchD_0013ff41_caseD_52;
        default:
          goto switchD_0013ff41_default;
        }
      }
      goto LAB_0014012d;
    }
    goto LAB_001401a6;
  }
  switch(uVar4) {
  case 0x42:
switchD_0013f1d7_caseD_40:
    snprintf(buf,buflen,"NET - Failed to open a socket");
switchD_0013f1d7_caseD_9:
    if (uVar4 < 0x30) goto LAB_0014012d;
    switch(uVar4) {
    case 0x43:
      goto switchD_0013ff41_caseD_43;
    case 0x44:
      goto switchD_0013ff41_caseD_44;
    case 0x45:
      goto switchD_0013ff41_caseD_45;
    case 0x46:
      goto switchD_0013ff41_caseD_46;
    case 0x47:
    case 0x49:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x51:
      goto switchD_0013ff41_caseD_47;
    case 0x48:
      goto switchD_0013ff41_caseD_48;
    case 0x4a:
      goto switchD_0013ff41_caseD_4a;
    case 0x4c:
      goto switchD_0013ff41_caseD_4c;
    case 0x4e:
      goto switchD_0013ff41_caseD_4e;
    case 0x50:
      goto switchD_0013ff41_caseD_50;
    case 0x52:
      goto switchD_0013ff41_caseD_52;
    }
    goto switchD_0013ff41_default;
  case 0x43:
    goto switchD_0013ff41_caseD_43;
  case 0x44:
switchD_0013ff41_caseD_44:
    snprintf(buf,buflen,"NET - The connection to the given server / port failed");
    switch(uVar4) {
    case 0x43:
      goto switchD_0013ff41_caseD_43;
    case 0x46:
      goto switchD_0013ff41_caseD_46;
    case 0x48:
      goto switchD_0013ff41_caseD_48;
    case 0x4a:
      goto switchD_0013ff41_caseD_4a;
    case 0x4c:
      goto switchD_0013ff41_caseD_4c;
    case 0x4e:
      goto switchD_0013ff41_caseD_4e;
    case 0x50:
      goto switchD_0013ff41_caseD_50;
    case 0x52:
      goto switchD_0013ff41_caseD_52;
    }
    goto switchD_0013ff72_caseD_44;
  case 0x45:
    goto switchD_0013ff41_caseD_45;
  case 0x46:
switchD_0013ff41_caseD_46:
    snprintf(buf,buflen,"NET - Binding of the socket failed");
switchD_0013f2af_caseD_9:
    if (0x2f < uVar4) {
      switch(uVar4) {
      case 0x43:
        goto switchD_0013ff41_caseD_43;
      case 0x44:
      case 0x46:
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4d:
      case 0x4f:
      case 0x51:
        goto switchD_0013ff41_caseD_47;
      case 0x45:
        goto switchD_0013ff41_caseD_45;
      case 0x48:
        goto switchD_0013ff41_caseD_48;
      case 0x4a:
        goto switchD_0013ff41_caseD_4a;
      case 0x4c:
        goto switchD_0013ff41_caseD_4c;
      case 0x4e:
        goto switchD_0013ff41_caseD_4e;
      case 0x50:
        goto switchD_0013ff41_caseD_50;
      case 0x52:
        goto switchD_0013ff41_caseD_52;
      default:
        goto switchD_0013ff41_default;
      }
    }
    goto LAB_0014012d;
  case 0x47:
  case 0x49:
  case 0x4b:
  case 0x4d:
  case 0x4f:
  case 0x51:
    goto switchD_0013ff41_caseD_47;
  case 0x48:
switchD_0013ff41_caseD_48:
    snprintf(buf,buflen,"NET - Could not listen on the socket");
    switch(uVar4) {
    case 0x43:
      goto switchD_0013ff41_caseD_43;
    case 0x44:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x51:
      break;
    case 0x45:
      goto switchD_0013ff41_caseD_45;
    case 0x4a:
      goto switchD_0013ff41_caseD_4a;
    case 0x4c:
      goto switchD_0013ff41_caseD_4c;
    case 0x4e:
      goto switchD_0013ff41_caseD_4e;
    case 0x50:
      goto switchD_0013ff41_caseD_50;
    case 0x52:
      goto switchD_0013ff41_caseD_52;
    default:
      if (uVar4 != 0x2e) break;
      goto switchD_0013fa74_caseD_2e;
    }
  case 0x4a:
switchD_0013ff41_caseD_4a:
    snprintf(buf,buflen,"NET - Could not accept the incoming connection");
    if (uVar4 < 0x4c) {
      if (uVar4 == 0x2e) goto switchD_0013fa74_caseD_2e;
      if (uVar4 == 0x43) goto switchD_0013ff41_caseD_43;
      if (uVar4 == 0x45) goto switchD_0013ff41_caseD_45;
    }
    else {
      switch(uVar4) {
      case 0x4c:
        goto switchD_0013ff41_caseD_4c;
      case 0x4e:
        goto switchD_0013ff41_caseD_4e;
      case 0x50:
        goto switchD_0013ff41_caseD_50;
      case 0x52:
        goto switchD_0013ff41_caseD_52;
      }
    }
    break;
  case 0x4c:
switchD_0013ff41_caseD_4c:
    snprintf(buf,buflen,"NET - Reading information from the socket failed");
switchD_0013f882_caseD_27:
    if (uVar4 < 0x43) goto LAB_00140073;
    if (0x4d < uVar4) {
      if (uVar4 != 0x52) {
        if (uVar4 != 0x50) {
          if (uVar4 != 0x4e) goto switchD_0013ff41_caseD_47;
          goto switchD_0013ff41_caseD_4e;
        }
        goto switchD_0013ff41_caseD_50;
      }
      goto switchD_0013ff41_caseD_52;
    }
LAB_00140092:
    if (uVar4 == 0x43) goto switchD_0013ff41_caseD_43;
    goto LAB_00140182;
  case 0x4e:
switchD_0013ff41_caseD_4e:
    snprintf(buf,buflen,"NET - Sending information through the socket failed");
switchD_0013f8af_caseD_33:
    if (uVar4 < 0x43) {
LAB_00140073:
      if (uVar4 < 0x2e) goto LAB_001401a6;
      goto switchD_0013fec1_default;
    }
    if (uVar4 < 0x50) goto LAB_00140092;
    if (uVar4 != 0x52) {
      if (uVar4 != 0x50) goto switchD_0013ff41_caseD_47;
      goto switchD_0013ff41_caseD_50;
    }
  case 0x52:
switchD_0013ff41_caseD_52:
    snprintf(buf,buflen,"NET - Failed to get an IP address for the given hostname");
    if (0x2f < uVar4) {
      if (uVar4 != 0x30) {
        if (uVar4 == 0x45) goto switchD_0013ff41_caseD_45;
LAB_00140152:
        if (uVar4 != 0x43) goto switchD_0013ff41_caseD_47;
switchD_0013ff41_caseD_43:
        snprintf(buf,buflen,"NET - Buffer is too small to hold the data");
switchD_0013ff72_caseD_44:
        if (0x2d < uVar4) {
          if (uVar4 != 0x2e) {
            if (uVar4 == 0x30) goto switchD_0013fa74_caseD_30;
LAB_00140182:
            if (uVar4 != 0x45) goto switchD_0013ff41_caseD_47;
            goto switchD_0013ff41_caseD_45;
          }
          goto switchD_0013fa74_caseD_2e;
        }
        goto LAB_001401a6;
      }
      goto switchD_0013fa74_caseD_30;
    }
LAB_0014012d:
    if (uVar4 == 0xb) goto switchD_0013fddc_caseD_b;
switchD_0013fddc_default:
    if (uVar4 != 0x28) goto LAB_001401b4;
    goto switchD_0013fa74_caseD_28;
  case 0x50:
switchD_0013ff41_caseD_50:
    snprintf(buf,buflen,"NET - Connection was reset by peer");
switchD_0013f93d_caseD_33:
    if (uVar4 < 0x30) goto LAB_0014012d;
    if (0x44 < uVar4) {
      if (uVar4 != 0x45) {
        if (uVar4 != 0x52) goto switchD_0013ff41_caseD_47;
        goto switchD_0013ff41_caseD_52;
      }
      goto switchD_0013ff41_caseD_45;
    }
    if (uVar4 != 0x30) goto LAB_00140152;
    goto switchD_0013fa74_caseD_30;
  default:
switchD_0013fec1_default:
    if (uVar4 != 0x2e) goto switchD_0013ff41_default;
    goto switchD_0013fa74_caseD_2e;
  }
switchD_00140019_caseD_4d:
  if (uVar4 == 0x30) {
switchD_0013fa74_caseD_30:
    snprintf(buf,buflen,"PADLOCK - Input data should be aligned");
LAB_00140214:
    if (uVar4 != 0x28) goto switchD_0013ff41_caseD_47;
  }
  else if (uVar4 != 0x28) {
    if (uVar4 != 0xb) goto switchD_0013ff41_caseD_47;
switchD_0013fddc_caseD_b:
    snprintf(buf,buflen,"OID - output buffer is too small");
    if (uVar4 != 0x28) {
switchD_0013ff41_default:
      if (uVar4 != 0x30) goto switchD_0013ff41_caseD_47;
      goto switchD_0013fa74_caseD_30;
    }
  }
switchD_0013fa74_caseD_28:
  snprintf(buf,buflen,"XTEA - The data input has an invalid length");
switchD_0013ff41_caseD_47:
  if (*buf != '\0') {
    return;
  }
  snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar4);
  return;
switchD_0013791b_caseD_3:
  snprintf(buf,buflen,"PK - Read/write of file failed");
  goto LAB_00137f35;
switchD_0013ff41_caseD_45:
  snprintf(buf,buflen,"NET - The context is invalid, eg because it was free()ed");
  if (0x2d < uVar4) {
    if (uVar4 != 0x30) {
LAB_001401b4:
      if (uVar4 != 0x2e) goto switchD_0013ff41_caseD_47;
switchD_0013fa74_caseD_2e:
      snprintf(buf,buflen,"OID - OID is not found");
      goto switchD_00140019_caseD_4d;
    }
    goto switchD_0013fa74_caseD_30;
  }
LAB_001401a6:
  if (uVar4 == 0xb) goto switchD_0013fddc_caseD_b;
  goto LAB_00140214;
}

Assistant:

void mbedtls_strerror( int ret, char *buf, size_t buflen )
{
    size_t len;
    int use_ret;

    if( buflen == 0 )
        return;

    memset( buf, 0x00, buflen );

    if( ret < 0 )
        ret = -ret;

    if( ret & 0xFF80 )
    {
        use_ret = ret & 0xFF80;

        // High level error codes
        //
        // BEGIN generated code
#if defined(MBEDTLS_CIPHER_C)
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Decryption of block requires a full block" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_AUTH_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Authentication failed (for AEAD modes)" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_CONTEXT) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The context is invalid, eg because it was free()ed" );
#endif /* MBEDTLS_CIPHER_C */

#if defined(MBEDTLS_DHM_C)
        if( use_ret == -(MBEDTLS_ERR_DHM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "DHM - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the public values failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the public value failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_CALC_SECRET_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Calculation of the DHM secret failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "DHM - The ASN.1 data is not formatted correctly" );
        if( use_ret == -(MBEDTLS_ERR_DHM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "DHM - Read/write of file failed" );
#endif /* MBEDTLS_DHM_C */

#if defined(MBEDTLS_ECP_C)
        if( use_ret == -(MBEDTLS_ERR_ECP_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "ECP - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer is too small to write to" );
        if( use_ret == -(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "ECP - Requested curve not available" );
        if( use_ret == -(MBEDTLS_ERR_ECP_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The signature is not valid" );
        if( use_ret == -(MBEDTLS_ERR_ECP_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_RANDOM_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Generation of random value, such as (ephemeral) key, failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_INVALID_KEY) )
            mbedtls_snprintf( buf, buflen, "ECP - Invalid private or public key" );
        if( use_ret == -(MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "ECP - Signature is valid but shorter than the user-supplied length" );
#endif /* MBEDTLS_ECP_C */

#if defined(MBEDTLS_MD_C)
        if( use_ret == -(MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "MD - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_MD_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "MD - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_MD_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_MD_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "MD - Opening or reading of file failed" );
#endif /* MBEDTLS_MD_C */

#if defined(MBEDTLS_PEM_PARSE_C) || defined(MBEDTLS_PEM_WRITE_C)
        if( use_ret == -(MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) )
            mbedtls_snprintf( buf, buflen, "PEM - No PEM header or footer found" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - PEM string is not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PEM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PEM - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_ENC_IV) )
            mbedtls_snprintf( buf, buflen, "PEM - RSA IV is not in hex-format" );
        if( use_ret == -(MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG) )
            mbedtls_snprintf( buf, buflen, "PEM - Unsupported key encryption algorithm" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PEM - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PEM - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PEM - Unavailable feature, e.g. hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_PEM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - Bad input parameters to function" );
#endif /* MBEDTLS_PEM_PARSE_C || MBEDTLS_PEM_WRITE_C */

#if defined(MBEDTLS_PK_C)
        if( use_ret == -(MBEDTLS_ERR_PK_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Type mismatch, eg attempt to encrypt with an ECDSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PK - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PK_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "PK - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "PK - Unsupported key version" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PK - Invalid key tag or value" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_PK_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - Key algorithm is unsupported (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PK - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_PUBKEY) )
            mbedtls_snprintf( buf, buflen, "PK - The pubkey tag or value is invalid (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE) )
            mbedtls_snprintf( buf, buflen, "PK - Elliptic curve is unsupported (only NIST curves are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PK - Unavailable feature, e.g. RSA disabled for RSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - The signature is valid but its length is less than expected" );
#endif /* MBEDTLS_PK_C */

#if defined(MBEDTLS_PKCS12_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Feature not available, e.g. unsupported encryption scheme" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - PBE ASN.1 data not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS12_C */

#if defined(MBEDTLS_PKCS5_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Unexpected ASN.1 data" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Requested encryption or digest alg not available" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS5_C */

#if defined(MBEDTLS_RSA_C)
        if( use_ret == -(MBEDTLS_ERR_RSA_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "RSA - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_RSA_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "RSA - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_GEN_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Something failed during generation of a key" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_CHECK_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Key failed to pass the library's validity check" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The public key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PRIVATE_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The private key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The PKCS#1 verification failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "RSA - The output buffer for decryption is not large enough" );
        if( use_ret == -(MBEDTLS_ERR_RSA_RNG_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The random generator failed to generate non-zeros" );
#endif /* MBEDTLS_RSA_C */

#if defined(MBEDTLS_SSL_TLS_C)
        if( use_ret == -(MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "SSL - The requested feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "SSL - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_MAC) )
            mbedtls_snprintf( buf, buflen, "SSL - Verification of the message MAC failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_RECORD) )
            mbedtls_snprintf( buf, buflen, "SSL - An invalid SSL record was received" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CONN_EOF) )
            mbedtls_snprintf( buf, buflen, "SSL - The connection indicated an EOF" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNKNOWN_CIPHER) )
            mbedtls_snprintf( buf, buflen, "SSL - An unknown cipher was received" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_CIPHER_CHOSEN) )
            mbedtls_snprintf( buf, buflen, "SSL - The server has no ciphersuites in common with the client" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_RNG) )
            mbedtls_snprintf( buf, buflen, "SSL - No RNG was provided to the SSL module" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE) )
            mbedtls_snprintf( buf, buflen, "SSL - No client certification received from the client, but required by the authentication mode" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CERTIFICATE_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Our own certificate(s) is/are too large to send in an SSL message" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CERTIFICATE_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - The own certificate is not set, but needed by the server" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - The own private key or pre-shared key is not set, but needed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - No CA Chain is set, but required to operate" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE) )
            mbedtls_snprintf( buf, buflen, "SSL - An unexpected message was received from our peer" );
        if( use_ret == -(MBEDTLS_ERR_SSL_FATAL_ALERT_MESSAGE) )
        {
            mbedtls_snprintf( buf, buflen, "SSL - A fatal alert message was received from our peer" );
            return;
        }
        if( use_ret == -(MBEDTLS_ERR_SSL_PEER_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Verification of our peer failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY) )
            mbedtls_snprintf( buf, buflen, "SSL - The peer notified us that the connection is going to be closed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientHello handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerHello handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the Certificate handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the CertificateRequest handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerKeyExchange handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO_DONE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ServerHelloDone handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_RP) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Read Public" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE_CS) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ClientKeyExchange handshake message failed in DHM / ECDH Calculate Secret" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_VERIFY) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the CertificateVerify handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_CHANGE_CIPHER_SPEC) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the ChangeCipherSpec handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_FINISHED) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the Finished handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Hardware acceleration function returned with error" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH) )
            mbedtls_snprintf( buf, buflen, "SSL - Hardware acceleration function skipped / left alone data" );
        if( use_ret == -(MBEDTLS_ERR_SSL_COMPRESSION_FAILED) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the compression / decompression failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION) )
            mbedtls_snprintf( buf, buflen, "SSL - Handshake protocol not within min/max boundaries" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BAD_HS_NEW_SESSION_TICKET) )
            mbedtls_snprintf( buf, buflen, "SSL - Processing of the NewSessionTicket handshake message failed" );
        if( use_ret == -(MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - Session ticket has expired" );
        if( use_ret == -(MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "SSL - Public key type mismatch (eg, asked for RSA key exchange and presented EC key)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY) )
            mbedtls_snprintf( buf, buflen, "SSL - Unknown identity received (eg, PSK identity)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INTERNAL_ERROR) )
            mbedtls_snprintf( buf, buflen, "SSL - Internal error (eg, unexpected failure in lower-level module)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_COUNTER_WRAPPING) )
            mbedtls_snprintf( buf, buflen, "SSL - A counter would wrap (eg, too many messages exchanged)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO) )
            mbedtls_snprintf( buf, buflen, "SSL - Unexpected message at ServerHello in renegotiation" );
        if( use_ret == -(MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "SSL - DTLS client must retry for hello verification" );
        if( use_ret == -(MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "SSL - A buffer is too small to receive or write a message" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NO_USABLE_CIPHERSUITE) )
            mbedtls_snprintf( buf, buflen, "SSL - None of the common ciphersuites is usable (eg, no suitable certificate, see debug messages)" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WANT_READ) )
            mbedtls_snprintf( buf, buflen, "SSL - Connection requires a read call" );
        if( use_ret == -(MBEDTLS_ERR_SSL_WANT_WRITE) )
            mbedtls_snprintf( buf, buflen, "SSL - Connection requires a write call" );
        if( use_ret == -(MBEDTLS_ERR_SSL_TIMEOUT) )
            mbedtls_snprintf( buf, buflen, "SSL - The operation timed out" );
        if( use_ret == -(MBEDTLS_ERR_SSL_CLIENT_RECONNECT) )
            mbedtls_snprintf( buf, buflen, "SSL - The client initiated a reconnect from the same port" );
        if( use_ret == -(MBEDTLS_ERR_SSL_UNEXPECTED_RECORD) )
            mbedtls_snprintf( buf, buflen, "SSL - Record header looks valid but is not expected" );
        if( use_ret == -(MBEDTLS_ERR_SSL_NON_FATAL) )
            mbedtls_snprintf( buf, buflen, "SSL - The alert message received indicates a non-fatal error" );
        if( use_ret == -(MBEDTLS_ERR_SSL_INVALID_VERIFY_HASH) )
            mbedtls_snprintf( buf, buflen, "SSL - Couldn't set the hash for verifying CertificateVerify" );
#endif /* MBEDTLS_SSL_TLS_C */

#if defined(MBEDTLS_X509_USE_C) || defined(MBEDTLS_X509_CREATE_C)
        if( use_ret == -(MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "X509 - Unavailable feature, e.g. RSA hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_OID) )
            mbedtls_snprintf( buf, buflen, "X509 - Requested OID is unknown" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "X509 - The CRT/CRL/CSR format is invalid, e.g. different type expected" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "X509 - The CRT/CRL/CSR version element is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_SERIAL) )
            mbedtls_snprintf( buf, buflen, "X509 - The serial tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "X509 - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_NAME) )
            mbedtls_snprintf( buf, buflen, "X509 - The name tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_DATE) )
            mbedtls_snprintf( buf, buflen, "X509 - The date tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_SIGNATURE) )
            mbedtls_snprintf( buf, buflen, "X509 - The signature tag or value invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_INVALID_EXTENSIONS) )
            mbedtls_snprintf( buf, buflen, "X509 - The extension tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_VERSION) )
            mbedtls_snprintf( buf, buflen, "X509 - CRT/CRL/CSR has an unsupported version number" );
        if( use_ret == -(MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG) )
            mbedtls_snprintf( buf, buflen, "X509 - Signature algorithm (oid) is unsupported" );
        if( use_ret == -(MBEDTLS_ERR_X509_SIG_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "X509 - Signature algorithms do not match. (see \\c ::mbedtls_x509_crt sig_oid)" );
        if( use_ret == -(MBEDTLS_ERR_X509_CERT_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "X509 - Certificate verification failed, e.g. CRL, CA or signature check failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_CERT_UNKNOWN_FORMAT) )
            mbedtls_snprintf( buf, buflen, "X509 - Format not recognized as DER or PEM" );
        if( use_ret == -(MBEDTLS_ERR_X509_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "X509 - Input invalid" );
        if( use_ret == -(MBEDTLS_ERR_X509_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "X509 - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "X509 - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_X509_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "X509 - Destination buffer is too small" );
#endif /* MBEDTLS_X509_USE_C || MBEDTLS_X509_CREATE_C */
        // END generated code

        if( strlen( buf ) == 0 )
            mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
    }

    use_ret = ret & ~0xFF80;

    if( use_ret == 0 )
        return;

    // If high level code is present, make a concatenation between both
    // error strings.
    //
    len = strlen( buf );

    if( len > 0 )
    {
        if( buflen - len < 5 )
            return;

        mbedtls_snprintf( buf + len, buflen - len, " : " );

        buf += len + 3;
        buflen -= len + 3;
    }

    // Low level error codes
    //
    // BEGIN generated code
#if defined(MBEDTLS_AES_C)
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid data input length" );
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_ASN1_PARSE_C)
    if( use_ret == -(MBEDTLS_ERR_ASN1_OUT_OF_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Out of data when parsing an ASN1 data structure" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) )
        mbedtls_snprintf( buf, buflen, "ASN1 - ASN1 tag was of an unexpected value" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Error when trying to determine the length or invalid length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_LENGTH_MISMATCH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Actual length differs from expected length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Data is invalid. (not used)" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Memory allocation failed" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Buffer too small when writing ASN.1 data structure" );
#endif /* MBEDTLS_ASN1_PARSE_C */

#if defined(MBEDTLS_BASE64_C)
    if( use_ret == -(MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Output buffer too small" );
    if( use_ret == -(MBEDTLS_ERR_BASE64_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Invalid character in input" );
#endif /* MBEDTLS_BASE64_C */

#if defined(MBEDTLS_BIGNUM_C)
    if( use_ret == -(MBEDTLS_ERR_MPI_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - An error occurred while reading from or writing to a file" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_MPI_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - There is an invalid character in the digit string" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The buffer is too small to write to" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NEGATIVE_VALUE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are negative or result in illegal output" );
    if( use_ret == -(MBEDTLS_ERR_MPI_DIVISION_BY_ZERO) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input argument for division is zero, which is not allowed" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NOT_ACCEPTABLE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are not acceptable" );
    if( use_ret == -(MBEDTLS_ERR_MPI_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Memory allocation failed" );
#endif /* MBEDTLS_BIGNUM_C */

#if defined(MBEDTLS_BLOWFISH_C)
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid data input length" );
#endif /* MBEDTLS_BLOWFISH_C */

#if defined(MBEDTLS_CAMELLIA_C)
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid data input length" );
#endif /* MBEDTLS_CAMELLIA_C */

#if defined(MBEDTLS_CCM_C)
    if( use_ret == -(MBEDTLS_ERR_CCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "CCM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_CCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - Authenticated decryption failed" );
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_CTR_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The entropy source failed" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Read/write error in file" );
#endif /* MBEDTLS_CTR_DRBG_C */

#if defined(MBEDTLS_DES_C)
    if( use_ret == -(MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "DES - The data input has an invalid length" );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_ENTROPY_C)
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Critical entropy source failure" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_MAX_SOURCES) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No more sources can be added" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No strong sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Read/write error in file" );
#endif /* MBEDTLS_ENTROPY_C */

#if defined(MBEDTLS_GCM_C)
    if( use_ret == -(MBEDTLS_ERR_GCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "GCM - Bad input parameters to function" );
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Read/write error in file" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - The entropy source failed" );
#endif /* MBEDTLS_HMAC_DRBG_C */

#if defined(MBEDTLS_NET_C)
    if( use_ret == -(MBEDTLS_ERR_NET_SOCKET_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Failed to open a socket" );
    if( use_ret == -(MBEDTLS_ERR_NET_CONNECT_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - The connection to the given server / port failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_BIND_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Binding of the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_LISTEN_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Could not listen on the socket" );
    if( use_ret == -(MBEDTLS_ERR_NET_ACCEPT_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Could not accept the incoming connection" );
    if( use_ret == -(MBEDTLS_ERR_NET_RECV_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Reading information from the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_SEND_FAILED) )
        mbedtls_snprintf( buf, buflen, "NET - Sending information through the socket failed" );
    if( use_ret == -(MBEDTLS_ERR_NET_CONN_RESET) )
        mbedtls_snprintf( buf, buflen, "NET - Connection was reset by peer" );
    if( use_ret == -(MBEDTLS_ERR_NET_UNKNOWN_HOST) )
        mbedtls_snprintf( buf, buflen, "NET - Failed to get an IP address for the given hostname" );
    if( use_ret == -(MBEDTLS_ERR_NET_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "NET - Buffer is too small to hold the data" );
    if( use_ret == -(MBEDTLS_ERR_NET_INVALID_CONTEXT) )
        mbedtls_snprintf( buf, buflen, "NET - The context is invalid, eg because it was free()ed" );
#endif /* MBEDTLS_NET_C */

#if defined(MBEDTLS_OID_C)
    if( use_ret == -(MBEDTLS_ERR_OID_NOT_FOUND) )
        mbedtls_snprintf( buf, buflen, "OID - OID is not found" );
    if( use_ret == -(MBEDTLS_ERR_OID_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "OID - output buffer is too small" );
#endif /* MBEDTLS_OID_C */

#if defined(MBEDTLS_PADLOCK_C)
    if( use_ret == -(MBEDTLS_ERR_PADLOCK_DATA_MISALIGNED) )
        mbedtls_snprintf( buf, buflen, "PADLOCK - Input data should be aligned" );
#endif /* MBEDTLS_PADLOCK_C */

#if defined(MBEDTLS_THREADING_C)
    if( use_ret == -(MBEDTLS_ERR_THREADING_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "THREADING - The selected feature is not available" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "THREADING - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_MUTEX_ERROR) )
        mbedtls_snprintf( buf, buflen, "THREADING - Locking / unlocking / free failed with error code" );
#endif /* MBEDTLS_THREADING_C */

#if defined(MBEDTLS_XTEA_C)
    if( use_ret == -(MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "XTEA - The data input has an invalid length" );
#endif /* MBEDTLS_XTEA_C */
    // END generated code

    if( strlen( buf ) != 0 )
        return;

    mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
}